

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  uint uVar120;
  int iVar121;
  ulong uVar122;
  RTCIntersectArguments *pRVar123;
  uint uVar124;
  long lVar125;
  bool bVar126;
  long lVar127;
  ulong uVar128;
  Geometry *geometry;
  long lVar129;
  float fVar130;
  float fVar148;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar138 [32];
  float fVar149;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar154;
  float fVar173;
  float fVar174;
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar175;
  float fVar176;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  float fVar177;
  float fVar193;
  float fVar195;
  vint4 bi_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar178;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar194;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar199;
  float fVar216;
  float fVar219;
  vint4 ai_1;
  undefined1 auVar201 [16];
  float fVar221;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar200;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar218;
  float fVar223;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar210 [32];
  float fVar217;
  float fVar220;
  float fVar222;
  float fVar225;
  float fVar227;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar229;
  float fVar230;
  float fVar240;
  float fVar242;
  vint4 ai_2;
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar246;
  float fVar247;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar248;
  float fVar249;
  float fVar257;
  float fVar259;
  undefined1 auVar250 [16];
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar264;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar265;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar276;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar277;
  undefined1 auVar273 [32];
  vint4 ai;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar292;
  float fVar293;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar291 [32];
  float fVar298;
  float fVar305;
  float fVar306;
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  float fVar307;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar308;
  float fVar309;
  float fVar315;
  float fVar317;
  undefined1 auVar310 [16];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar325 [16];
  float fVar330;
  undefined1 auVar326 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [64];
  float fVar338;
  float fVar342;
  float fVar343;
  undefined1 auVar339 [16];
  float fVar344;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar345;
  float fVar346;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar347 [32];
  float fVar354;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  ulong local_7c0;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined1 *local_770;
  undefined1 (*local_768) [16];
  undefined1 (*local_760) [32];
  Precalculations *local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5f0;
  Primitive *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_360 [32];
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  RTCHitN local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar163 [24];
  undefined1 auVar209 [32];
  
  PVar12 = prim[1];
  uVar122 = (ulong)(byte)PVar12;
  lVar20 = uVar122 * 0x25;
  fVar324 = *(float *)(prim + lVar20 + 0x12);
  auVar267 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar267 = vinsertps_avx(auVar267,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar185 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar185 = vinsertps_avx(auVar185,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar267 = vsubps_avx(auVar267,*(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar155._0_4_ = fVar324 * auVar267._0_4_;
  auVar155._4_4_ = fVar324 * auVar267._4_4_;
  auVar155._8_4_ = fVar324 * auVar267._8_4_;
  auVar155._12_4_ = fVar324 * auVar267._12_4_;
  auVar278._0_4_ = fVar324 * auVar185._0_4_;
  auVar278._4_4_ = fVar324 * auVar185._4_4_;
  auVar278._8_4_ = fVar324 * auVar185._8_4_;
  auVar278._12_4_ = fVar324 * auVar185._12_4_;
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 6)));
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 5 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 6)));
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xf + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar122 + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1a + 6)));
  auVar206 = vcvtdq2ps_avx(auVar206);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vshufps_avx(auVar278,auVar278,0);
  auVar24 = vshufps_avx(auVar278,auVar278,0x55);
  auVar25 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar324 = auVar25._0_4_;
  fVar218 = auVar25._4_4_;
  fVar328 = auVar25._8_4_;
  fVar223 = auVar25._12_4_;
  fVar229 = auVar24._0_4_;
  fVar240 = auVar24._4_4_;
  fVar242 = auVar24._8_4_;
  fVar244 = auVar24._12_4_;
  fVar199 = auVar23._0_4_;
  fVar216 = auVar23._4_4_;
  fVar219 = auVar23._8_4_;
  fVar221 = auVar23._12_4_;
  auVar331._0_4_ = fVar199 * auVar267._0_4_ + fVar229 * auVar185._0_4_ + fVar324 * auVar207._0_4_;
  auVar331._4_4_ = fVar216 * auVar267._4_4_ + fVar240 * auVar185._4_4_ + fVar218 * auVar207._4_4_;
  auVar331._8_4_ = fVar219 * auVar267._8_4_ + fVar242 * auVar185._8_4_ + fVar328 * auVar207._8_4_;
  auVar331._12_4_ =
       fVar221 * auVar267._12_4_ + fVar244 * auVar185._12_4_ + fVar223 * auVar207._12_4_;
  auVar339._0_4_ = fVar199 * auVar183._0_4_ + fVar229 * auVar208._0_4_ + auVar205._0_4_ * fVar324;
  auVar339._4_4_ = fVar216 * auVar183._4_4_ + fVar240 * auVar208._4_4_ + auVar205._4_4_ * fVar218;
  auVar339._8_4_ = fVar219 * auVar183._8_4_ + fVar242 * auVar208._8_4_ + auVar205._8_4_ * fVar328;
  auVar339._12_4_ =
       fVar221 * auVar183._12_4_ + fVar244 * auVar208._12_4_ + auVar205._12_4_ * fVar223;
  auVar279._0_4_ = fVar199 * auVar206._0_4_ + fVar229 * auVar21._0_4_ + auVar22._0_4_ * fVar324;
  auVar279._4_4_ = fVar216 * auVar206._4_4_ + fVar240 * auVar21._4_4_ + auVar22._4_4_ * fVar218;
  auVar279._8_4_ = fVar219 * auVar206._8_4_ + fVar242 * auVar21._8_4_ + auVar22._8_4_ * fVar328;
  auVar279._12_4_ = fVar221 * auVar206._12_4_ + fVar244 * auVar21._12_4_ + auVar22._12_4_ * fVar223;
  auVar23 = vshufps_avx(auVar155,auVar155,0);
  auVar24 = vshufps_avx(auVar155,auVar155,0x55);
  auVar25 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar324 = auVar25._0_4_;
  fVar218 = auVar25._4_4_;
  fVar328 = auVar25._8_4_;
  fVar223 = auVar25._12_4_;
  fVar229 = auVar24._0_4_;
  fVar240 = auVar24._4_4_;
  fVar242 = auVar24._8_4_;
  fVar244 = auVar24._12_4_;
  fVar199 = auVar23._0_4_;
  fVar216 = auVar23._4_4_;
  fVar219 = auVar23._8_4_;
  fVar221 = auVar23._12_4_;
  auVar156._0_4_ = fVar199 * auVar267._0_4_ + fVar229 * auVar185._0_4_ + fVar324 * auVar207._0_4_;
  auVar156._4_4_ = fVar216 * auVar267._4_4_ + fVar240 * auVar185._4_4_ + fVar218 * auVar207._4_4_;
  auVar156._8_4_ = fVar219 * auVar267._8_4_ + fVar242 * auVar185._8_4_ + fVar328 * auVar207._8_4_;
  auVar156._12_4_ =
       fVar221 * auVar267._12_4_ + fVar244 * auVar185._12_4_ + fVar223 * auVar207._12_4_;
  auVar131._0_4_ = fVar199 * auVar183._0_4_ + auVar205._0_4_ * fVar324 + fVar229 * auVar208._0_4_;
  auVar131._4_4_ = fVar216 * auVar183._4_4_ + auVar205._4_4_ * fVar218 + fVar240 * auVar208._4_4_;
  auVar131._8_4_ = fVar219 * auVar183._8_4_ + auVar205._8_4_ * fVar328 + fVar242 * auVar208._8_4_;
  auVar131._12_4_ =
       fVar221 * auVar183._12_4_ + auVar205._12_4_ * fVar223 + fVar244 * auVar208._12_4_;
  auVar287._8_4_ = 0x7fffffff;
  auVar287._0_8_ = 0x7fffffff7fffffff;
  auVar287._12_4_ = 0x7fffffff;
  auVar267 = vandps_avx(auVar331,auVar287);
  auVar231._8_4_ = 0x219392ef;
  auVar231._0_8_ = 0x219392ef219392ef;
  auVar231._12_4_ = 0x219392ef;
  auVar267 = vcmpps_avx(auVar267,auVar231,1);
  auVar185 = vblendvps_avx(auVar331,auVar231,auVar267);
  auVar267 = vandps_avx(auVar339,auVar287);
  auVar267 = vcmpps_avx(auVar267,auVar231,1);
  auVar207 = vblendvps_avx(auVar339,auVar231,auVar267);
  auVar267 = vandps_avx(auVar287,auVar279);
  auVar267 = vcmpps_avx(auVar267,auVar231,1);
  auVar267 = vblendvps_avx(auVar279,auVar231,auVar267);
  auVar179._0_4_ = fVar199 * auVar206._0_4_ + fVar229 * auVar21._0_4_ + auVar22._0_4_ * fVar324;
  auVar179._4_4_ = fVar216 * auVar206._4_4_ + fVar240 * auVar21._4_4_ + auVar22._4_4_ * fVar218;
  auVar179._8_4_ = fVar219 * auVar206._8_4_ + fVar242 * auVar21._8_4_ + auVar22._8_4_ * fVar328;
  auVar179._12_4_ = fVar221 * auVar206._12_4_ + fVar244 * auVar21._12_4_ + auVar22._12_4_ * fVar223;
  auVar183 = vrcpps_avx(auVar185);
  fVar199 = auVar183._0_4_;
  auVar201._0_4_ = fVar199 * auVar185._0_4_;
  fVar216 = auVar183._4_4_;
  auVar201._4_4_ = fVar216 * auVar185._4_4_;
  fVar219 = auVar183._8_4_;
  auVar201._8_4_ = fVar219 * auVar185._8_4_;
  fVar221 = auVar183._12_4_;
  auVar201._12_4_ = fVar221 * auVar185._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = 0x3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar185 = vsubps_avx(auVar266,auVar201);
  fVar199 = fVar199 + fVar199 * auVar185._0_4_;
  fVar216 = fVar216 + fVar216 * auVar185._4_4_;
  fVar219 = fVar219 + fVar219 * auVar185._8_4_;
  fVar221 = fVar221 + fVar221 * auVar185._12_4_;
  auVar185 = vrcpps_avx(auVar207);
  fVar229 = auVar185._0_4_;
  auVar250._0_4_ = fVar229 * auVar207._0_4_;
  fVar240 = auVar185._4_4_;
  auVar250._4_4_ = fVar240 * auVar207._4_4_;
  fVar242 = auVar185._8_4_;
  auVar250._8_4_ = fVar242 * auVar207._8_4_;
  fVar244 = auVar185._12_4_;
  auVar250._12_4_ = fVar244 * auVar207._12_4_;
  auVar185 = vsubps_avx(auVar266,auVar250);
  fVar229 = fVar229 + fVar229 * auVar185._0_4_;
  fVar240 = fVar240 + fVar240 * auVar185._4_4_;
  fVar242 = fVar242 + fVar242 * auVar185._8_4_;
  fVar244 = fVar244 + fVar244 * auVar185._12_4_;
  auVar185 = vrcpps_avx(auVar267);
  fVar248 = auVar185._0_4_;
  auVar280._0_4_ = fVar248 * auVar267._0_4_;
  fVar257 = auVar185._4_4_;
  auVar280._4_4_ = fVar257 * auVar267._4_4_;
  fVar259 = auVar185._8_4_;
  auVar280._8_4_ = fVar259 * auVar267._8_4_;
  fVar261 = auVar185._12_4_;
  auVar280._12_4_ = fVar261 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar266,auVar280);
  fVar248 = fVar248 + fVar248 * auVar267._0_4_;
  fVar257 = fVar257 + fVar257 * auVar267._4_4_;
  fVar259 = fVar259 + fVar259 * auVar267._8_4_;
  fVar261 = fVar261 + fVar261 * auVar267._12_4_;
  auVar267 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar20 + 0x16)) *
                           *(float *)(prim + lVar20 + 0x1a)));
  auVar207 = vshufps_avx(auVar267,auVar267,0);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + uVar122 * 7 + 6);
  auVar267 = vpmovsxwd_avx(auVar267);
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar122 * 0xb + 6);
  auVar185 = vpmovsxwd_avx(auVar185);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar183 = vsubps_avx(auVar185,auVar267);
  fVar324 = auVar207._0_4_;
  fVar218 = auVar207._4_4_;
  fVar328 = auVar207._8_4_;
  fVar223 = auVar207._12_4_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar122 * 9 + 6);
  auVar185 = vpmovsxwd_avx(auVar207);
  auVar281._0_4_ = auVar183._0_4_ * fVar324 + auVar267._0_4_;
  auVar281._4_4_ = auVar183._4_4_ * fVar218 + auVar267._4_4_;
  auVar281._8_4_ = auVar183._8_4_ * fVar328 + auVar267._8_4_;
  auVar281._12_4_ = auVar183._12_4_ * fVar223 + auVar267._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar122 * 0xd + 6);
  auVar207 = vpmovsxwd_avx(auVar183);
  auVar267 = vcvtdq2ps_avx(auVar185);
  auVar185 = vcvtdq2ps_avx(auVar207);
  auVar185 = vsubps_avx(auVar185,auVar267);
  auVar288._0_4_ = auVar185._0_4_ * fVar324 + auVar267._0_4_;
  auVar288._4_4_ = auVar185._4_4_ * fVar218 + auVar267._4_4_;
  auVar288._8_4_ = auVar185._8_4_ * fVar328 + auVar267._8_4_;
  auVar288._12_4_ = auVar185._12_4_ * fVar223 + auVar267._12_4_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar122 * 0x12 + 6);
  auVar267 = vpmovsxwd_avx(auVar208);
  uVar128 = (ulong)(uint)((int)(uVar122 * 5) << 2);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar122 * 2 + uVar128 + 6);
  auVar185 = vpmovsxwd_avx(auVar205);
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar185 = vsubps_avx(auVar185,auVar267);
  auVar299._0_4_ = auVar185._0_4_ * fVar324 + auVar267._0_4_;
  auVar299._4_4_ = auVar185._4_4_ * fVar218 + auVar267._4_4_;
  auVar299._8_4_ = auVar185._8_4_ * fVar328 + auVar267._8_4_;
  auVar299._12_4_ = auVar185._12_4_ * fVar223 + auVar267._12_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar128 + 6);
  auVar267 = vpmovsxwd_avx(auVar206);
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar122 * 0x18 + 6);
  auVar185 = vpmovsxwd_avx(auVar21);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar207 = vsubps_avx(auVar185,auVar267);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar122 * 0x1d + 6);
  auVar185 = vpmovsxwd_avx(auVar22);
  auVar310._0_4_ = auVar207._0_4_ * fVar324 + auVar267._0_4_;
  auVar310._4_4_ = auVar207._4_4_ * fVar218 + auVar267._4_4_;
  auVar310._8_4_ = auVar207._8_4_ * fVar328 + auVar267._8_4_;
  auVar310._12_4_ = auVar207._12_4_ * fVar223 + auVar267._12_4_;
  auVar267 = vcvtdq2ps_avx(auVar185);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar122 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar185 = vpmovsxwd_avx(auVar23);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar185 = vsubps_avx(auVar185,auVar267);
  auVar325._0_4_ = auVar185._0_4_ * fVar324 + auVar267._0_4_;
  auVar325._4_4_ = auVar185._4_4_ * fVar218 + auVar267._4_4_;
  auVar325._8_4_ = auVar185._8_4_ * fVar328 + auVar267._8_4_;
  auVar325._12_4_ = auVar185._12_4_ * fVar223 + auVar267._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar122) + 6);
  auVar267 = vpmovsxwd_avx(auVar24);
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar122 * 0x23 + 6);
  auVar185 = vpmovsxwd_avx(auVar25);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar185 = vsubps_avx(auVar185,auVar267);
  auVar268._0_4_ = auVar267._0_4_ + auVar185._0_4_ * fVar324;
  auVar268._4_4_ = auVar267._4_4_ + auVar185._4_4_ * fVar218;
  auVar268._8_4_ = auVar267._8_4_ + auVar185._8_4_ * fVar328;
  auVar268._12_4_ = auVar267._12_4_ + auVar185._12_4_ * fVar223;
  auVar267 = vsubps_avx(auVar281,auVar156);
  auVar282._0_4_ = fVar199 * auVar267._0_4_;
  auVar282._4_4_ = fVar216 * auVar267._4_4_;
  auVar282._8_4_ = fVar219 * auVar267._8_4_;
  auVar282._12_4_ = fVar221 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar288,auVar156);
  auVar157._0_4_ = fVar199 * auVar267._0_4_;
  auVar157._4_4_ = fVar216 * auVar267._4_4_;
  auVar157._8_4_ = fVar219 * auVar267._8_4_;
  auVar157._12_4_ = fVar221 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar299,auVar131);
  auVar202._0_4_ = fVar229 * auVar267._0_4_;
  auVar202._4_4_ = fVar240 * auVar267._4_4_;
  auVar202._8_4_ = fVar242 * auVar267._8_4_;
  auVar202._12_4_ = fVar244 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar310,auVar131);
  auVar132._0_4_ = fVar229 * auVar267._0_4_;
  auVar132._4_4_ = fVar240 * auVar267._4_4_;
  auVar132._8_4_ = fVar242 * auVar267._8_4_;
  auVar132._12_4_ = fVar244 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar325,auVar179);
  auVar232._0_4_ = fVar248 * auVar267._0_4_;
  auVar232._4_4_ = fVar257 * auVar267._4_4_;
  auVar232._8_4_ = fVar259 * auVar267._8_4_;
  auVar232._12_4_ = fVar261 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar268,auVar179);
  auVar180._0_4_ = fVar248 * auVar267._0_4_;
  auVar180._4_4_ = fVar257 * auVar267._4_4_;
  auVar180._8_4_ = fVar259 * auVar267._8_4_;
  auVar180._12_4_ = fVar261 * auVar267._12_4_;
  auVar267 = vpminsd_avx(auVar282,auVar157);
  auVar185 = vpminsd_avx(auVar202,auVar132);
  auVar267 = vmaxps_avx(auVar267,auVar185);
  auVar185 = vpminsd_avx(auVar232,auVar180);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar289._4_4_ = uVar11;
  auVar289._0_4_ = uVar11;
  auVar289._8_4_ = uVar11;
  auVar289._12_4_ = uVar11;
  auVar185 = vmaxps_avx(auVar185,auVar289);
  auVar267 = vmaxps_avx(auVar267,auVar185);
  local_430._0_4_ = auVar267._0_4_ * 0.99999964;
  local_430._4_4_ = auVar267._4_4_ * 0.99999964;
  local_430._8_4_ = auVar267._8_4_ * 0.99999964;
  local_430._12_4_ = auVar267._12_4_ * 0.99999964;
  auVar267 = vpmaxsd_avx(auVar282,auVar157);
  auVar185 = vpmaxsd_avx(auVar202,auVar132);
  auVar267 = vminps_avx(auVar267,auVar185);
  auVar185 = vpmaxsd_avx(auVar232,auVar180);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar181._4_4_ = uVar11;
  auVar181._0_4_ = uVar11;
  auVar181._8_4_ = uVar11;
  auVar181._12_4_ = uVar11;
  auVar185 = vminps_avx(auVar185,auVar181);
  auVar267 = vminps_avx(auVar267,auVar185);
  auVar133._0_4_ = auVar267._0_4_ * 1.0000004;
  auVar133._4_4_ = auVar267._4_4_ * 1.0000004;
  auVar133._8_4_ = auVar267._8_4_ * 1.0000004;
  auVar133._12_4_ = auVar267._12_4_ * 1.0000004;
  auVar267 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar185 = vpcmpgtd_avx(auVar267,_DAT_01f7fcf0);
  auVar267 = vcmpps_avx(local_430,auVar133,2);
  auVar267 = vandps_avx(auVar267,auVar185);
  uVar120 = vmovmskps_avx(auVar267);
  if (uVar120 != 0) {
    uVar120 = uVar120 & 0xff;
    local_5f0 = pre->ray_space + k;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    local_760 = (undefined1 (*) [32])&local_140;
    uVar124 = 1 << ((byte)k & 0x1f);
    local_768 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar124 & 0xf) << 4));
    local_770 = mm_lookupmask_ps + (long)((int)uVar124 >> 4) * 0x10;
    local_758 = pre;
    local_5e8 = prim;
    do {
      lVar20 = 0;
      if (uVar120 != 0) {
        for (; (uVar120 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar13 = *(uint *)(local_5e8 + 2);
      uVar14 = *(uint *)(local_5e8 + lVar20 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[uVar13].ptr;
      local_580._0_8_ = CONCAT44(0,uVar14);
      uVar122 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,uVar14) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar324 = (pGVar16->time_range).lower;
      fVar324 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar324) /
                ((pGVar16->time_range).upper - fVar324));
      auVar267 = vroundss_avx(ZEXT416((uint)fVar324),ZEXT416((uint)fVar324),9);
      auVar267 = vminss_avx(auVar267,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar267 = vmaxss_avx(ZEXT816(0) << 0x20,auVar267);
      fVar324 = fVar324 - auVar267._0_4_;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar125 = (long)(int)auVar267._0_4_ * 0x38;
      lVar20 = *(long *)(_Var17 + 0x10 + lVar125);
      lVar129 = *(long *)(_Var17 + 0x38 + lVar125);
      lVar18 = *(long *)(_Var17 + 0x48 + lVar125);
      auVar267 = vshufps_avx(ZEXT416((uint)fVar324),ZEXT416((uint)fVar324),0);
      pfVar1 = (float *)(lVar129 + uVar122 * lVar18);
      fVar218 = auVar267._0_4_;
      fVar328 = auVar267._4_4_;
      fVar223 = auVar267._8_4_;
      fVar199 = auVar267._12_4_;
      pfVar2 = (float *)(lVar129 + (uVar122 + 1) * lVar18);
      lVar127 = (uVar122 + 2) * lVar18;
      pfVar3 = (float *)(lVar129 + lVar127);
      pfVar4 = (float *)(lVar129 + lVar18 * (uVar122 + 3));
      lVar129 = *(long *)(_Var17 + lVar125);
      auVar267 = vshufps_avx(ZEXT416((uint)(1.0 - fVar324)),ZEXT416((uint)(1.0 - fVar324)),0);
      pfVar5 = (float *)(lVar129 + lVar20 * uVar122);
      fVar324 = auVar267._0_4_;
      fVar216 = auVar267._4_4_;
      fVar219 = auVar267._8_4_;
      fVar221 = auVar267._12_4_;
      pfVar6 = (float *)(lVar129 + lVar20 * (uVar122 + 1));
      pfVar7 = (float *)(lVar129 + lVar20 * (uVar122 + 2));
      pfVar8 = (float *)(lVar129 + lVar20 * (uVar122 + 3));
      uVar15 = (uint)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar15 * 0x44;
      local_780 = (undefined1  [8])
                  CONCAT44(fVar328 * pfVar1[1] + fVar216 * pfVar5[1],
                           fVar218 * *pfVar1 + fVar324 * *pfVar5);
      uStack_778._0_4_ = fVar223 * pfVar1[2] + fVar219 * pfVar5[2];
      uStack_778._4_4_ = fVar199 * pfVar1[3] + fVar221 * pfVar5[3];
      local_670 = (undefined1  [8])
                  CONCAT44(fVar216 * pfVar6[1] + fVar328 * pfVar2[1],
                           fVar324 * *pfVar6 + fVar218 * *pfVar2);
      uStack_668._0_4_ = fVar219 * pfVar6[2] + fVar223 * pfVar2[2];
      uStack_668._4_4_ = fVar221 * pfVar6[3] + fVar199 * pfVar2[3];
      local_680 = (undefined1  [8])
                  CONCAT44(fVar216 * pfVar7[1] + fVar328 * pfVar3[1],
                           fVar324 * *pfVar7 + fVar218 * *pfVar3);
      uStack_678._0_4_ = fVar219 * pfVar7[2] + fVar223 * pfVar3[2];
      uStack_678._4_4_ = fVar221 * pfVar7[3] + fVar199 * pfVar3[3];
      local_690 = (undefined1  [8])
                  CONCAT44(fVar216 * pfVar8[1] + fVar328 * pfVar4[1],
                           fVar324 * *pfVar8 + fVar218 * *pfVar4);
      uStack_688._0_4_ = fVar219 * pfVar8[2] + fVar223 * pfVar4[2];
      uStack_688._4_4_ = fVar221 * pfVar8[3] + fVar199 * pfVar4[3];
      auVar267 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar183 = vinsertps_avx(auVar267,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar207 = vsubps_avx(_local_780,auVar183);
      auVar267 = vshufps_avx(auVar207,auVar207,0);
      auVar185 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      fVar324 = (local_5f0->vx).field_0.m128[0];
      fVar218 = (local_5f0->vx).field_0.m128[1];
      fVar328 = (local_5f0->vx).field_0.m128[2];
      fVar223 = (local_5f0->vx).field_0.m128[3];
      fVar199 = (local_5f0->vy).field_0.m128[0];
      fVar216 = (local_5f0->vy).field_0.m128[1];
      fVar219 = (local_5f0->vy).field_0.m128[2];
      fVar221 = (local_5f0->vy).field_0.m128[3];
      fVar229 = (local_5f0->vz).field_0.m128[0];
      fVar240 = (local_5f0->vz).field_0.m128[1];
      fVar242 = (local_5f0->vz).field_0.m128[2];
      fVar244 = (local_5f0->vz).field_0.m128[3];
      auVar203._0_4_ =
           auVar267._0_4_ * fVar324 + auVar185._0_4_ * fVar199 + fVar229 * auVar207._0_4_;
      auVar203._4_4_ =
           auVar267._4_4_ * fVar218 + auVar185._4_4_ * fVar216 + fVar240 * auVar207._4_4_;
      auVar203._8_4_ =
           auVar267._8_4_ * fVar328 + auVar185._8_4_ * fVar219 + fVar242 * auVar207._8_4_;
      auVar203._12_4_ =
           auVar267._12_4_ * fVar223 + auVar185._12_4_ * fVar221 + fVar244 * auVar207._12_4_;
      auVar267 = vblendps_avx(auVar203,_local_780,8);
      auVar208 = vsubps_avx(_local_670,auVar183);
      auVar185 = vshufps_avx(auVar208,auVar208,0);
      auVar207 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar283._0_4_ =
           auVar185._0_4_ * fVar324 + auVar207._0_4_ * fVar199 + fVar229 * auVar208._0_4_;
      auVar283._4_4_ =
           auVar185._4_4_ * fVar218 + auVar207._4_4_ * fVar216 + fVar240 * auVar208._4_4_;
      auVar283._8_4_ =
           auVar185._8_4_ * fVar328 + auVar207._8_4_ * fVar219 + fVar242 * auVar208._8_4_;
      auVar283._12_4_ =
           auVar185._12_4_ * fVar223 + auVar207._12_4_ * fVar221 + fVar244 * auVar208._12_4_;
      auVar185 = vblendps_avx(auVar283,_local_670,8);
      auVar205 = vsubps_avx(_local_680,auVar183);
      auVar207 = vshufps_avx(auVar205,auVar205,0);
      auVar208 = vshufps_avx(auVar205,auVar205,0x55);
      auVar205 = vshufps_avx(auVar205,auVar205,0xaa);
      auVar290._0_4_ =
           auVar207._0_4_ * fVar324 + auVar208._0_4_ * fVar199 + auVar205._0_4_ * fVar229;
      auVar290._4_4_ =
           auVar207._4_4_ * fVar218 + auVar208._4_4_ * fVar216 + auVar205._4_4_ * fVar240;
      auVar290._8_4_ =
           auVar207._8_4_ * fVar328 + auVar208._8_4_ * fVar219 + auVar205._8_4_ * fVar242;
      auVar290._12_4_ =
           auVar207._12_4_ * fVar223 + auVar208._12_4_ * fVar221 + auVar205._12_4_ * fVar244;
      auVar207 = vblendps_avx(auVar290,_local_680,8);
      auVar205 = vsubps_avx(_local_690,auVar183);
      auVar183 = vshufps_avx(auVar205,auVar205,0);
      auVar208 = vshufps_avx(auVar205,auVar205,0x55);
      auVar205 = vshufps_avx(auVar205,auVar205,0xaa);
      auVar158._0_4_ =
           auVar183._0_4_ * fVar324 + auVar208._0_4_ * fVar199 + fVar229 * auVar205._0_4_;
      auVar158._4_4_ =
           auVar183._4_4_ * fVar218 + auVar208._4_4_ * fVar216 + fVar240 * auVar205._4_4_;
      auVar158._8_4_ =
           auVar183._8_4_ * fVar328 + auVar208._8_4_ * fVar219 + fVar242 * auVar205._8_4_;
      auVar158._12_4_ =
           auVar183._12_4_ * fVar223 + auVar208._12_4_ * fVar221 + fVar244 * auVar205._12_4_;
      auVar183 = vblendps_avx(auVar158,_local_690,8);
      auVar233._8_4_ = 0x7fffffff;
      auVar233._0_8_ = 0x7fffffff7fffffff;
      auVar233._12_4_ = 0x7fffffff;
      auVar267 = vandps_avx(auVar267,auVar233);
      auVar185 = vandps_avx(auVar185,auVar233);
      auVar208 = vmaxps_avx(auVar267,auVar185);
      auVar267 = vandps_avx(auVar207,auVar233);
      auVar185 = vandps_avx(auVar183,auVar233);
      auVar267 = vmaxps_avx(auVar267,auVar185);
      auVar267 = vmaxps_avx(auVar208,auVar267);
      auVar185 = vmovshdup_avx(auVar267);
      auVar185 = vmaxss_avx(auVar185,auVar267);
      auVar267 = vshufpd_avx(auVar267,auVar267,1);
      auVar267 = vmaxss_avx(auVar267,auVar185);
      fVar324 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar20 + 0x908);
      fVar218 = *(float *)(catmullrom_basis0 + lVar20 + 0x90c);
      fVar328 = *(float *)(catmullrom_basis0 + lVar20 + 0x910);
      fVar223 = *(float *)(catmullrom_basis0 + lVar20 + 0x914);
      fVar199 = *(float *)(catmullrom_basis0 + lVar20 + 0x918);
      fVar216 = *(float *)(catmullrom_basis0 + lVar20 + 0x91c);
      fVar219 = *(float *)(catmullrom_basis0 + lVar20 + 0x920);
      auVar116 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar20 + 0x908);
      auVar185 = vshufps_avx(auVar290,auVar290,0);
      register0x00001250 = auVar185;
      _local_6c0 = auVar185;
      auVar207 = vshufps_avx(auVar290,auVar290,0x55);
      register0x00001290 = auVar207;
      _local_460 = auVar207;
      pauVar10 = (undefined1 (*) [32])(catmullrom_basis0 + lVar20 + 0xd8c);
      fVar221 = *(float *)*pauVar10;
      fVar229 = *(float *)(catmullrom_basis0 + lVar20 + 0xd90);
      fVar240 = *(float *)(catmullrom_basis0 + lVar20 + 0xd94);
      fVar242 = *(float *)(catmullrom_basis0 + lVar20 + 0xd98);
      fVar244 = *(float *)(catmullrom_basis0 + lVar20 + 0xd9c);
      fVar248 = *(float *)(catmullrom_basis0 + lVar20 + 0xda0);
      fVar257 = *(float *)(catmullrom_basis0 + lVar20 + 0xda4);
      auVar115 = *(undefined1 (*) [28])*pauVar10;
      _auStack_6f0 = SUB3216(*pauVar10,0x10);
      auVar183 = vshufps_avx(auVar158,auVar158,0);
      register0x00001210 = auVar183;
      _local_5c0 = auVar183;
      fVar130 = auVar183._0_4_;
      fVar264 = auVar183._4_4_;
      fVar148 = auVar183._8_4_;
      fVar150 = auVar183._12_4_;
      fVar154 = auVar185._0_4_;
      fVar173 = auVar185._4_4_;
      fVar174 = auVar185._8_4_;
      fVar175 = auVar185._12_4_;
      auVar185 = vshufps_avx(auVar158,auVar158,0x55);
      fVar323 = auVar185._0_4_;
      fVar327 = auVar185._4_4_;
      fVar329 = auVar185._8_4_;
      fVar330 = auVar185._12_4_;
      fVar177 = auVar207._0_4_;
      fVar193 = auVar207._4_4_;
      fVar195 = auVar207._8_4_;
      fVar197 = auVar207._12_4_;
      auVar185 = vshufps_avx(_local_680,_local_680,0xff);
      register0x00001450 = auVar185;
      _local_260 = auVar185;
      auVar207 = vshufps_avx(_local_690,_local_690,0xff);
      register0x00001390 = auVar207;
      _local_80 = auVar207;
      fVar265 = auVar207._0_4_;
      fVar274 = auVar207._4_4_;
      fVar275 = auVar207._8_4_;
      fVar276 = auVar207._12_4_;
      fVar298 = auVar185._0_4_;
      fVar305 = auVar185._4_4_;
      fVar306 = auVar185._8_4_;
      auVar207 = vshufps_avx(auVar283,auVar283,0);
      auVar234._16_16_ = auVar207;
      auVar234._0_16_ = auVar207;
      fVar259 = *(float *)(catmullrom_basis0 + lVar20 + 0x484);
      fVar261 = *(float *)(catmullrom_basis0 + lVar20 + 0x488);
      fVar320 = *(float *)(catmullrom_basis0 + lVar20 + 0x48c);
      fVar292 = *(float *)(catmullrom_basis0 + lVar20 + 0x490);
      fVar293 = *(float *)(catmullrom_basis0 + lVar20 + 0x494);
      fVar225 = *(float *)(catmullrom_basis0 + lVar20 + 0x498);
      fVar321 = *(float *)(catmullrom_basis0 + lVar20 + 0x49c);
      fVar230 = auVar207._0_4_;
      fVar241 = auVar207._4_4_;
      fVar243 = auVar207._8_4_;
      fVar245 = auVar207._12_4_;
      auVar207 = vshufps_avx(auVar283,auVar283,0x55);
      fVar354 = auVar207._0_4_;
      fVar357 = auVar207._4_4_;
      fVar358 = auVar207._8_4_;
      fVar359 = auVar207._12_4_;
      auVar207 = vshufps_avx(_local_670,_local_670,0xff);
      register0x00001590 = auVar207;
      _local_280 = auVar207;
      fVar345 = auVar207._0_4_;
      fVar348 = auVar207._4_4_;
      fVar350 = auVar207._8_4_;
      fVar352 = auVar207._12_4_;
      auVar207 = vshufps_avx(auVar203,auVar203,0);
      register0x00001350 = auVar207;
      _local_480 = auVar207;
      pauVar10 = (undefined1 (*) [32])(catmullrom_basis0 + lVar20);
      fVar294 = *(float *)*pauVar10;
      fVar295 = *(float *)(catmullrom_basis0 + lVar20 + 4);
      fVar227 = *(float *)(catmullrom_basis0 + lVar20 + 8);
      fVar322 = *(float *)(catmullrom_basis0 + lVar20 + 0xc);
      fVar296 = *(float *)(catmullrom_basis0 + lVar20 + 0x10);
      fVar297 = *(float *)(catmullrom_basis0 + lVar20 + 0x14);
      fVar228 = *(float *)(catmullrom_basis0 + lVar20 + 0x18);
      auVar117 = *(undefined1 (*) [28])*pauVar10;
      fVar249 = auVar207._0_4_;
      fVar258 = auVar207._4_4_;
      fVar260 = auVar207._8_4_;
      fVar262 = auVar207._12_4_;
      auVar284._0_4_ = fVar249 * fVar294 + fVar230 * fVar259 + fVar154 * fVar324 + fVar130 * fVar221
      ;
      auVar284._4_4_ = fVar258 * fVar295 + fVar241 * fVar261 + fVar173 * fVar218 + fVar264 * fVar229
      ;
      auVar284._8_4_ = fVar260 * fVar227 + fVar243 * fVar320 + fVar174 * fVar328 + fVar148 * fVar240
      ;
      auVar284._12_4_ =
           fVar262 * fVar322 + fVar245 * fVar292 + fVar175 * fVar223 + fVar150 * fVar242;
      auVar284._16_4_ =
           fVar249 * fVar296 + fVar230 * fVar293 + fVar154 * fVar199 + fVar130 * fVar244;
      auVar284._20_4_ =
           fVar258 * fVar297 + fVar241 * fVar225 + fVar173 * fVar216 + fVar264 * fVar248;
      auVar284._24_4_ =
           fVar260 * fVar228 + fVar243 * fVar321 + fVar174 * fVar219 + fVar148 * fVar257;
      auVar284._28_4_ = fVar262 + fVar175 + fVar150 + 0.0;
      auVar207 = vshufps_avx(auVar203,auVar203,0x55);
      register0x00001290 = auVar207;
      _local_240 = auVar207;
      fVar178 = auVar207._0_4_;
      fVar194 = auVar207._4_4_;
      fVar196 = auVar207._8_4_;
      fVar198 = auVar207._12_4_;
      auVar332._0_4_ = fVar178 * fVar294 + fVar354 * fVar259 + fVar177 * fVar324 + fVar323 * fVar221
      ;
      auVar332._4_4_ = fVar194 * fVar295 + fVar357 * fVar261 + fVar193 * fVar218 + fVar327 * fVar229
      ;
      auVar332._8_4_ = fVar196 * fVar227 + fVar358 * fVar320 + fVar195 * fVar328 + fVar329 * fVar240
      ;
      auVar332._12_4_ =
           fVar198 * fVar322 + fVar359 * fVar292 + fVar197 * fVar223 + fVar330 * fVar242;
      auVar332._16_4_ =
           fVar178 * fVar296 + fVar354 * fVar293 + fVar177 * fVar199 + fVar323 * fVar244;
      auVar332._20_4_ =
           fVar194 * fVar297 + fVar357 * fVar225 + fVar193 * fVar216 + fVar327 * fVar248;
      auVar332._24_4_ =
           fVar196 * fVar228 + fVar358 * fVar321 + fVar195 * fVar219 + fVar329 * fVar257;
      auVar332._28_4_ = fVar197 + 0.0 + 0.0 + 0.0;
      auVar207 = vpermilps_avx(_local_780,0xff);
      register0x00001490 = auVar207;
      _local_a0 = auVar207;
      fVar308 = auVar207._0_4_;
      fVar315 = auVar207._4_4_;
      fVar317 = auVar207._8_4_;
      auVar138._0_4_ = fVar345 * fVar259 + fVar298 * fVar324 + fVar265 * fVar221 + fVar308 * fVar294
      ;
      auVar138._4_4_ = fVar348 * fVar261 + fVar305 * fVar218 + fVar274 * fVar229 + fVar315 * fVar295
      ;
      auVar138._8_4_ = fVar350 * fVar320 + fVar306 * fVar328 + fVar275 * fVar240 + fVar317 * fVar227
      ;
      auVar138._12_4_ =
           fVar352 * fVar292 + auVar185._12_4_ * fVar223 + fVar276 * fVar242 +
           auVar207._12_4_ * fVar322;
      auVar138._16_4_ =
           fVar345 * fVar293 + fVar298 * fVar199 + fVar265 * fVar244 + fVar308 * fVar296;
      auVar138._20_4_ =
           fVar348 * fVar225 + fVar305 * fVar216 + fVar274 * fVar248 + fVar315 * fVar297;
      auVar138._24_4_ =
           fVar350 * fVar321 + fVar306 * fVar219 + fVar275 * fVar257 + fVar317 * fVar228;
      auVar138._28_4_ = 0;
      fVar221 = *(float *)(catmullrom_basis1 + lVar20 + 0x908);
      fVar229 = *(float *)(catmullrom_basis1 + lVar20 + 0x90c);
      fVar240 = *(float *)(catmullrom_basis1 + lVar20 + 0x910);
      fVar242 = *(float *)(catmullrom_basis1 + lVar20 + 0x914);
      fVar244 = *(float *)(catmullrom_basis1 + lVar20 + 0x918);
      fVar248 = *(float *)(catmullrom_basis1 + lVar20 + 0x91c);
      fVar257 = *(float *)(catmullrom_basis1 + lVar20 + 0x920);
      fVar294 = *(float *)(catmullrom_basis1 + lVar20 + 0xd8c);
      fVar295 = *(float *)(catmullrom_basis1 + lVar20 + 0xd90);
      fVar227 = *(float *)(catmullrom_basis1 + lVar20 + 0xd94);
      fVar322 = *(float *)(catmullrom_basis1 + lVar20 + 0xd98);
      fVar296 = *(float *)(catmullrom_basis1 + lVar20 + 0xd9c);
      fVar297 = *(float *)(catmullrom_basis1 + lVar20 + 0xda0);
      fVar228 = *(float *)(catmullrom_basis1 + lVar20 + 0xda4);
      fVar247 = *(float *)(catmullrom_basis1 + lVar20 + 0x484);
      fVar246 = *(float *)(catmullrom_basis1 + lVar20 + 0x488);
      fVar277 = *(float *)(catmullrom_basis1 + lVar20 + 0x48c);
      fVar149 = *(float *)(catmullrom_basis1 + lVar20 + 0x490);
      fVar176 = *(float *)(catmullrom_basis1 + lVar20 + 0x494);
      fVar151 = *(float *)(catmullrom_basis1 + lVar20 + 0x498);
      fVar152 = *(float *)(catmullrom_basis1 + lVar20 + 0x49c);
      fVar153 = *(float *)(catmullrom_basis1 + lVar20);
      fVar200 = *(float *)(catmullrom_basis1 + lVar20 + 4);
      fVar217 = *(float *)(catmullrom_basis1 + lVar20 + 8);
      fVar220 = *(float *)(catmullrom_basis1 + lVar20 + 0xc);
      fVar222 = *(float *)(catmullrom_basis1 + lVar20 + 0x10);
      fVar224 = *(float *)(catmullrom_basis1 + lVar20 + 0x14);
      fVar226 = *(float *)(catmullrom_basis1 + lVar20 + 0x18);
      auVar235._0_4_ = fVar249 * fVar153 + fVar230 * fVar247 + fVar221 * fVar154 + fVar294 * fVar130
      ;
      auVar235._4_4_ = fVar258 * fVar200 + fVar241 * fVar246 + fVar229 * fVar173 + fVar295 * fVar264
      ;
      auVar235._8_4_ = fVar260 * fVar217 + fVar243 * fVar277 + fVar240 * fVar174 + fVar227 * fVar148
      ;
      auVar235._12_4_ =
           fVar262 * fVar220 + fVar245 * fVar149 + fVar242 * fVar175 + fVar322 * fVar150;
      auVar235._16_4_ =
           fVar249 * fVar222 + fVar230 * fVar176 + fVar244 * fVar154 + fVar296 * fVar130;
      auVar235._20_4_ =
           fVar258 * fVar224 + fVar241 * fVar151 + fVar248 * fVar173 + fVar297 * fVar264;
      auVar235._24_4_ =
           fVar260 * fVar226 + fVar243 * fVar152 + fVar257 * fVar174 + fVar228 * fVar148;
      auVar235._28_4_ = fVar352 + fVar262 + 0.0 + 0.0;
      auVar204._0_4_ = fVar178 * fVar153 + fVar354 * fVar247 + fVar221 * fVar177 + fVar323 * fVar294
      ;
      auVar204._4_4_ = fVar194 * fVar200 + fVar357 * fVar246 + fVar229 * fVar193 + fVar327 * fVar295
      ;
      auVar204._8_4_ = fVar196 * fVar217 + fVar358 * fVar277 + fVar240 * fVar195 + fVar329 * fVar227
      ;
      auVar204._12_4_ =
           fVar198 * fVar220 + fVar359 * fVar149 + fVar242 * fVar197 + fVar330 * fVar322;
      auVar209._16_4_ =
           fVar178 * fVar222 + fVar354 * fVar176 + fVar244 * fVar177 + fVar323 * fVar296;
      auVar209._0_16_ = auVar204;
      auVar209._20_4_ =
           fVar194 * fVar224 + fVar357 * fVar151 + fVar248 * fVar193 + fVar327 * fVar297;
      auVar209._24_4_ =
           fVar196 * fVar226 + fVar358 * fVar152 + fVar257 * fVar195 + fVar329 * fVar228;
      auVar209._28_4_ = fVar198 + fVar262 + 0.0 + 0.0;
      auVar300._0_4_ = fVar345 * fVar247 + fVar298 * fVar221 + fVar294 * fVar265 + fVar308 * fVar153
      ;
      auVar300._4_4_ = fVar348 * fVar246 + fVar305 * fVar229 + fVar295 * fVar274 + fVar315 * fVar200
      ;
      auVar300._8_4_ = fVar350 * fVar277 + fVar306 * fVar240 + fVar227 * fVar275 + fVar317 * fVar217
      ;
      auVar300._12_4_ =
           fVar352 * fVar149 + auVar185._12_4_ * fVar242 + fVar322 * fVar276 +
           auVar207._12_4_ * fVar220;
      auVar300._16_4_ =
           fVar345 * fVar176 + fVar298 * fVar244 + fVar296 * fVar265 + fVar308 * fVar222;
      auVar300._20_4_ =
           fVar348 * fVar151 + fVar305 * fVar248 + fVar297 * fVar274 + fVar315 * fVar224;
      auVar300._24_4_ =
           fVar350 * fVar152 + fVar306 * fVar257 + fVar228 * fVar275 + fVar317 * fVar226;
      auVar300._28_4_ = fVar276 + fVar262 + 0.0 + fVar198;
      local_500 = vsubps_avx(auVar235,auVar284);
      auVar26 = vsubps_avx(auVar209,auVar332);
      fVar324 = local_500._0_4_;
      fVar218 = local_500._4_4_;
      auVar170._4_4_ = auVar332._4_4_ * fVar218;
      auVar170._0_4_ = auVar332._0_4_ * fVar324;
      fVar328 = local_500._8_4_;
      auVar170._8_4_ = auVar332._8_4_ * fVar328;
      fVar223 = local_500._12_4_;
      auVar170._12_4_ = auVar332._12_4_ * fVar223;
      fVar199 = local_500._16_4_;
      auVar170._16_4_ = auVar332._16_4_ * fVar199;
      fVar216 = local_500._20_4_;
      auVar170._20_4_ = auVar332._20_4_ * fVar216;
      fVar219 = local_500._24_4_;
      auVar170._24_4_ = auVar332._24_4_ * fVar219;
      auVar170._28_4_ = fVar198;
      fVar265 = auVar26._0_4_;
      fVar274 = auVar26._4_4_;
      auVar27._4_4_ = fVar274 * auVar284._4_4_;
      auVar27._0_4_ = fVar265 * auVar284._0_4_;
      fVar275 = auVar26._8_4_;
      auVar27._8_4_ = fVar275 * auVar284._8_4_;
      fVar276 = auVar26._12_4_;
      auVar27._12_4_ = fVar276 * auVar284._12_4_;
      fVar298 = auVar26._16_4_;
      auVar27._16_4_ = fVar298 * auVar284._16_4_;
      fVar305 = auVar26._20_4_;
      auVar27._20_4_ = fVar305 * auVar284._20_4_;
      fVar306 = auVar26._24_4_;
      auVar27._24_4_ = fVar306 * auVar284._24_4_;
      auVar27._28_4_ = auVar209._28_4_;
      auVar27 = vsubps_avx(auVar170,auVar27);
      auVar170 = vmaxps_avx(auVar138,auVar300);
      auVar33._4_4_ = auVar170._4_4_ * auVar170._4_4_ * (fVar218 * fVar218 + fVar274 * fVar274);
      auVar33._0_4_ = auVar170._0_4_ * auVar170._0_4_ * (fVar324 * fVar324 + fVar265 * fVar265);
      auVar33._8_4_ = auVar170._8_4_ * auVar170._8_4_ * (fVar328 * fVar328 + fVar275 * fVar275);
      auVar33._12_4_ = auVar170._12_4_ * auVar170._12_4_ * (fVar223 * fVar223 + fVar276 * fVar276);
      auVar33._16_4_ = auVar170._16_4_ * auVar170._16_4_ * (fVar199 * fVar199 + fVar298 * fVar298);
      auVar33._20_4_ = auVar170._20_4_ * auVar170._20_4_ * (fVar216 * fVar216 + fVar305 * fVar305);
      auVar33._24_4_ = auVar170._24_4_ * auVar170._24_4_ * (fVar219 * fVar219 + fVar306 * fVar306);
      auVar33._28_4_ = auVar235._28_4_ + auVar209._28_4_;
      auVar302._4_4_ = auVar27._4_4_ * auVar27._4_4_;
      auVar302._0_4_ = auVar27._0_4_ * auVar27._0_4_;
      auVar302._8_4_ = auVar27._8_4_ * auVar27._8_4_;
      auVar302._12_4_ = auVar27._12_4_ * auVar27._12_4_;
      auVar302._16_4_ = auVar27._16_4_ * auVar27._16_4_;
      auVar302._20_4_ = auVar27._20_4_ * auVar27._20_4_;
      auVar302._24_4_ = auVar27._24_4_ * auVar27._24_4_;
      auVar302._28_4_ = auVar27._28_4_;
      auVar170 = vcmpps_avx(auVar302,auVar33,2);
      local_560 = (float)(int)uVar15;
      fStack_55c = 0.0;
      fStack_558 = 0.0;
      fStack_554 = 0.0;
      auVar185 = vshufps_avx(ZEXT416((uint)local_560),ZEXT416((uint)local_560),0);
      auVar210._16_16_ = auVar185;
      auVar210._0_16_ = auVar185;
      auVar27 = vcmpps_avx(_DAT_01faff40,auVar210,1);
      auVar215 = ZEXT3264(auVar27);
      auVar185 = vpermilps_avx(auVar203,0xaa);
      register0x00001490 = auVar185;
      _local_2a0 = auVar185;
      auVar207 = vpermilps_avx(auVar283,0xaa);
      register0x00001550 = auVar207;
      _local_4a0 = auVar207;
      auVar183 = vpermilps_avx(auVar290,0xaa);
      register0x00001590 = auVar183;
      _local_c0 = auVar183;
      auVar208 = vpermilps_avx(auVar158,0xaa);
      register0x00001310 = auVar208;
      _local_5a0 = auVar208;
      auVar33 = auVar27 & auVar170;
      uVar124 = *(uint *)(ray + k * 4 + 0x60);
      auVar267 = ZEXT416((uint)(auVar267._0_4_ * 4.7683716e-07));
      auVar302 = local_620;
      auVar210 = local_640;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0x7f,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0xbf,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f])
      {
LAB_00fafcfa:
        bVar126 = false;
      }
      else {
        auVar170 = vandps_avx(auVar170,auVar27);
        fVar309 = auVar185._0_4_;
        fVar316 = auVar185._4_4_;
        fVar318 = auVar185._8_4_;
        fVar319 = auVar185._12_4_;
        fVar338 = auVar207._0_4_;
        fVar342 = auVar207._4_4_;
        fVar343 = auVar207._8_4_;
        fVar344 = auVar207._12_4_;
        fVar346 = auVar183._0_4_;
        fVar349 = auVar183._4_4_;
        fVar351 = auVar183._8_4_;
        fVar353 = auVar183._12_4_;
        fVar324 = auVar208._0_4_;
        fVar218 = auVar208._4_4_;
        fVar328 = auVar208._8_4_;
        fVar223 = auVar208._12_4_;
        fVar199 = auVar27._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar20 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar20 + 0x4a0);
        local_4e0._0_4_ =
             fVar309 * fVar153 + fVar338 * fVar247 + fVar346 * fVar221 + fVar294 * fVar324;
        local_4e0._4_4_ =
             fVar316 * fVar200 + fVar342 * fVar246 + fVar349 * fVar229 + fVar295 * fVar218;
        fStack_4d8 = fVar318 * fVar217 + fVar343 * fVar277 + fVar351 * fVar240 + fVar227 * fVar328;
        fStack_4d4 = fVar319 * fVar220 + fVar344 * fVar149 + fVar353 * fVar242 + fVar322 * fVar223;
        fStack_4d0 = fVar309 * fVar222 + fVar338 * fVar176 + fVar346 * fVar244 + fVar296 * fVar324;
        fStack_4cc = fVar316 * fVar224 + fVar342 * fVar151 + fVar349 * fVar248 + fVar297 * fVar218;
        fStack_4c8 = fVar318 * fVar226 + fVar343 * fVar152 + fVar351 * fVar257 + fVar228 * fVar328;
        fStack_4c4 = auVar170._28_4_ + fVar199;
        local_4c0._0_4_ = auVar117._0_4_;
        local_4c0._4_4_ = auVar117._4_4_;
        fStack_4b8 = auVar117._8_4_;
        fStack_4b4 = auVar117._12_4_;
        fStack_4b0 = auVar117._16_4_;
        fStack_4ac = auVar117._20_4_;
        fStack_4a8 = auVar117._24_4_;
        local_720._0_4_ = auVar116._0_4_;
        local_720._4_4_ = auVar116._4_4_;
        uStack_718._0_4_ = auVar116._8_4_;
        uStack_718._4_4_ = auVar116._12_4_;
        uStack_710._0_4_ = auVar116._16_4_;
        uStack_710._4_4_ = auVar116._20_4_;
        uStack_708._0_4_ = auVar116._24_4_;
        local_700._0_4_ = auVar115._0_4_;
        local_700._4_4_ = auVar115._4_4_;
        fStack_6f8 = auVar115._8_4_;
        fStack_6f4 = auVar115._12_4_;
        auStack_6f0._0_4_ = auVar115._16_4_;
        auStack_6f0._4_4_ = auVar115._20_4_;
        fStack_6e8 = auVar115._24_4_;
        local_720._0_4_ =
             fVar309 * (float)local_4c0._0_4_ +
             fVar338 * fVar259 + fVar346 * (float)local_720._0_4_ + fVar324 * (float)local_700._0_4_
        ;
        local_720._4_4_ =
             fVar316 * (float)local_4c0._4_4_ +
             fVar342 * fVar261 + fVar349 * (float)local_720._4_4_ + fVar218 * (float)local_700._4_4_
        ;
        uStack_718._0_4_ =
             fVar318 * fStack_4b8 +
             fVar343 * fVar320 + fVar351 * (float)uStack_718 + fVar328 * fStack_6f8;
        uStack_718._4_4_ =
             fVar319 * fStack_4b4 +
             fVar344 * fVar292 + fVar353 * uStack_718._4_4_ + fVar223 * fStack_6f4;
        uStack_710._0_4_ =
             fVar309 * fStack_4b0 +
             fVar338 * fVar293 + fVar346 * (float)uStack_710 + fVar324 * (float)auStack_6f0._0_4_;
        uStack_710._4_4_ =
             fVar316 * fStack_4ac +
             fVar342 * fVar225 + fVar349 * uStack_710._4_4_ + fVar218 * (float)auStack_6f0._4_4_;
        uStack_708._0_4_ =
             fVar318 * fStack_4a8 +
             fVar343 * fVar321 + fVar351 * (float)uStack_708 + fVar328 * fStack_6e8;
        uStack_708._4_4_ = fStack_4c4 + fVar199 + auVar170._28_4_ + auVar27._28_4_;
        fVar199 = *(float *)(catmullrom_basis0 + lVar20 + 0x1210);
        fVar216 = *(float *)(catmullrom_basis0 + lVar20 + 0x1214);
        fVar219 = *(float *)(catmullrom_basis0 + lVar20 + 0x1218);
        fVar221 = *(float *)(catmullrom_basis0 + lVar20 + 0x121c);
        fVar229 = *(float *)(catmullrom_basis0 + lVar20 + 0x1220);
        fVar240 = *(float *)(catmullrom_basis0 + lVar20 + 0x1224);
        fVar242 = *(float *)(catmullrom_basis0 + lVar20 + 0x1228);
        fVar244 = *(float *)(catmullrom_basis0 + lVar20 + 0x1694);
        fVar248 = *(float *)(catmullrom_basis0 + lVar20 + 0x1698);
        fVar257 = *(float *)(catmullrom_basis0 + lVar20 + 0x169c);
        fVar259 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a0);
        fVar261 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a4);
        fVar320 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a8);
        fVar292 = *(float *)(catmullrom_basis0 + lVar20 + 0x16ac);
        fVar293 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b18);
        fVar225 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b1c);
        fVar321 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b20);
        fVar294 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b24);
        fVar295 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b28);
        fVar227 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b2c);
        fVar322 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b30);
        fVar296 = *(float *)(catmullrom_basis0 + lVar20 + 0x1f9c);
        fVar297 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa0);
        fVar228 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa4);
        fVar247 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa8);
        fVar246 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fac);
        fVar277 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fb0);
        fVar149 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fb4);
        fVar263 = *(float *)(catmullrom_basis1 + lVar20 + 0x4a0) + 0.0;
        fVar176 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar20 + 0x1fb8);
        fVar307 = *(float *)(catmullrom_basis0 + lVar20 + 0x16b0) + fVar176;
        auVar164._0_4_ =
             fVar178 * fVar199 + fVar177 * fVar293 + fVar323 * fVar296 + fVar354 * fVar244;
        auVar164._4_4_ =
             fVar194 * fVar216 + fVar193 * fVar225 + fVar327 * fVar297 + fVar357 * fVar248;
        auVar164._8_4_ =
             fVar196 * fVar219 + fVar195 * fVar321 + fVar329 * fVar228 + fVar358 * fVar257;
        auVar164._12_4_ =
             fVar198 * fVar221 + fVar197 * fVar294 + fVar330 * fVar247 + fVar359 * fVar259;
        auVar164._16_4_ =
             fVar178 * fVar229 + fVar177 * fVar295 + fVar323 * fVar246 + fVar354 * fVar261;
        auVar164._20_4_ =
             fVar194 * fVar240 + fVar193 * fVar227 + fVar327 * fVar277 + fVar357 * fVar320;
        auVar164._24_4_ =
             fVar196 * fVar242 + fVar195 * fVar322 + fVar329 * fVar149 + fVar358 * fVar292;
        auVar164._28_4_ = fVar176 + *(float *)(catmullrom_basis1 + lVar20 + 0x1c) + 0.0 + fVar263;
        auVar251._0_4_ =
             fVar338 * fVar244 + fVar346 * fVar293 + fVar324 * fVar296 + fVar309 * fVar199;
        auVar251._4_4_ =
             fVar342 * fVar248 + fVar349 * fVar225 + fVar218 * fVar297 + fVar316 * fVar216;
        auVar251._8_4_ =
             fVar343 * fVar257 + fVar351 * fVar321 + fVar328 * fVar228 + fVar318 * fVar219;
        auVar251._12_4_ =
             fVar344 * fVar259 + fVar353 * fVar294 + fVar223 * fVar247 + fVar319 * fVar221;
        auVar251._16_4_ =
             fVar338 * fVar261 + fVar346 * fVar295 + fVar324 * fVar246 + fVar309 * fVar229;
        auVar251._20_4_ =
             fVar342 * fVar320 + fVar349 * fVar227 + fVar218 * fVar277 + fVar316 * fVar240;
        auVar251._24_4_ =
             fVar343 * fVar292 + fVar351 * fVar322 + fVar328 * fVar149 + fVar318 * fVar242;
        auVar251._28_4_ = fVar307 + *(float *)(catmullrom_basis0 + lVar20 + 0x122c);
        fVar176 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b18);
        fVar151 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b1c);
        fVar152 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b20);
        fVar153 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b24);
        fVar200 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b28);
        fVar217 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b2c);
        fVar220 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b30);
        fVar222 = *(float *)(catmullrom_basis1 + lVar20 + 0x1f9c);
        fVar224 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa0);
        fVar226 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa4);
        fVar265 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa8);
        fVar274 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fac);
        fVar275 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fb0);
        fVar276 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fb4);
        fVar298 = *(float *)(catmullrom_basis1 + lVar20 + 0x1694);
        fVar305 = *(float *)(catmullrom_basis1 + lVar20 + 0x1698);
        fVar306 = *(float *)(catmullrom_basis1 + lVar20 + 0x169c);
        fVar308 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a0);
        fVar315 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a4);
        fVar317 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a8);
        fVar345 = *(float *)(catmullrom_basis1 + lVar20 + 0x16ac);
        fVar348 = *(float *)(catmullrom_basis1 + lVar20 + 0x1210);
        fVar350 = *(float *)(catmullrom_basis1 + lVar20 + 0x1214);
        fVar352 = *(float *)(catmullrom_basis1 + lVar20 + 0x1218);
        fVar107 = *(float *)(catmullrom_basis1 + lVar20 + 0x121c);
        fVar108 = *(float *)(catmullrom_basis1 + lVar20 + 0x1220);
        fVar109 = *(float *)(catmullrom_basis1 + lVar20 + 0x1224);
        fVar110 = *(float *)(catmullrom_basis1 + lVar20 + 0x1228);
        auVar269._0_4_ =
             fVar249 * fVar348 + fVar230 * fVar298 + fVar154 * fVar176 + fVar130 * fVar222;
        auVar269._4_4_ =
             fVar258 * fVar350 + fVar241 * fVar305 + fVar173 * fVar151 + fVar264 * fVar224;
        auVar269._8_4_ =
             fVar260 * fVar352 + fVar243 * fVar306 + fVar174 * fVar152 + fVar148 * fVar226;
        auVar269._12_4_ =
             fVar262 * fVar107 + fVar245 * fVar308 + fVar175 * fVar153 + fVar150 * fVar265;
        auVar269._16_4_ =
             fVar249 * fVar108 + fVar230 * fVar315 + fVar154 * fVar200 + fVar130 * fVar274;
        auVar269._20_4_ =
             fVar258 * fVar109 + fVar241 * fVar317 + fVar173 * fVar217 + fVar264 * fVar275;
        auVar269._24_4_ =
             fVar260 * fVar110 + fVar243 * fVar345 + fVar174 * fVar220 + fVar148 * fVar276;
        auVar269._28_4_ = fVar319 + fVar319 + fVar307 + fVar150;
        auVar301._0_4_ =
             fVar178 * fVar348 + fVar354 * fVar298 + fVar177 * fVar176 + fVar323 * fVar222;
        auVar301._4_4_ =
             fVar194 * fVar350 + fVar357 * fVar305 + fVar193 * fVar151 + fVar327 * fVar224;
        auVar301._8_4_ =
             fVar196 * fVar352 + fVar358 * fVar306 + fVar195 * fVar152 + fVar329 * fVar226;
        auVar301._12_4_ =
             fVar198 * fVar107 + fVar359 * fVar308 + fVar197 * fVar153 + fVar330 * fVar265;
        auVar301._16_4_ =
             fVar178 * fVar108 + fVar354 * fVar315 + fVar177 * fVar200 + fVar323 * fVar274;
        auVar301._20_4_ =
             fVar194 * fVar109 + fVar357 * fVar317 + fVar193 * fVar217 + fVar327 * fVar275;
        auVar301._24_4_ =
             fVar196 * fVar110 + fVar358 * fVar345 + fVar195 * fVar220 + fVar329 * fVar276;
        auVar301._28_4_ = fVar319 + fVar319 + fVar319 + fVar307;
        auVar187._0_4_ =
             fVar309 * fVar348 + fVar338 * fVar298 + fVar346 * fVar176 + fVar222 * fVar324;
        auVar187._4_4_ =
             fVar316 * fVar350 + fVar342 * fVar305 + fVar349 * fVar151 + fVar224 * fVar218;
        auVar187._8_4_ =
             fVar318 * fVar352 + fVar343 * fVar306 + fVar351 * fVar152 + fVar226 * fVar328;
        auVar187._12_4_ =
             fVar319 * fVar107 + fVar344 * fVar308 + fVar353 * fVar153 + fVar265 * fVar223;
        auVar187._16_4_ =
             fVar309 * fVar108 + fVar338 * fVar315 + fVar346 * fVar200 + fVar274 * fVar324;
        auVar187._20_4_ =
             fVar316 * fVar109 + fVar342 * fVar317 + fVar349 * fVar217 + fVar275 * fVar218;
        auVar187._24_4_ =
             fVar318 * fVar110 + fVar343 * fVar345 + fVar351 * fVar220 + fVar276 * fVar328;
        auVar187._28_4_ =
             *(float *)(catmullrom_basis1 + lVar20 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x1fb8);
        auVar236._8_4_ = 0x7fffffff;
        auVar236._0_8_ = 0x7fffffff7fffffff;
        auVar236._12_4_ = 0x7fffffff;
        auVar236._16_4_ = 0x7fffffff;
        auVar236._20_4_ = 0x7fffffff;
        auVar236._24_4_ = 0x7fffffff;
        auVar236._28_4_ = 0x7fffffff;
        auVar111._4_4_ =
             fVar258 * fVar216 + fVar241 * fVar248 + fVar173 * fVar225 + fVar264 * fVar297;
        auVar111._0_4_ =
             fVar249 * fVar199 + fVar230 * fVar244 + fVar154 * fVar293 + fVar130 * fVar296;
        auVar111._8_4_ =
             fVar260 * fVar219 + fVar243 * fVar257 + fVar174 * fVar321 + fVar148 * fVar228;
        auVar111._12_4_ =
             fVar262 * fVar221 + fVar245 * fVar259 + fVar175 * fVar294 + fVar150 * fVar247;
        auVar111._16_4_ =
             fVar249 * fVar229 + fVar230 * fVar261 + fVar154 * fVar295 + fVar130 * fVar246;
        auVar111._20_4_ =
             fVar258 * fVar240 + fVar241 * fVar320 + fVar173 * fVar227 + fVar264 * fVar277;
        auVar111._24_4_ =
             fVar260 * fVar242 + fVar243 * fVar292 + fVar174 * fVar322 + fVar148 * fVar149;
        auVar111._28_4_ =
             *(float *)(catmullrom_basis0 + lVar20 + 0x16b0) +
             *(float *)(catmullrom_basis0 + lVar20 + 0x1fb8) + fVar263;
        auVar27 = vandps_avx(auVar111,auVar236);
        auVar33 = vandps_avx(auVar164,auVar236);
        auVar33 = vmaxps_avx(auVar27,auVar33);
        auVar27 = vandps_avx(auVar251,auVar236);
        auVar27 = vmaxps_avx(auVar33,auVar27);
        auVar185 = vpermilps_avx(auVar267,0);
        auVar252._16_16_ = auVar185;
        auVar252._0_16_ = auVar185;
        auVar27 = vcmpps_avx(auVar27,auVar252,1);
        auVar302 = vblendvps_avx(auVar111,local_500,auVar27);
        auVar210 = vblendvps_avx(auVar164,auVar26,auVar27);
        auVar27 = vandps_avx(auVar269,auVar236);
        auVar33 = vandps_avx(auVar301,auVar236);
        auVar28 = vmaxps_avx(auVar27,auVar33);
        auVar27 = vandps_avx(auVar187,auVar236);
        auVar27 = vmaxps_avx(auVar28,auVar27);
        auVar28 = vcmpps_avx(auVar27,auVar252,1);
        auVar27 = vblendvps_avx(auVar269,local_500,auVar28);
        auVar26 = vblendvps_avx(auVar301,auVar26,auVar28);
        fVar246 = auVar302._0_4_;
        fVar277 = auVar302._4_4_;
        fVar149 = auVar302._8_4_;
        fVar176 = auVar302._12_4_;
        fVar151 = auVar302._16_4_;
        fVar152 = auVar302._20_4_;
        fVar153 = auVar302._24_4_;
        fVar264 = -auVar302._28_4_;
        fVar200 = auVar27._0_4_;
        fVar217 = auVar27._4_4_;
        fVar220 = auVar27._8_4_;
        fVar222 = auVar27._12_4_;
        fVar224 = auVar27._16_4_;
        fVar226 = auVar27._20_4_;
        fVar130 = auVar27._24_4_;
        fVar324 = auVar210._0_4_;
        fVar199 = auVar210._4_4_;
        fVar229 = auVar210._8_4_;
        fVar248 = auVar210._12_4_;
        fVar320 = auVar210._16_4_;
        fVar321 = auVar210._20_4_;
        fVar322 = auVar210._24_4_;
        auVar139._0_4_ = fVar324 * fVar324 + fVar246 * fVar246;
        auVar139._4_4_ = fVar199 * fVar199 + fVar277 * fVar277;
        auVar139._8_4_ = fVar229 * fVar229 + fVar149 * fVar149;
        auVar139._12_4_ = fVar248 * fVar248 + fVar176 * fVar176;
        auVar139._16_4_ = fVar320 * fVar320 + fVar151 * fVar151;
        auVar139._20_4_ = fVar321 * fVar321 + fVar152 * fVar152;
        auVar139._24_4_ = fVar322 * fVar322 + fVar153 * fVar153;
        auVar139._28_4_ = auVar301._28_4_ + auVar302._28_4_;
        auVar302 = vrsqrtps_avx(auVar139);
        fVar218 = auVar302._0_4_;
        fVar328 = auVar302._4_4_;
        auVar28._4_4_ = fVar328 * 1.5;
        auVar28._0_4_ = fVar218 * 1.5;
        fVar223 = auVar302._8_4_;
        auVar28._8_4_ = fVar223 * 1.5;
        fVar216 = auVar302._12_4_;
        auVar28._12_4_ = fVar216 * 1.5;
        fVar219 = auVar302._16_4_;
        auVar28._16_4_ = fVar219 * 1.5;
        fVar221 = auVar302._20_4_;
        auVar28._20_4_ = fVar221 * 1.5;
        fVar240 = auVar302._24_4_;
        fVar247 = auVar33._28_4_;
        auVar28._24_4_ = fVar240 * 1.5;
        auVar28._28_4_ = fVar247;
        auVar29._4_4_ = fVar328 * fVar328 * fVar328 * auVar139._4_4_ * 0.5;
        auVar29._0_4_ = fVar218 * fVar218 * fVar218 * auVar139._0_4_ * 0.5;
        auVar29._8_4_ = fVar223 * fVar223 * fVar223 * auVar139._8_4_ * 0.5;
        auVar29._12_4_ = fVar216 * fVar216 * fVar216 * auVar139._12_4_ * 0.5;
        auVar29._16_4_ = fVar219 * fVar219 * fVar219 * auVar139._16_4_ * 0.5;
        auVar29._20_4_ = fVar221 * fVar221 * fVar221 * auVar139._20_4_ * 0.5;
        auVar29._24_4_ = fVar240 * fVar240 * fVar240 * auVar139._24_4_ * 0.5;
        auVar29._28_4_ = auVar139._28_4_;
        auVar33 = vsubps_avx(auVar28,auVar29);
        fVar218 = auVar33._0_4_;
        fVar216 = auVar33._4_4_;
        fVar240 = auVar33._8_4_;
        fVar257 = auVar33._12_4_;
        fVar292 = auVar33._16_4_;
        fVar294 = auVar33._20_4_;
        fVar296 = auVar33._24_4_;
        fVar328 = auVar26._0_4_;
        fVar219 = auVar26._4_4_;
        fVar242 = auVar26._8_4_;
        fVar259 = auVar26._12_4_;
        fVar293 = auVar26._16_4_;
        fVar295 = auVar26._20_4_;
        fVar297 = auVar26._24_4_;
        auVar140._0_4_ = fVar328 * fVar328 + fVar200 * fVar200;
        auVar140._4_4_ = fVar219 * fVar219 + fVar217 * fVar217;
        auVar140._8_4_ = fVar242 * fVar242 + fVar220 * fVar220;
        auVar140._12_4_ = fVar259 * fVar259 + fVar222 * fVar222;
        auVar140._16_4_ = fVar293 * fVar293 + fVar224 * fVar224;
        auVar140._20_4_ = fVar295 * fVar295 + fVar226 * fVar226;
        auVar140._24_4_ = fVar297 * fVar297 + fVar130 * fVar130;
        auVar140._28_4_ = auVar27._28_4_ + auVar33._28_4_;
        auVar27 = vrsqrtps_avx(auVar140);
        fVar223 = auVar27._0_4_;
        fVar221 = auVar27._4_4_;
        auVar30._4_4_ = fVar221 * 1.5;
        auVar30._0_4_ = fVar223 * 1.5;
        fVar244 = auVar27._8_4_;
        auVar30._8_4_ = fVar244 * 1.5;
        fVar261 = auVar27._12_4_;
        auVar30._12_4_ = fVar261 * 1.5;
        fVar225 = auVar27._16_4_;
        auVar30._16_4_ = fVar225 * 1.5;
        fVar227 = auVar27._20_4_;
        auVar30._20_4_ = fVar227 * 1.5;
        fVar228 = auVar27._24_4_;
        auVar30._24_4_ = fVar228 * 1.5;
        auVar30._28_4_ = fVar247;
        auVar31._4_4_ = fVar221 * fVar221 * fVar221 * auVar140._4_4_ * 0.5;
        auVar31._0_4_ = fVar223 * fVar223 * fVar223 * auVar140._0_4_ * 0.5;
        auVar31._8_4_ = fVar244 * fVar244 * fVar244 * auVar140._8_4_ * 0.5;
        auVar31._12_4_ = fVar261 * fVar261 * fVar261 * auVar140._12_4_ * 0.5;
        auVar31._16_4_ = fVar225 * fVar225 * fVar225 * auVar140._16_4_ * 0.5;
        auVar31._20_4_ = fVar227 * fVar227 * fVar227 * auVar140._20_4_ * 0.5;
        auVar31._24_4_ = fVar228 * fVar228 * fVar228 * auVar140._24_4_ * 0.5;
        auVar31._28_4_ = auVar140._28_4_;
        auVar27 = vsubps_avx(auVar30,auVar31);
        fVar223 = auVar27._0_4_;
        fVar221 = auVar27._4_4_;
        fVar244 = auVar27._8_4_;
        fVar261 = auVar27._12_4_;
        fVar225 = auVar27._16_4_;
        fVar227 = auVar27._20_4_;
        fVar228 = auVar27._24_4_;
        fVar324 = auVar138._0_4_ * fVar324 * fVar218;
        fVar199 = auVar138._4_4_ * fVar199 * fVar216;
        auVar32._4_4_ = fVar199;
        auVar32._0_4_ = fVar324;
        fVar229 = auVar138._8_4_ * fVar229 * fVar240;
        auVar32._8_4_ = fVar229;
        fVar248 = auVar138._12_4_ * fVar248 * fVar257;
        auVar32._12_4_ = fVar248;
        fVar320 = auVar138._16_4_ * fVar320 * fVar292;
        auVar32._16_4_ = fVar320;
        fVar321 = auVar138._20_4_ * fVar321 * fVar294;
        auVar32._20_4_ = fVar321;
        fVar322 = auVar138._24_4_ * fVar322 * fVar296;
        auVar32._24_4_ = fVar322;
        auVar32._28_4_ = fVar247;
        local_700._4_4_ = fVar199 + auVar284._4_4_;
        local_700._0_4_ = fVar324 + auVar284._0_4_;
        fStack_6f8 = fVar229 + auVar284._8_4_;
        fStack_6f4 = fVar248 + auVar284._12_4_;
        auStack_6f0._0_4_ = fVar320 + auVar284._16_4_;
        auStack_6f0._4_4_ = fVar321 + auVar284._20_4_;
        fStack_6e8 = fVar322 + auVar284._24_4_;
        fStack_6e4 = fVar247 + auVar284._28_4_;
        local_660 = auVar138._0_4_ * fVar218 * -fVar246;
        fStack_65c = auVar138._4_4_ * fVar216 * -fVar277;
        auVar34._4_4_ = fStack_65c;
        auVar34._0_4_ = local_660;
        fStack_658 = auVar138._8_4_ * fVar240 * -fVar149;
        auVar34._8_4_ = fStack_658;
        fStack_654 = auVar138._12_4_ * fVar257 * -fVar176;
        auVar34._12_4_ = fStack_654;
        fStack_650 = auVar138._16_4_ * fVar292 * -fVar151;
        auVar34._16_4_ = fStack_650;
        fStack_64c = auVar138._20_4_ * fVar294 * -fVar152;
        auVar34._20_4_ = fStack_64c;
        fStack_648 = auVar138._24_4_ * fVar296 * -fVar153;
        auVar34._24_4_ = fStack_648;
        auVar34._28_4_ = fVar264;
        local_660 = auVar332._0_4_ + local_660;
        fStack_65c = auVar332._4_4_ + fStack_65c;
        fStack_658 = auVar332._8_4_ + fStack_658;
        fStack_654 = auVar332._12_4_ + fStack_654;
        fStack_650 = auVar332._16_4_ + fStack_650;
        fStack_64c = auVar332._20_4_ + fStack_64c;
        fStack_648 = auVar332._24_4_ + fStack_648;
        fStack_644 = auVar332._28_4_ + fVar264;
        fVar324 = fVar218 * 0.0 * auVar138._0_4_;
        fVar218 = fVar216 * 0.0 * auVar138._4_4_;
        auVar35._4_4_ = fVar218;
        auVar35._0_4_ = fVar324;
        fVar199 = fVar240 * 0.0 * auVar138._8_4_;
        auVar35._8_4_ = fVar199;
        fVar216 = fVar257 * 0.0 * auVar138._12_4_;
        auVar35._12_4_ = fVar216;
        fVar229 = fVar292 * 0.0 * auVar138._16_4_;
        auVar35._16_4_ = fVar229;
        fVar240 = fVar294 * 0.0 * auVar138._20_4_;
        auVar35._20_4_ = fVar240;
        fVar248 = fVar296 * 0.0 * auVar138._24_4_;
        auVar35._24_4_ = fVar248;
        auVar35._28_4_ = fVar344;
        auVar270._0_4_ = (float)local_720._0_4_ + fVar324;
        auVar270._4_4_ = (float)local_720._4_4_ + fVar218;
        auVar270._8_4_ = (float)uStack_718 + fVar199;
        auVar270._12_4_ = uStack_718._4_4_ + fVar216;
        auVar270._16_4_ = (float)uStack_710 + fVar229;
        auVar270._20_4_ = uStack_710._4_4_ + fVar240;
        auVar270._24_4_ = (float)uStack_708 + fVar248;
        auVar270._28_4_ = uStack_708._4_4_ + fVar344;
        fVar324 = auVar300._0_4_ * fVar328 * fVar223;
        fVar218 = auVar300._4_4_ * fVar219 * fVar221;
        auVar36._4_4_ = fVar218;
        auVar36._0_4_ = fVar324;
        fVar328 = auVar300._8_4_ * fVar242 * fVar244;
        auVar36._8_4_ = fVar328;
        fVar199 = auVar300._12_4_ * fVar259 * fVar261;
        auVar36._12_4_ = fVar199;
        fVar216 = auVar300._16_4_ * fVar293 * fVar225;
        auVar36._16_4_ = fVar216;
        fVar219 = auVar300._20_4_ * fVar295 * fVar227;
        auVar36._20_4_ = fVar219;
        fVar229 = auVar300._24_4_ * fVar297 * fVar228;
        auVar36._24_4_ = fVar229;
        auVar36._28_4_ = auVar26._28_4_;
        auVar284 = vsubps_avx(auVar284,auVar32);
        auVar311._0_4_ = auVar235._0_4_ + fVar324;
        auVar311._4_4_ = auVar235._4_4_ + fVar218;
        auVar311._8_4_ = auVar235._8_4_ + fVar328;
        auVar311._12_4_ = auVar235._12_4_ + fVar199;
        auVar311._16_4_ = auVar235._16_4_ + fVar216;
        auVar311._20_4_ = auVar235._20_4_ + fVar219;
        auVar311._24_4_ = auVar235._24_4_ + fVar229;
        auVar311._28_4_ = auVar235._28_4_ + auVar26._28_4_;
        fVar324 = auVar300._0_4_ * fVar223 * -fVar200;
        fVar218 = auVar300._4_4_ * fVar221 * -fVar217;
        auVar26._4_4_ = fVar218;
        auVar26._0_4_ = fVar324;
        fVar328 = auVar300._8_4_ * fVar244 * -fVar220;
        auVar26._8_4_ = fVar328;
        fVar199 = auVar300._12_4_ * fVar261 * -fVar222;
        auVar26._12_4_ = fVar199;
        fVar216 = auVar300._16_4_ * fVar225 * -fVar224;
        auVar26._16_4_ = fVar216;
        fVar219 = auVar300._20_4_ * fVar227 * -fVar226;
        auVar26._20_4_ = fVar219;
        fVar229 = auVar300._24_4_ * fVar228 * -fVar130;
        auVar26._24_4_ = fVar229;
        auVar26._28_4_ = fVar353;
        auVar28 = vsubps_avx(auVar332,auVar34);
        auVar326._0_4_ = fVar324 + auVar204._0_4_;
        auVar326._4_4_ = fVar218 + auVar204._4_4_;
        auVar326._8_4_ = fVar328 + auVar204._8_4_;
        auVar326._12_4_ = fVar199 + auVar204._12_4_;
        auVar326._16_4_ = fVar216 + auVar209._16_4_;
        auVar326._20_4_ = fVar219 + auVar209._20_4_;
        auVar326._24_4_ = fVar229 + auVar209._24_4_;
        auVar326._28_4_ = fVar353 + auVar209._28_4_;
        fVar324 = fVar223 * 0.0 * auVar300._0_4_;
        fVar218 = fVar221 * 0.0 * auVar300._4_4_;
        auVar37._4_4_ = fVar218;
        auVar37._0_4_ = fVar324;
        fVar328 = fVar244 * 0.0 * auVar300._8_4_;
        auVar37._8_4_ = fVar328;
        fVar223 = fVar261 * 0.0 * auVar300._12_4_;
        auVar37._12_4_ = fVar223;
        fVar199 = fVar225 * 0.0 * auVar300._16_4_;
        auVar37._16_4_ = fVar199;
        fVar216 = fVar227 * 0.0 * auVar300._20_4_;
        auVar37._20_4_ = fVar216;
        fVar219 = fVar228 * 0.0 * auVar300._24_4_;
        auVar37._24_4_ = fVar219;
        auVar37._28_4_ = fVar264;
        auVar29 = vsubps_avx(_local_720,auVar35);
        auVar355._0_4_ = (float)local_4e0._0_4_ + fVar324;
        auVar355._4_4_ = (float)local_4e0._4_4_ + fVar218;
        auVar355._8_4_ = fStack_4d8 + fVar328;
        auVar355._12_4_ = fStack_4d4 + fVar223;
        auVar355._16_4_ = fStack_4d0 + fVar199;
        auVar355._20_4_ = fStack_4cc + fVar216;
        auVar355._24_4_ = fStack_4c8 + fVar219;
        auVar355._28_4_ = fStack_4c4 + fVar264;
        auVar27 = vsubps_avx(auVar235,auVar36);
        auVar26 = vsubps_avx(auVar209,auVar26);
        auVar33 = vsubps_avx(_local_4e0,auVar37);
        auVar302 = vsubps_avx(auVar326,auVar28);
        auVar210 = vsubps_avx(auVar355,auVar29);
        auVar38._4_4_ = auVar29._4_4_ * auVar302._4_4_;
        auVar38._0_4_ = auVar29._0_4_ * auVar302._0_4_;
        auVar38._8_4_ = auVar29._8_4_ * auVar302._8_4_;
        auVar38._12_4_ = auVar29._12_4_ * auVar302._12_4_;
        auVar38._16_4_ = auVar29._16_4_ * auVar302._16_4_;
        auVar38._20_4_ = auVar29._20_4_ * auVar302._20_4_;
        auVar38._24_4_ = auVar29._24_4_ * auVar302._24_4_;
        auVar38._28_4_ = fVar353;
        auVar39._4_4_ = auVar28._4_4_ * auVar210._4_4_;
        auVar39._0_4_ = auVar28._0_4_ * auVar210._0_4_;
        auVar39._8_4_ = auVar28._8_4_ * auVar210._8_4_;
        auVar39._12_4_ = auVar28._12_4_ * auVar210._12_4_;
        auVar39._16_4_ = auVar28._16_4_ * auVar210._16_4_;
        auVar39._20_4_ = auVar28._20_4_ * auVar210._20_4_;
        auVar39._24_4_ = auVar28._24_4_ * auVar210._24_4_;
        auVar39._28_4_ = auVar209._28_4_;
        auVar209 = vsubps_avx(auVar39,auVar38);
        auVar40._4_4_ = auVar284._4_4_ * auVar210._4_4_;
        auVar40._0_4_ = auVar284._0_4_ * auVar210._0_4_;
        auVar40._8_4_ = auVar284._8_4_ * auVar210._8_4_;
        auVar40._12_4_ = auVar284._12_4_ * auVar210._12_4_;
        auVar40._16_4_ = auVar284._16_4_ * auVar210._16_4_;
        auVar40._20_4_ = auVar284._20_4_ * auVar210._20_4_;
        auVar40._24_4_ = auVar284._24_4_ * auVar210._24_4_;
        auVar40._28_4_ = auVar210._28_4_;
        auVar332 = vsubps_avx(auVar311,auVar284);
        auVar41._4_4_ = auVar29._4_4_ * auVar332._4_4_;
        auVar41._0_4_ = auVar29._0_4_ * auVar332._0_4_;
        auVar41._8_4_ = auVar29._8_4_ * auVar332._8_4_;
        auVar41._12_4_ = auVar29._12_4_ * auVar332._12_4_;
        auVar41._16_4_ = auVar29._16_4_ * auVar332._16_4_;
        auVar41._20_4_ = auVar29._20_4_ * auVar332._20_4_;
        auVar41._24_4_ = auVar29._24_4_ * auVar332._24_4_;
        auVar41._28_4_ = auVar235._28_4_;
        auVar235 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar332._4_4_ * auVar28._4_4_;
        auVar42._0_4_ = auVar332._0_4_ * auVar28._0_4_;
        auVar42._8_4_ = auVar332._8_4_ * auVar28._8_4_;
        auVar42._12_4_ = auVar332._12_4_ * auVar28._12_4_;
        auVar42._16_4_ = auVar332._16_4_ * auVar28._16_4_;
        auVar42._20_4_ = auVar332._20_4_ * auVar28._20_4_;
        auVar42._24_4_ = auVar332._24_4_ * auVar28._24_4_;
        auVar42._28_4_ = auVar210._28_4_;
        auVar43._4_4_ = auVar284._4_4_ * auVar302._4_4_;
        auVar43._0_4_ = auVar284._0_4_ * auVar302._0_4_;
        auVar43._8_4_ = auVar284._8_4_ * auVar302._8_4_;
        auVar43._12_4_ = auVar284._12_4_ * auVar302._12_4_;
        auVar43._16_4_ = auVar284._16_4_ * auVar302._16_4_;
        auVar43._20_4_ = auVar284._20_4_ * auVar302._20_4_;
        auVar43._24_4_ = auVar284._24_4_ * auVar302._24_4_;
        auVar43._28_4_ = auVar302._28_4_;
        auVar302 = vsubps_avx(auVar43,auVar42);
        auVar141._0_4_ = auVar209._0_4_ * 0.0 + auVar302._0_4_ + auVar235._0_4_ * 0.0;
        auVar141._4_4_ = auVar209._4_4_ * 0.0 + auVar302._4_4_ + auVar235._4_4_ * 0.0;
        auVar141._8_4_ = auVar209._8_4_ * 0.0 + auVar302._8_4_ + auVar235._8_4_ * 0.0;
        auVar141._12_4_ = auVar209._12_4_ * 0.0 + auVar302._12_4_ + auVar235._12_4_ * 0.0;
        auVar141._16_4_ = auVar209._16_4_ * 0.0 + auVar302._16_4_ + auVar235._16_4_ * 0.0;
        auVar141._20_4_ = auVar209._20_4_ * 0.0 + auVar302._20_4_ + auVar235._20_4_ * 0.0;
        auVar141._24_4_ = auVar209._24_4_ * 0.0 + auVar302._24_4_ + auVar235._24_4_ * 0.0;
        auVar141._28_4_ = auVar302._28_4_ + auVar302._28_4_ + auVar235._28_4_;
        auVar332 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
        auVar27 = vblendvps_avx(auVar27,_local_700,auVar332);
        auVar112._4_4_ = fStack_65c;
        auVar112._0_4_ = local_660;
        auVar112._8_4_ = fStack_658;
        auVar112._12_4_ = fStack_654;
        auVar112._16_4_ = fStack_650;
        auVar112._20_4_ = fStack_64c;
        auVar112._24_4_ = fStack_648;
        auVar112._28_4_ = fStack_644;
        auVar26 = vblendvps_avx(auVar26,auVar112,auVar332);
        auVar33 = vblendvps_avx(auVar33,auVar270,auVar332);
        auVar302 = vblendvps_avx(auVar284,auVar311,auVar332);
        auVar210 = vblendvps_avx(auVar28,auVar326,auVar332);
        auVar209 = vblendvps_avx(auVar29,auVar355,auVar332);
        auVar235 = vblendvps_avx(auVar311,auVar284,auVar332);
        auVar284 = vblendvps_avx(auVar326,auVar28,auVar332);
        auVar185 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
        auVar170 = vblendvps_avx(auVar355,auVar29,auVar332);
        auVar235 = vsubps_avx(auVar235,auVar27);
        auVar28 = vsubps_avx(auVar284,auVar26);
        auVar29 = vsubps_avx(auVar170,auVar33);
        auVar170 = vsubps_avx(auVar26,auVar210);
        fVar324 = auVar28._0_4_;
        fVar153 = auVar33._0_4_;
        fVar216 = auVar28._4_4_;
        fVar200 = auVar33._4_4_;
        auVar44._4_4_ = fVar200 * fVar216;
        auVar44._0_4_ = fVar153 * fVar324;
        fVar242 = auVar28._8_4_;
        fVar217 = auVar33._8_4_;
        auVar44._8_4_ = fVar217 * fVar242;
        fVar261 = auVar28._12_4_;
        fVar220 = auVar33._12_4_;
        auVar44._12_4_ = fVar220 * fVar261;
        fVar321 = auVar28._16_4_;
        fVar222 = auVar33._16_4_;
        auVar44._16_4_ = fVar222 * fVar321;
        fVar296 = auVar28._20_4_;
        fVar224 = auVar33._20_4_;
        auVar44._20_4_ = fVar224 * fVar296;
        fVar277 = auVar28._24_4_;
        fVar226 = auVar33._24_4_;
        auVar44._24_4_ = fVar226 * fVar277;
        auVar44._28_4_ = auVar284._28_4_;
        fVar218 = auVar26._0_4_;
        fVar175 = auVar29._0_4_;
        fVar219 = auVar26._4_4_;
        fVar177 = auVar29._4_4_;
        auVar45._4_4_ = fVar177 * fVar219;
        auVar45._0_4_ = fVar175 * fVar218;
        fVar244 = auVar26._8_4_;
        fVar178 = auVar29._8_4_;
        auVar45._8_4_ = fVar178 * fVar244;
        fVar320 = auVar26._12_4_;
        fVar193 = auVar29._12_4_;
        auVar45._12_4_ = fVar193 * fVar320;
        fVar294 = auVar26._16_4_;
        fVar194 = auVar29._16_4_;
        auVar45._16_4_ = fVar194 * fVar294;
        fVar297 = auVar26._20_4_;
        fVar195 = auVar29._20_4_;
        auVar45._20_4_ = fVar195 * fVar297;
        fVar149 = auVar26._24_4_;
        fVar196 = auVar29._24_4_;
        auVar45._24_4_ = fVar196 * fVar149;
        auVar45._28_4_ = auVar326._28_4_;
        auVar26 = vsubps_avx(auVar45,auVar44);
        fVar328 = auVar27._0_4_;
        fVar221 = auVar27._4_4_;
        auVar46._4_4_ = fVar177 * fVar221;
        auVar46._0_4_ = fVar175 * fVar328;
        fVar248 = auVar27._8_4_;
        auVar46._8_4_ = fVar178 * fVar248;
        fVar292 = auVar27._12_4_;
        auVar46._12_4_ = fVar193 * fVar292;
        fVar295 = auVar27._16_4_;
        auVar46._16_4_ = fVar194 * fVar295;
        fVar228 = auVar27._20_4_;
        auVar46._20_4_ = fVar195 * fVar228;
        fVar176 = auVar27._24_4_;
        auVar46._24_4_ = fVar196 * fVar176;
        auVar46._28_4_ = auVar326._28_4_;
        fVar223 = auVar235._0_4_;
        auVar347._0_4_ = fVar153 * fVar223;
        fVar229 = auVar235._4_4_;
        auVar347._4_4_ = fVar200 * fVar229;
        fVar257 = auVar235._8_4_;
        auVar347._8_4_ = fVar217 * fVar257;
        fVar293 = auVar235._12_4_;
        auVar347._12_4_ = fVar220 * fVar293;
        fVar227 = auVar235._16_4_;
        auVar347._16_4_ = fVar222 * fVar227;
        fVar247 = auVar235._20_4_;
        auVar347._20_4_ = fVar224 * fVar247;
        fVar151 = auVar235._24_4_;
        auVar347._24_4_ = fVar226 * fVar151;
        auVar347._28_4_ = 0;
        auVar284 = vsubps_avx(auVar347,auVar46);
        auVar47._4_4_ = fVar219 * fVar229;
        auVar47._0_4_ = fVar218 * fVar223;
        auVar47._8_4_ = fVar244 * fVar257;
        auVar47._12_4_ = fVar320 * fVar293;
        auVar47._16_4_ = fVar294 * fVar227;
        auVar47._20_4_ = fVar297 * fVar247;
        auVar47._24_4_ = fVar149 * fVar151;
        auVar47._28_4_ = auVar326._28_4_;
        auVar48._4_4_ = fVar221 * fVar216;
        auVar48._0_4_ = fVar328 * fVar324;
        auVar48._8_4_ = fVar248 * fVar242;
        auVar48._12_4_ = fVar292 * fVar261;
        auVar48._16_4_ = fVar295 * fVar321;
        auVar48._20_4_ = fVar228 * fVar296;
        auVar48._24_4_ = fVar176 * fVar277;
        auVar48._28_4_ = auVar355._28_4_;
        auVar30 = vsubps_avx(auVar48,auVar47);
        auVar31 = vsubps_avx(auVar33,auVar209);
        fVar199 = auVar30._28_4_ + auVar284._28_4_;
        auVar165._0_4_ = auVar30._0_4_ + auVar284._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
        auVar165._4_4_ = auVar30._4_4_ + auVar284._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
        auVar165._8_4_ = auVar30._8_4_ + auVar284._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
        auVar165._12_4_ = auVar30._12_4_ + auVar284._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
        auVar165._16_4_ = auVar30._16_4_ + auVar284._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
        auVar165._20_4_ = auVar30._20_4_ + auVar284._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
        auVar165._24_4_ = auVar30._24_4_ + auVar284._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
        auVar165._28_4_ = fVar199 + auVar26._28_4_;
        fVar130 = auVar170._0_4_;
        fVar264 = auVar170._4_4_;
        auVar49._4_4_ = fVar264 * auVar209._4_4_;
        auVar49._0_4_ = fVar130 * auVar209._0_4_;
        fVar148 = auVar170._8_4_;
        auVar49._8_4_ = fVar148 * auVar209._8_4_;
        fVar150 = auVar170._12_4_;
        auVar49._12_4_ = fVar150 * auVar209._12_4_;
        fVar154 = auVar170._16_4_;
        auVar49._16_4_ = fVar154 * auVar209._16_4_;
        fVar173 = auVar170._20_4_;
        auVar49._20_4_ = fVar173 * auVar209._20_4_;
        fVar174 = auVar170._24_4_;
        auVar49._24_4_ = fVar174 * auVar209._24_4_;
        auVar49._28_4_ = fVar199;
        fVar199 = auVar31._0_4_;
        fVar240 = auVar31._4_4_;
        auVar50._4_4_ = auVar210._4_4_ * fVar240;
        auVar50._0_4_ = auVar210._0_4_ * fVar199;
        fVar259 = auVar31._8_4_;
        auVar50._8_4_ = auVar210._8_4_ * fVar259;
        fVar225 = auVar31._12_4_;
        auVar50._12_4_ = auVar210._12_4_ * fVar225;
        fVar322 = auVar31._16_4_;
        auVar50._16_4_ = auVar210._16_4_ * fVar322;
        fVar246 = auVar31._20_4_;
        auVar50._20_4_ = auVar210._20_4_ * fVar246;
        fVar152 = auVar31._24_4_;
        auVar50._24_4_ = auVar210._24_4_ * fVar152;
        auVar50._28_4_ = auVar30._28_4_;
        auVar170 = vsubps_avx(auVar50,auVar49);
        auVar284 = vsubps_avx(auVar27,auVar302);
        fVar197 = auVar284._0_4_;
        fVar198 = auVar284._4_4_;
        auVar51._4_4_ = fVar198 * auVar209._4_4_;
        auVar51._0_4_ = fVar197 * auVar209._0_4_;
        fVar249 = auVar284._8_4_;
        auVar51._8_4_ = fVar249 * auVar209._8_4_;
        fVar258 = auVar284._12_4_;
        auVar51._12_4_ = fVar258 * auVar209._12_4_;
        fVar260 = auVar284._16_4_;
        auVar51._16_4_ = fVar260 * auVar209._16_4_;
        fVar262 = auVar284._20_4_;
        auVar51._20_4_ = fVar262 * auVar209._20_4_;
        fVar265 = auVar284._24_4_;
        auVar51._24_4_ = fVar265 * auVar209._24_4_;
        auVar51._28_4_ = auVar209._28_4_;
        auVar52._4_4_ = auVar302._4_4_ * fVar240;
        auVar52._0_4_ = auVar302._0_4_ * fVar199;
        auVar52._8_4_ = auVar302._8_4_ * fVar259;
        auVar52._12_4_ = auVar302._12_4_ * fVar225;
        auVar52._16_4_ = auVar302._16_4_ * fVar322;
        auVar52._20_4_ = auVar302._20_4_ * fVar246;
        auVar52._24_4_ = auVar302._24_4_ * fVar152;
        auVar52._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar51,auVar52);
        auVar53._4_4_ = auVar210._4_4_ * fVar198;
        auVar53._0_4_ = auVar210._0_4_ * fVar197;
        auVar53._8_4_ = auVar210._8_4_ * fVar249;
        auVar53._12_4_ = auVar210._12_4_ * fVar258;
        auVar53._16_4_ = auVar210._16_4_ * fVar260;
        auVar53._20_4_ = auVar210._20_4_ * fVar262;
        auVar53._24_4_ = auVar210._24_4_ * fVar265;
        auVar53._28_4_ = auVar209._28_4_;
        auVar54._4_4_ = auVar302._4_4_ * fVar264;
        auVar54._0_4_ = auVar302._0_4_ * fVar130;
        auVar54._8_4_ = auVar302._8_4_ * fVar148;
        auVar54._12_4_ = auVar302._12_4_ * fVar150;
        auVar54._16_4_ = auVar302._16_4_ * fVar154;
        auVar54._20_4_ = auVar302._20_4_ * fVar173;
        auVar54._24_4_ = auVar302._24_4_ * fVar174;
        auVar54._28_4_ = auVar302._28_4_;
        auVar302 = vsubps_avx(auVar54,auVar53);
        auVar172 = ZEXT864(0) << 0x20;
        auVar237._0_4_ = auVar170._0_4_ * 0.0 + auVar302._0_4_ + auVar26._0_4_ * 0.0;
        auVar237._4_4_ = auVar170._4_4_ * 0.0 + auVar302._4_4_ + auVar26._4_4_ * 0.0;
        auVar237._8_4_ = auVar170._8_4_ * 0.0 + auVar302._8_4_ + auVar26._8_4_ * 0.0;
        auVar237._12_4_ = auVar170._12_4_ * 0.0 + auVar302._12_4_ + auVar26._12_4_ * 0.0;
        auVar237._16_4_ = auVar170._16_4_ * 0.0 + auVar302._16_4_ + auVar26._16_4_ * 0.0;
        auVar237._20_4_ = auVar170._20_4_ * 0.0 + auVar302._20_4_ + auVar26._20_4_ * 0.0;
        auVar237._24_4_ = auVar170._24_4_ * 0.0 + auVar302._24_4_ + auVar26._24_4_ * 0.0;
        auVar237._28_4_ = auVar302._28_4_ + auVar302._28_4_ + auVar26._28_4_;
        auVar170 = vmaxps_avx(auVar165,auVar237);
        auVar170 = vcmpps_avx(auVar170,ZEXT832(0) << 0x20,2);
        auVar207 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
        auVar185 = vpand_avx(auVar207,auVar185);
        auVar207 = vpmovsxwd_avx(auVar185);
        auVar183 = vpunpckhwd_avx(auVar185,auVar185);
        auVar211._16_16_ = auVar183;
        auVar211._0_16_ = auVar207;
        if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar211 >> 0x7f,0) == '\0') &&
              (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar183 >> 0x3f,0) == '\0') &&
            (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar183[0xf]) {
LAB_00fb129d:
          auVar337 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar215 = ZEXT3264(auVar211);
          auVar147 = ZEXT3264(local_620);
          auVar314 = ZEXT3264(local_640);
        }
        else {
          auVar55._4_4_ = fVar240 * fVar216;
          auVar55._0_4_ = fVar199 * fVar324;
          auVar55._8_4_ = fVar259 * fVar242;
          auVar55._12_4_ = fVar225 * fVar261;
          auVar55._16_4_ = fVar322 * fVar321;
          auVar55._20_4_ = fVar246 * fVar296;
          auVar55._24_4_ = fVar152 * fVar277;
          auVar55._28_4_ = auVar183._12_4_;
          auVar333._0_4_ = fVar130 * fVar175;
          auVar333._4_4_ = fVar264 * fVar177;
          auVar333._8_4_ = fVar148 * fVar178;
          auVar333._12_4_ = fVar150 * fVar193;
          auVar333._16_4_ = fVar154 * fVar194;
          auVar333._20_4_ = fVar173 * fVar195;
          auVar333._24_4_ = fVar174 * fVar196;
          auVar333._28_4_ = 0;
          auVar170 = vsubps_avx(auVar333,auVar55);
          auVar56._4_4_ = fVar198 * fVar177;
          auVar56._0_4_ = fVar197 * fVar175;
          auVar56._8_4_ = fVar249 * fVar178;
          auVar56._12_4_ = fVar258 * fVar193;
          auVar56._16_4_ = fVar260 * fVar194;
          auVar56._20_4_ = fVar262 * fVar195;
          auVar56._24_4_ = fVar265 * fVar196;
          auVar56._28_4_ = auVar29._28_4_;
          auVar57._4_4_ = fVar240 * fVar229;
          auVar57._0_4_ = fVar199 * fVar223;
          auVar57._8_4_ = fVar259 * fVar257;
          auVar57._12_4_ = fVar225 * fVar293;
          auVar57._16_4_ = fVar322 * fVar227;
          auVar57._20_4_ = fVar246 * fVar247;
          auVar57._24_4_ = fVar152 * fVar151;
          auVar57._28_4_ = auVar31._28_4_;
          auVar302 = vsubps_avx(auVar57,auVar56);
          auVar58._4_4_ = fVar264 * fVar229;
          auVar58._0_4_ = fVar130 * fVar223;
          auVar58._8_4_ = fVar148 * fVar257;
          auVar58._12_4_ = fVar150 * fVar293;
          auVar58._16_4_ = fVar154 * fVar227;
          auVar58._20_4_ = fVar173 * fVar247;
          auVar58._24_4_ = fVar174 * fVar151;
          auVar58._28_4_ = auVar165._28_4_;
          auVar59._4_4_ = fVar198 * fVar216;
          auVar59._0_4_ = fVar197 * fVar324;
          auVar59._8_4_ = fVar249 * fVar242;
          auVar59._12_4_ = fVar258 * fVar261;
          auVar59._16_4_ = fVar260 * fVar321;
          auVar59._20_4_ = fVar262 * fVar296;
          auVar59._24_4_ = fVar265 * fVar277;
          auVar59._28_4_ = auVar28._28_4_;
          auVar210 = vsubps_avx(auVar59,auVar58);
          auVar285._0_4_ = auVar170._0_4_ * 0.0 + auVar210._0_4_ + auVar302._0_4_ * 0.0;
          auVar285._4_4_ = auVar170._4_4_ * 0.0 + auVar210._4_4_ + auVar302._4_4_ * 0.0;
          auVar285._8_4_ = auVar170._8_4_ * 0.0 + auVar210._8_4_ + auVar302._8_4_ * 0.0;
          auVar285._12_4_ = auVar170._12_4_ * 0.0 + auVar210._12_4_ + auVar302._12_4_ * 0.0;
          auVar285._16_4_ = auVar170._16_4_ * 0.0 + auVar210._16_4_ + auVar302._16_4_ * 0.0;
          auVar285._20_4_ = auVar170._20_4_ * 0.0 + auVar210._20_4_ + auVar302._20_4_ * 0.0;
          auVar285._24_4_ = auVar170._24_4_ * 0.0 + auVar210._24_4_ + auVar302._24_4_ * 0.0;
          auVar285._28_4_ = auVar28._28_4_ + auVar210._28_4_ + auVar165._28_4_;
          auVar26 = vrcpps_avx(auVar285);
          fVar324 = auVar26._0_4_;
          fVar223 = auVar26._4_4_;
          auVar60._4_4_ = auVar285._4_4_ * fVar223;
          auVar60._0_4_ = auVar285._0_4_ * fVar324;
          fVar199 = auVar26._8_4_;
          auVar60._8_4_ = auVar285._8_4_ * fVar199;
          fVar216 = auVar26._12_4_;
          auVar60._12_4_ = auVar285._12_4_ * fVar216;
          fVar229 = auVar26._16_4_;
          auVar60._16_4_ = auVar285._16_4_ * fVar229;
          fVar240 = auVar26._20_4_;
          auVar60._20_4_ = auVar285._20_4_ * fVar240;
          fVar242 = auVar26._24_4_;
          auVar60._24_4_ = auVar285._24_4_ * fVar242;
          auVar60._28_4_ = auVar31._28_4_;
          auVar334._8_4_ = 0x3f800000;
          auVar334._0_8_ = 0x3f8000003f800000;
          auVar334._12_4_ = 0x3f800000;
          auVar334._16_4_ = 0x3f800000;
          auVar334._20_4_ = 0x3f800000;
          auVar334._24_4_ = 0x3f800000;
          auVar334._28_4_ = 0x3f800000;
          auVar209 = vsubps_avx(auVar334,auVar60);
          fVar324 = auVar209._0_4_ * fVar324 + fVar324;
          fVar223 = auVar209._4_4_ * fVar223 + fVar223;
          fVar199 = auVar209._8_4_ * fVar199 + fVar199;
          fVar216 = auVar209._12_4_ * fVar216 + fVar216;
          fVar229 = auVar209._16_4_ * fVar229 + fVar229;
          fVar240 = auVar209._20_4_ * fVar240 + fVar240;
          fVar242 = auVar209._24_4_ * fVar242 + fVar242;
          auVar61._4_4_ =
               (auVar170._4_4_ * fVar221 + auVar302._4_4_ * fVar219 + auVar210._4_4_ * fVar200) *
               fVar223;
          auVar61._0_4_ =
               (auVar170._0_4_ * fVar328 + auVar302._0_4_ * fVar218 + auVar210._0_4_ * fVar153) *
               fVar324;
          auVar61._8_4_ =
               (auVar170._8_4_ * fVar248 + auVar302._8_4_ * fVar244 + auVar210._8_4_ * fVar217) *
               fVar199;
          auVar61._12_4_ =
               (auVar170._12_4_ * fVar292 + auVar302._12_4_ * fVar320 + auVar210._12_4_ * fVar220) *
               fVar216;
          auVar61._16_4_ =
               (auVar170._16_4_ * fVar295 + auVar302._16_4_ * fVar294 + auVar210._16_4_ * fVar222) *
               fVar229;
          auVar61._20_4_ =
               (auVar170._20_4_ * fVar228 + auVar302._20_4_ * fVar297 + auVar210._20_4_ * fVar224) *
               fVar240;
          auVar61._24_4_ =
               (auVar170._24_4_ * fVar176 + auVar302._24_4_ * fVar149 + auVar210._24_4_ * fVar226) *
               fVar242;
          auVar61._28_4_ = auVar27._28_4_ + auVar235._28_4_ + auVar33._28_4_;
          auVar207 = vpermilps_avx(ZEXT416(uVar124),0);
          auVar212._16_16_ = auVar207;
          auVar212._0_16_ = auVar207;
          auVar170 = vcmpps_avx(auVar212,auVar61,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar253._4_4_ = uVar11;
          auVar253._0_4_ = uVar11;
          auVar253._8_4_ = uVar11;
          auVar253._12_4_ = uVar11;
          auVar253._16_4_ = uVar11;
          auVar253._20_4_ = uVar11;
          auVar253._24_4_ = uVar11;
          auVar253._28_4_ = uVar11;
          auVar27 = vcmpps_avx(auVar61,auVar253,2);
          auVar170 = vandps_avx(auVar27,auVar170);
          auVar207 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
          auVar185 = vpand_avx(auVar185,auVar207);
          auVar207 = vpmovsxwd_avx(auVar185);
          auVar183 = vpshufd_avx(auVar185,0xee);
          auVar183 = vpmovsxwd_avx(auVar183);
          auVar211._16_16_ = auVar183;
          auVar211._0_16_ = auVar207;
          if ((((((((auVar211 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar211 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar211 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar211 >> 0x7f,0) == '\0') &&
                (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar183 >> 0x3f,0) == '\0') &&
              (auVar211 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar183[0xf]) goto LAB_00fb129d;
          auVar170 = vcmpps_avx(ZEXT832(0) << 0x20,auVar285,4);
          auVar207 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
          auVar185 = vpand_avx(auVar185,auVar207);
          auVar207 = vpmovsxwd_avx(auVar185);
          auVar185 = vpunpckhwd_avx(auVar185,auVar185);
          auVar215 = ZEXT1664(auVar185);
          auVar271._16_16_ = auVar185;
          auVar271._0_16_ = auVar207;
          auVar337 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar147 = ZEXT3264(local_620);
          auVar314 = ZEXT3264(local_640);
          if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar271 >> 0x7f,0) != '\0') ||
                (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar185 >> 0x3f,0) != '\0') ||
              (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar185[0xf] < '\0') {
            auVar213._0_4_ = auVar165._0_4_ * fVar324;
            auVar213._4_4_ = auVar165._4_4_ * fVar223;
            auVar213._8_4_ = auVar165._8_4_ * fVar199;
            auVar213._12_4_ = auVar165._12_4_ * fVar216;
            auVar213._16_4_ = auVar165._16_4_ * fVar229;
            auVar213._20_4_ = auVar165._20_4_ * fVar240;
            auVar213._24_4_ = auVar165._24_4_ * fVar242;
            auVar213._28_4_ = 0;
            auVar62._4_4_ = auVar237._4_4_ * fVar223;
            auVar62._0_4_ = auVar237._0_4_ * fVar324;
            auVar62._8_4_ = auVar237._8_4_ * fVar199;
            auVar62._12_4_ = auVar237._12_4_ * fVar216;
            auVar62._16_4_ = auVar237._16_4_ * fVar229;
            auVar62._20_4_ = auVar237._20_4_ * fVar240;
            auVar62._24_4_ = auVar237._24_4_ * fVar242;
            auVar62._28_4_ = auVar209._28_4_ + auVar26._28_4_;
            auVar254._8_4_ = 0x3f800000;
            auVar254._0_8_ = 0x3f8000003f800000;
            auVar254._12_4_ = 0x3f800000;
            auVar254._16_4_ = 0x3f800000;
            auVar254._20_4_ = 0x3f800000;
            auVar254._24_4_ = 0x3f800000;
            auVar254._28_4_ = 0x3f800000;
            auVar170 = vsubps_avx(auVar254,auVar213);
            auVar170 = vblendvps_avx(auVar170,auVar213,auVar332);
            auVar147 = ZEXT3264(auVar170);
            auVar170 = vsubps_avx(auVar254,auVar62);
            auVar215 = ZEXT3264(auVar170);
            _local_520 = vblendvps_avx(auVar170,auVar62,auVar332);
            auVar337 = ZEXT3264(auVar271);
            auVar314 = ZEXT3264(auVar61);
          }
        }
        auVar210 = auVar314._0_32_;
        auVar302 = auVar147._0_32_;
        auVar170 = auVar337._0_32_;
        if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar170 >> 0x7f,0) == '\0') &&
              (auVar337 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar170 >> 0xbf,0) == '\0') &&
            (auVar337 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar337[0x1f]) goto LAB_00fafcfa;
        auVar27 = vsubps_avx(auVar300,auVar138);
        fVar218 = auVar138._0_4_ + auVar147._0_4_ * auVar27._0_4_;
        fVar328 = auVar138._4_4_ + auVar147._4_4_ * auVar27._4_4_;
        fVar223 = auVar138._8_4_ + auVar147._8_4_ * auVar27._8_4_;
        fVar199 = auVar138._12_4_ + auVar147._12_4_ * auVar27._12_4_;
        fVar216 = auVar138._16_4_ + auVar147._16_4_ * auVar27._16_4_;
        fVar219 = auVar138._20_4_ + auVar147._20_4_ * auVar27._20_4_;
        fVar221 = auVar138._24_4_ + auVar147._24_4_ * auVar27._24_4_;
        fVar229 = auVar27._28_4_ + 0.0;
        fVar324 = *(float *)((long)local_758->ray_space + k * 4 + -0x20);
        auVar63._4_4_ = (fVar328 + fVar328) * fVar324;
        auVar63._0_4_ = (fVar218 + fVar218) * fVar324;
        auVar63._8_4_ = (fVar223 + fVar223) * fVar324;
        auVar63._12_4_ = (fVar199 + fVar199) * fVar324;
        auVar63._16_4_ = (fVar216 + fVar216) * fVar324;
        auVar63._20_4_ = (fVar219 + fVar219) * fVar324;
        auVar63._24_4_ = (fVar221 + fVar221) * fVar324;
        auVar63._28_4_ = fVar229 + fVar229;
        auVar27 = vcmpps_avx(auVar210,auVar63,6);
        auVar26 = auVar170 & auVar27;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0x7f,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0xbf,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar26[0x1f]) {
LAB_00fafd94:
          bVar126 = false;
        }
        else {
          local_360 = vandps_avx(auVar27,auVar170);
          local_400._0_4_ = (float)local_520._0_4_ + (float)local_520._0_4_ + -1.0;
          local_400._4_4_ = (float)local_520._4_4_ + (float)local_520._4_4_ + -1.0;
          fStack_3f8 = (float)uStack_518 + (float)uStack_518 + -1.0;
          fStack_3f4 = uStack_518._4_4_ + uStack_518._4_4_ + -1.0;
          fStack_3f0 = (float)uStack_510 + (float)uStack_510 + -1.0;
          fStack_3ec = uStack_510._4_4_ + uStack_510._4_4_ + -1.0;
          fStack_3e8 = (float)uStack_508 + (float)uStack_508 + -1.0;
          fStack_3e4 = uStack_508._4_4_ + uStack_508._4_4_ + -1.0;
          local_3c0 = 0;
          uStack_3a8 = uStack_778;
          uStack_398 = uStack_668;
          uStack_388 = uStack_678;
          uStack_378 = uStack_688;
          local_520._4_4_ = local_400._4_4_;
          local_520._0_4_ = local_400._0_4_;
          uStack_518._0_4_ = fStack_3f8;
          uStack_518._4_4_ = fStack_3f4;
          uStack_510._0_4_ = fStack_3f0;
          uStack_510._4_4_ = fStack_3ec;
          auVar163 = _local_520;
          uStack_508._0_4_ = fStack_3e8;
          uStack_508._4_4_ = fStack_3e4;
          auVar170 = _local_520;
          _local_520 = auVar170;
          if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_00fafd94;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar126 = true, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar182._0_4_ = 1.0 / local_560;
            auVar182._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar185 = vshufps_avx(auVar182,auVar182,0);
            local_340[0] = auVar185._0_4_ * (auVar147._0_4_ + 0.0);
            local_340[1] = auVar185._4_4_ * (auVar147._4_4_ + 1.0);
            local_340[2] = auVar185._8_4_ * (auVar147._8_4_ + 2.0);
            local_340[3] = auVar185._12_4_ * (auVar147._12_4_ + 3.0);
            fStack_330 = auVar185._0_4_ * (auVar147._16_4_ + 4.0);
            fStack_32c = auVar185._4_4_ * (auVar147._20_4_ + 5.0);
            fStack_328 = auVar185._8_4_ * (auVar147._24_4_ + 6.0);
            fStack_324 = auVar147._28_4_ + 7.0;
            uStack_510 = auVar163._16_8_;
            uStack_508 = auVar170._24_8_;
            local_320 = local_520;
            uStack_318 = uStack_518;
            uStack_310 = uStack_510;
            uStack_308 = uStack_508;
            local_300 = auVar210;
            iVar121 = vmovmskps_avx(local_360);
            uVar128 = CONCAT44((int)((ulong)lVar127 >> 0x20),iVar121);
            uVar122 = 0;
            if (uVar128 != 0) {
              for (; (uVar128 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
              }
            }
            if (iVar121 == 0) goto LAB_00fafd94;
            auVar185 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
            auVar207 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
            _local_6e0 = ZEXT1632(*local_768);
            uStack_710 = *(undefined8 *)(local_770 + 0x10);
            _local_720 = *local_768;
            uStack_708 = *(undefined8 *)(local_770 + 0x18);
            local_700._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
            local_640 = auVar210;
            local_620 = auVar302;
            _local_4c0 = *pauVar10;
            local_420 = auVar302;
            local_3e0 = auVar210;
            local_3bc = uVar15;
            local_3b0 = local_780;
            local_3a0 = local_670;
            local_390 = local_680;
            local_380 = local_690;
            do {
              local_1c0 = local_340[uVar122];
              local_1a0 = *(undefined4 *)((long)&local_320 + uVar122 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar122 * 4);
              fVar218 = 1.0 - local_1c0;
              fVar324 = local_1c0 * 3.0;
              auVar183 = ZEXT416((uint)((fVar218 * -2.0 * local_1c0 + local_1c0 * local_1c0) * 0.5))
              ;
              auVar183 = vshufps_avx(auVar183,auVar183,0);
              auVar208 = ZEXT416((uint)(((fVar218 + fVar218) * (fVar324 + 2.0) +
                                        fVar218 * fVar218 * -3.0) * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar205 = ZEXT416((uint)(((local_1c0 + local_1c0) * (fVar324 + -5.0) +
                                        local_1c0 * fVar324) * 0.5));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              local_750.context = context->user;
              auVar206 = ZEXT416((uint)((local_1c0 * (fVar218 + fVar218) - fVar218 * fVar218) * 0.5)
                                );
              auVar206 = vshufps_avx(auVar206,auVar206,0);
              auVar184._0_4_ =
                   auVar206._0_4_ * (float)local_780._0_4_ +
                   auVar205._0_4_ * (float)local_670._0_4_ +
                   auVar183._0_4_ * (float)local_690._0_4_ + auVar208._0_4_ * (float)local_680._0_4_
              ;
              auVar184._4_4_ =
                   auVar206._4_4_ * (float)local_780._4_4_ +
                   auVar205._4_4_ * (float)local_670._4_4_ +
                   auVar183._4_4_ * (float)local_690._4_4_ + auVar208._4_4_ * (float)local_680._4_4_
              ;
              auVar184._8_4_ =
                   auVar206._8_4_ * (float)uStack_778 +
                   auVar205._8_4_ * (float)uStack_668 +
                   auVar183._8_4_ * (float)uStack_688 + auVar208._8_4_ * (float)uStack_678;
              auVar184._12_4_ =
                   auVar206._12_4_ * uStack_778._4_4_ +
                   auVar205._12_4_ * uStack_668._4_4_ +
                   auVar183._12_4_ * uStack_688._4_4_ + auVar208._12_4_ * uStack_678._4_4_;
              local_210 = vshufps_avx(auVar184,auVar184,0);
              local_220[0] = (RTCHitN)local_210[0];
              local_220[1] = (RTCHitN)local_210[1];
              local_220[2] = (RTCHitN)local_210[2];
              local_220[3] = (RTCHitN)local_210[3];
              local_220[4] = (RTCHitN)local_210[4];
              local_220[5] = (RTCHitN)local_210[5];
              local_220[6] = (RTCHitN)local_210[6];
              local_220[7] = (RTCHitN)local_210[7];
              local_220[8] = (RTCHitN)local_210[8];
              local_220[9] = (RTCHitN)local_210[9];
              local_220[10] = (RTCHitN)local_210[10];
              local_220[0xb] = (RTCHitN)local_210[0xb];
              local_220[0xc] = (RTCHitN)local_210[0xc];
              local_220[0xd] = (RTCHitN)local_210[0xd];
              local_220[0xe] = (RTCHitN)local_210[0xe];
              local_220[0xf] = (RTCHitN)local_210[0xf];
              local_1f0 = vshufps_avx(auVar184,auVar184,0x55);
              local_200 = local_1f0;
              local_1d0 = vshufps_avx(auVar184,auVar184,0xaa);
              local_1e0 = local_1d0;
              fStack_1bc = local_1c0;
              fStack_1b8 = local_1c0;
              fStack_1b4 = local_1c0;
              fStack_1b0 = local_1c0;
              fStack_1ac = local_1c0;
              fStack_1a8 = local_1c0;
              fStack_1a4 = local_1c0;
              uStack_19c = local_1a0;
              uStack_198 = local_1a0;
              uStack_194 = local_1a0;
              uStack_190 = local_1a0;
              uStack_18c = local_1a0;
              uStack_188 = local_1a0;
              uStack_184 = local_1a0;
              local_800 = auVar207._0_8_;
              uStack_7f8 = auVar207._8_8_;
              local_180 = local_800;
              uStack_178 = uStack_7f8;
              uStack_170 = local_800;
              uStack_168 = uStack_7f8;
              local_7e0 = auVar185._0_8_;
              uStack_7d8 = auVar185._8_8_;
              local_160 = local_7e0;
              uStack_158 = uStack_7d8;
              uStack_150 = local_7e0;
              uStack_148 = uStack_7d8;
              auVar170 = vcmpps_avx(auVar172._0_32_,auVar172._0_32_,0xf);
              local_760[1] = auVar170;
              *local_760 = auVar170;
              local_140 = (local_750.context)->instID[0];
              uStack_13c = local_140;
              uStack_138 = local_140;
              uStack_134 = local_140;
              uStack_130 = local_140;
              uStack_12c = local_140;
              uStack_128 = local_140;
              uStack_124 = local_140;
              local_120 = (local_750.context)->instPrimID[0];
              uStack_11c = local_120;
              uStack_118 = local_120;
              uStack_114 = local_120;
              uStack_110 = local_120;
              uStack_10c = local_120;
              uStack_108 = local_120;
              uStack_104 = local_120;
              local_7a0 = local_720;
              uStack_798 = uStack_718;
              uStack_790 = uStack_710;
              uStack_788 = uStack_708;
              local_750.valid = (int *)&local_7a0;
              local_750.geometryUserPtr = pGVar16->userPtr;
              local_750.hit = local_220;
              local_750.N = 8;
              auVar159 = local_6e0._0_16_;
              auVar135 = auVar204;
              local_750.ray = (RTCRayN *)ray;
              if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar16->occlusionFilterN)(&local_750);
                auVar314 = ZEXT3264(local_640);
                auVar147 = ZEXT3264(local_620);
                auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar159._8_8_ = uStack_798;
                auVar159._0_8_ = local_7a0;
                auVar135._8_8_ = uStack_788;
                auVar135._0_8_ = uStack_790;
              }
              auVar183 = vpcmpeqd_avx(auVar159,ZEXT816(0) << 0x40);
              auVar208 = vpcmpeqd_avx(auVar135,ZEXT816(0) << 0x40);
              auVar215 = ZEXT1664(auVar208);
              auVar188._16_16_ = auVar208;
              auVar188._0_16_ = auVar183;
              auVar27 = auVar170 & ~auVar188;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar27 >> 0x7f,0) == '\0') &&
                    (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0xbf,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar27[0x1f]) {
                auVar142._0_4_ = auVar183._0_4_ ^ auVar170._0_4_;
                auVar142._4_4_ = auVar183._4_4_ ^ auVar170._4_4_;
                auVar142._8_4_ = auVar183._8_4_ ^ auVar170._8_4_;
                auVar142._12_4_ = auVar183._12_4_ ^ auVar170._12_4_;
                auVar142._16_4_ = auVar208._0_4_ ^ auVar170._16_4_;
                auVar142._20_4_ = auVar208._4_4_ ^ auVar170._20_4_;
                auVar142._24_4_ = auVar208._8_4_ ^ auVar170._24_4_;
                auVar142._28_4_ = auVar208._12_4_ ^ auVar170._28_4_;
              }
              else {
                p_Var19 = context->args->filter;
                if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar215 = ZEXT1664(auVar208);
                  (*p_Var19)(&local_750);
                  auVar314 = ZEXT3264(local_640);
                  auVar147 = ZEXT3264(local_620);
                  auVar172 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar159._8_8_ = uStack_798;
                  auVar159._0_8_ = local_7a0;
                  auVar135._8_8_ = uStack_788;
                  auVar135._0_8_ = uStack_790;
                }
                auVar183 = vpcmpeqd_avx(auVar159,ZEXT816(0) << 0x40);
                auVar208 = vpcmpeqd_avx(auVar135,ZEXT816(0) << 0x40);
                auVar166._16_16_ = auVar208;
                auVar166._0_16_ = auVar183;
                auVar142._0_4_ = auVar183._0_4_ ^ auVar170._0_4_;
                auVar142._4_4_ = auVar183._4_4_ ^ auVar170._4_4_;
                auVar142._8_4_ = auVar183._8_4_ ^ auVar170._8_4_;
                auVar142._12_4_ = auVar183._12_4_ ^ auVar170._12_4_;
                auVar142._16_4_ = auVar208._0_4_ ^ auVar170._16_4_;
                auVar142._20_4_ = auVar208._4_4_ ^ auVar170._20_4_;
                auVar142._24_4_ = auVar208._8_4_ ^ auVar170._24_4_;
                auVar142._28_4_ = auVar208._12_4_ ^ auVar170._28_4_;
                auVar189._8_4_ = 0xff800000;
                auVar189._0_8_ = 0xff800000ff800000;
                auVar189._12_4_ = 0xff800000;
                auVar189._16_4_ = 0xff800000;
                auVar189._20_4_ = 0xff800000;
                auVar189._24_4_ = 0xff800000;
                auVar189._28_4_ = 0xff800000;
                auVar170 = vblendvps_avx(auVar189,*(undefined1 (*) [32])(local_750.ray + 0x100),
                                         auVar166);
                *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar170;
              }
              auVar210 = auVar314._0_32_;
              auVar302 = auVar147._0_32_;
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                bVar126 = true;
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = local_700._0_4_;
              uVar128 = uVar128 ^ 1L << (uVar122 & 0x3f);
              uVar122 = 0;
              if (uVar128 != 0) {
                for (; (uVar128 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                }
              }
              bVar126 = false;
            } while (uVar128 != 0);
          }
        }
      }
      auVar337 = ZEXT3264(auVar234);
      auVar172 = ZEXT1664(auVar267);
      local_640 = auVar210;
      local_620 = auVar302;
      if (8 < (int)uVar15) {
        _local_700 = vpshufd_avx(ZEXT416(uVar15),0);
        auVar267 = vshufps_avx(auVar267,auVar267,0);
        register0x00001210 = auVar267;
        _local_4e0 = auVar267;
        auVar267 = vpermilps_avx(ZEXT416(uVar124),0);
        local_500._16_16_ = auVar267;
        local_500._0_16_ = auVar267;
        auVar136._0_4_ = 1.0 / local_560;
        auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar267 = vshufps_avx(auVar136,auVar136,0);
        register0x00001210 = auVar267;
        _local_100 = auVar267;
        auVar267 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
        local_e0._16_16_ = auVar267;
        local_e0._0_16_ = auVar267;
        auVar267 = vshufps_avx(ZEXT416((uint)local_580._0_4_),ZEXT416((uint)local_580._0_4_),0);
        local_580._16_16_ = auVar267;
        local_580._0_16_ = auVar267;
        auVar147 = ZEXT3264(local_580);
        lVar129 = 8;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar129 * 4 + lVar20);
          fVar324 = *(float *)*pauVar9;
          fVar218 = *(float *)(*pauVar9 + 4);
          fVar328 = *(float *)(*pauVar9 + 8);
          fVar223 = *(float *)(*pauVar9 + 0xc);
          fVar199 = *(float *)(*pauVar9 + 0x10);
          fVar216 = *(float *)(*pauVar9 + 0x14);
          fVar219 = *(float *)(*pauVar9 + 0x18);
          auVar118 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar20 + 0x21b37f0 + lVar129 * 4);
          fVar221 = *(float *)*pauVar9;
          fVar229 = *(float *)(*pauVar9 + 4);
          fVar240 = *(float *)(*pauVar9 + 8);
          fVar242 = *(float *)(*pauVar9 + 0xc);
          fVar244 = *(float *)(*pauVar9 + 0x10);
          fVar248 = *(float *)(*pauVar9 + 0x14);
          fVar257 = *(float *)(*pauVar9 + 0x18);
          auVar117 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar20 + 0x21b3c74 + lVar129 * 4);
          fVar259 = *(float *)*pauVar9;
          fVar261 = *(float *)(*pauVar9 + 4);
          fVar320 = *(float *)(*pauVar9 + 8);
          fVar292 = *(float *)(*pauVar9 + 0xc);
          fVar293 = *(float *)(*pauVar9 + 0x10);
          fVar225 = *(float *)(*pauVar9 + 0x14);
          fVar321 = *(float *)(*pauVar9 + 0x18);
          auVar116 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar20 + 0x21b40f8 + lVar129 * 4);
          fVar294 = *(float *)*pauVar9;
          fVar295 = *(float *)(*pauVar9 + 4);
          fVar227 = *(float *)(*pauVar9 + 8);
          fVar322 = *(float *)(*pauVar9 + 0xc);
          fVar296 = *(float *)(*pauVar9 + 0x10);
          fVar297 = *(float *)(*pauVar9 + 0x14);
          fVar228 = *(float *)(*pauVar9 + 0x18);
          auVar115 = *pauVar9;
          fVar247 = auVar215._28_4_;
          fStack_844 = fVar247 + *(float *)pauVar9[1];
          fVar200 = auVar337._0_4_;
          fVar217 = auVar337._4_4_;
          fVar220 = auVar337._8_4_;
          fVar222 = auVar337._12_4_;
          fVar224 = auVar337._16_4_;
          fVar226 = auVar337._20_4_;
          fVar130 = auVar337._24_4_;
          fVar246 = fVar247 + fStack_844;
          local_860._0_4_ =
               (float)local_480._0_4_ * fVar324 +
               fVar200 * fVar221 +
               (float)local_6c0._0_4_ * fVar259 + (float)local_5c0._0_4_ * fVar294;
          local_860._4_4_ =
               (float)local_480._4_4_ * fVar218 +
               fVar217 * fVar229 +
               (float)local_6c0._4_4_ * fVar261 + (float)local_5c0._4_4_ * fVar295;
          fStack_858 = fStack_478 * fVar328 +
                       fVar220 * fVar240 + fStack_6b8 * fVar320 + fStack_5b8 * fVar227;
          fStack_854 = fStack_474 * fVar223 +
                       fVar222 * fVar242 + fStack_6b4 * fVar292 + fStack_5b4 * fVar322;
          fStack_850 = fStack_470 * fVar199 +
                       fVar224 * fVar244 + fStack_6b0 * fVar293 + fStack_5b0 * fVar296;
          fStack_84c = fStack_46c * fVar216 +
                       fVar226 * fVar248 + fStack_6ac * fVar225 + fStack_5ac * fVar297;
          fStack_848 = fStack_468 * fVar219 +
                       fVar130 * fVar257 + fStack_6a8 * fVar321 + fStack_5a8 * fVar228;
          fStack_844 = fStack_844 + fVar247 + fVar247 + auVar147._28_4_;
          auVar214._0_4_ =
               (float)local_240._0_4_ * fVar324 +
               fVar221 * fVar354 + (float)local_460._0_4_ * fVar259 + fVar323 * fVar294;
          auVar214._4_4_ =
               (float)local_240._4_4_ * fVar218 +
               fVar229 * fVar357 + (float)local_460._4_4_ * fVar261 + fVar327 * fVar295;
          auVar214._8_4_ =
               fStack_238 * fVar328 + fVar240 * fVar358 + fStack_458 * fVar320 + fVar329 * fVar227;
          auVar214._12_4_ =
               fStack_234 * fVar223 + fVar242 * fVar359 + fStack_454 * fVar292 + fVar330 * fVar322;
          auVar214._16_4_ =
               fStack_230 * fVar199 + fVar244 * fVar354 + fStack_450 * fVar293 + fVar323 * fVar296;
          auVar214._20_4_ =
               fStack_22c * fVar216 + fVar248 * fVar357 + fStack_44c * fVar225 + fVar327 * fVar297;
          auVar214._24_4_ =
               fStack_228 * fVar219 + fVar257 * fVar358 + fStack_448 * fVar321 + fVar329 * fVar228;
          auVar214._28_4_ = fStack_844 + fVar247 + fVar247 + auVar172._28_4_;
          auVar215 = ZEXT3264(auVar214);
          local_920._0_4_ =
               (float)local_a0._0_4_ * fVar324 +
               fVar221 * (float)local_280._0_4_ +
               fVar259 * (float)local_260._0_4_ + (float)local_80._0_4_ * fVar294;
          local_920._4_4_ =
               (float)local_a0._4_4_ * fVar218 +
               fVar229 * (float)local_280._4_4_ +
               fVar261 * (float)local_260._4_4_ + (float)local_80._4_4_ * fVar295;
          fStack_918 = fStack_98 * fVar328 +
                       fVar240 * fStack_278 + fVar320 * fStack_258 + fStack_78 * fVar227;
          fStack_914 = fStack_94 * fVar223 +
                       fVar242 * fStack_274 + fVar292 * fStack_254 + fStack_74 * fVar322;
          fStack_910 = fStack_90 * fVar199 +
                       fVar244 * fStack_270 + fVar293 * fStack_250 + fStack_70 * fVar296;
          fStack_90c = fStack_8c * fVar216 +
                       fVar248 * fStack_26c + fVar225 * fStack_24c + fStack_6c * fVar297;
          fStack_908 = fStack_88 * fVar219 +
                       fVar257 * fStack_268 + fVar321 * fStack_248 + fStack_68 * fVar228;
          fStack_904 = fStack_844 + fVar246;
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis1 + lVar129 * 4 + lVar20);
          fVar259 = *(float *)*pauVar9;
          fVar261 = *(float *)(*pauVar9 + 4);
          fVar320 = *(float *)(*pauVar9 + 8);
          fVar292 = *(float *)(*pauVar9 + 0xc);
          fVar293 = *(float *)(*pauVar9 + 0x10);
          fVar225 = *(float *)(*pauVar9 + 0x14);
          fVar321 = *(float *)(*pauVar9 + 0x18);
          auVar119 = *pauVar9;
          pfVar1 = (float *)(lVar20 + 0x21b5c10 + lVar129 * 4);
          fVar294 = *pfVar1;
          fVar295 = pfVar1[1];
          fVar227 = pfVar1[2];
          fVar322 = pfVar1[3];
          fVar296 = pfVar1[4];
          fVar297 = pfVar1[5];
          fVar228 = pfVar1[6];
          auVar170 = *(undefined1 (*) [32])(lVar20 + 0x21b6094 + lVar129 * 4);
          auVar147 = ZEXT3264(auVar170);
          auVar27 = *(undefined1 (*) [32])(lVar20 + 0x21b6518 + lVar129 * 4);
          auVar172 = ZEXT3264(auVar27);
          fVar324 = auVar27._0_4_;
          fVar328 = auVar27._4_4_;
          fVar199 = auVar27._8_4_;
          fVar219 = auVar27._12_4_;
          fVar229 = auVar27._16_4_;
          fVar242 = auVar27._20_4_;
          fVar248 = auVar27._24_4_;
          fVar218 = auVar170._0_4_;
          fVar223 = auVar170._4_4_;
          fVar216 = auVar170._8_4_;
          fVar221 = auVar170._12_4_;
          fVar240 = auVar170._16_4_;
          fVar244 = auVar170._20_4_;
          fVar257 = auVar170._24_4_;
          fVar247 = fVar330 + fVar330 + fVar246;
          auVar272._0_4_ =
               (float)local_480._0_4_ * fVar259 +
               fVar200 * fVar294 +
               (float)local_6c0._0_4_ * fVar218 + (float)local_5c0._0_4_ * fVar324;
          auVar272._4_4_ =
               (float)local_480._4_4_ * fVar261 +
               fVar217 * fVar295 +
               (float)local_6c0._4_4_ * fVar223 + (float)local_5c0._4_4_ * fVar328;
          auVar272._8_4_ =
               fStack_478 * fVar320 +
               fVar220 * fVar227 + fStack_6b8 * fVar216 + fStack_5b8 * fVar199;
          auVar272._12_4_ =
               fStack_474 * fVar292 +
               fVar222 * fVar322 + fStack_6b4 * fVar221 + fStack_5b4 * fVar219;
          auVar272._16_4_ =
               fStack_470 * fVar293 +
               fVar224 * fVar296 + fStack_6b0 * fVar240 + fStack_5b0 * fVar229;
          auVar272._20_4_ =
               fStack_46c * fVar225 +
               fVar226 * fVar297 + fStack_6ac * fVar244 + fStack_5ac * fVar242;
          auVar272._24_4_ =
               fStack_468 * fVar321 +
               fVar130 * fVar228 + fStack_6a8 * fVar257 + fStack_5a8 * fVar248;
          auVar272._28_4_ = fVar330 + fStack_64 + fVar247;
          auVar255._0_4_ =
               (float)local_240._0_4_ * fVar259 +
               fVar354 * fVar294 + (float)local_460._0_4_ * fVar218 + fVar323 * fVar324;
          auVar255._4_4_ =
               (float)local_240._4_4_ * fVar261 +
               fVar357 * fVar295 + (float)local_460._4_4_ * fVar223 + fVar327 * fVar328;
          auVar255._8_4_ =
               fStack_238 * fVar320 + fVar358 * fVar227 + fStack_458 * fVar216 + fVar329 * fVar199;
          auVar255._12_4_ =
               fStack_234 * fVar292 + fVar359 * fVar322 + fStack_454 * fVar221 + fVar330 * fVar219;
          auVar255._16_4_ =
               fStack_230 * fVar293 + fVar354 * fVar296 + fStack_450 * fVar240 + fVar323 * fVar229;
          auVar255._20_4_ =
               fStack_22c * fVar225 + fVar357 * fVar297 + fStack_44c * fVar244 + fVar327 * fVar242;
          auVar255._24_4_ =
               fStack_228 * fVar321 + fVar358 * fVar228 + fStack_448 * fVar257 + fVar329 * fVar248;
          auVar255._28_4_ = fVar247 + fVar330 + fVar330 + auVar337._28_4_;
          auVar286._0_4_ =
               fVar294 * (float)local_280._0_4_ +
               fVar218 * (float)local_260._0_4_ + (float)local_80._0_4_ * fVar324 +
               fVar259 * (float)local_a0._0_4_;
          auVar286._4_4_ =
               fVar295 * (float)local_280._4_4_ +
               fVar223 * (float)local_260._4_4_ + (float)local_80._4_4_ * fVar328 +
               fVar261 * (float)local_a0._4_4_;
          auVar286._8_4_ =
               fVar227 * fStack_278 + fVar216 * fStack_258 + fStack_78 * fVar199 +
               fVar320 * fStack_98;
          auVar286._12_4_ =
               fVar322 * fStack_274 + fVar221 * fStack_254 + fStack_74 * fVar219 +
               fVar292 * fStack_94;
          auVar286._16_4_ =
               fVar296 * fStack_270 + fVar240 * fStack_250 + fStack_70 * fVar229 +
               fVar293 * fStack_90;
          auVar286._20_4_ =
               fVar297 * fStack_26c + fVar244 * fStack_24c + fStack_6c * fVar242 +
               fVar225 * fStack_8c;
          auVar286._24_4_ =
               fVar228 * fStack_268 + fVar257 * fStack_248 + fStack_68 * fVar248 +
               fVar321 * fStack_88;
          auVar286._28_4_ = fVar330 + fVar330 + fStack_64 + fVar247;
          auVar33 = vsubps_avx(auVar272,_local_860);
          _local_4c0 = vsubps_avx(auVar255,auVar214);
          fVar246 = auVar33._0_4_;
          fVar277 = auVar33._4_4_;
          auVar64._4_4_ = fVar277 * auVar214._4_4_;
          auVar64._0_4_ = fVar246 * auVar214._0_4_;
          fVar149 = auVar33._8_4_;
          auVar64._8_4_ = fVar149 * auVar214._8_4_;
          fVar176 = auVar33._12_4_;
          auVar64._12_4_ = fVar176 * auVar214._12_4_;
          fVar151 = auVar33._16_4_;
          auVar64._16_4_ = fVar151 * auVar214._16_4_;
          fVar152 = auVar33._20_4_;
          auVar64._20_4_ = fVar152 * auVar214._20_4_;
          fVar153 = auVar33._24_4_;
          auVar64._24_4_ = fVar153 * auVar214._24_4_;
          auVar64._28_4_ = fVar247;
          fVar259 = local_4c0._0_4_;
          fVar261 = local_4c0._4_4_;
          auVar65._4_4_ = fVar261 * (float)local_860._4_4_;
          auVar65._0_4_ = fVar259 * (float)local_860._0_4_;
          fVar320 = local_4c0._8_4_;
          auVar65._8_4_ = fVar320 * fStack_858;
          fVar292 = local_4c0._12_4_;
          auVar65._12_4_ = fVar292 * fStack_854;
          fVar293 = local_4c0._16_4_;
          auVar65._16_4_ = fVar293 * fStack_850;
          fVar225 = local_4c0._20_4_;
          auVar65._20_4_ = fVar225 * fStack_84c;
          fVar321 = local_4c0._24_4_;
          auVar65._24_4_ = fVar321 * fStack_848;
          auVar65._28_4_ = auVar255._28_4_;
          auVar302 = vsubps_avx(auVar64,auVar65);
          auVar26 = vmaxps_avx(_local_920,auVar286);
          auVar66._4_4_ = auVar26._4_4_ * auVar26._4_4_ * (fVar277 * fVar277 + fVar261 * fVar261);
          auVar66._0_4_ = auVar26._0_4_ * auVar26._0_4_ * (fVar246 * fVar246 + fVar259 * fVar259);
          auVar66._8_4_ = auVar26._8_4_ * auVar26._8_4_ * (fVar149 * fVar149 + fVar320 * fVar320);
          auVar66._12_4_ = auVar26._12_4_ * auVar26._12_4_ * (fVar176 * fVar176 + fVar292 * fVar292)
          ;
          auVar66._16_4_ = auVar26._16_4_ * auVar26._16_4_ * (fVar151 * fVar151 + fVar293 * fVar293)
          ;
          auVar66._20_4_ = auVar26._20_4_ * auVar26._20_4_ * (fVar152 * fVar152 + fVar225 * fVar225)
          ;
          auVar66._24_4_ = auVar26._24_4_ * auVar26._24_4_ * (fVar153 * fVar153 + fVar321 * fVar321)
          ;
          auVar66._28_4_ = auVar272._28_4_ + auVar255._28_4_;
          auVar67._4_4_ = auVar302._4_4_ * auVar302._4_4_;
          auVar67._0_4_ = auVar302._0_4_ * auVar302._0_4_;
          auVar67._8_4_ = auVar302._8_4_ * auVar302._8_4_;
          auVar67._12_4_ = auVar302._12_4_ * auVar302._12_4_;
          auVar67._16_4_ = auVar302._16_4_ * auVar302._16_4_;
          auVar67._20_4_ = auVar302._20_4_ * auVar302._20_4_;
          auVar67._24_4_ = auVar302._24_4_ * auVar302._24_4_;
          auVar67._28_4_ = auVar302._28_4_;
          auVar26 = vcmpps_avx(auVar67,auVar66,2);
          local_3c0 = (uint)lVar129;
          auVar185 = vpshufd_avx(ZEXT416(local_3c0),0);
          auVar267 = vpor_avx(auVar185,_DAT_01f7fcf0);
          auVar185 = vpor_avx(auVar185,_DAT_01fafea0);
          auVar267 = vpcmpgtd_avx(_local_700,auVar267);
          auVar185 = vpcmpgtd_avx(_local_700,auVar185);
          auVar190._16_16_ = auVar185;
          auVar190._0_16_ = auVar267;
          auVar302 = auVar190 & auVar26;
          if ((((((((auVar302 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar302 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar302 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar302 >> 0x7f,0) == '\0') &&
                (auVar302 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar302 >> 0xbf,0) == '\0') &&
              (auVar302 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar302[0x1f]) {
            auVar337 = ZEXT3264(auVar337._0_32_);
          }
          else {
            local_720._0_4_ = auVar119._0_4_;
            local_720._4_4_ = auVar119._4_4_;
            uStack_718._0_4_ = auVar119._8_4_;
            uStack_718._4_4_ = auVar119._12_4_;
            uStack_710._0_4_ = auVar119._16_4_;
            uStack_710._4_4_ = auVar119._20_4_;
            uStack_708._0_4_ = auVar119._24_4_;
            local_660 = (float)local_2a0._0_4_ * (float)local_720._0_4_ +
                        fVar294 * (float)local_4a0._0_4_ +
                        (float)local_c0._0_4_ * fVar218 + (float)local_5a0._0_4_ * fVar324;
            fStack_65c = (float)local_2a0._4_4_ * (float)local_720._4_4_ +
                         fVar295 * (float)local_4a0._4_4_ +
                         (float)local_c0._4_4_ * fVar223 + (float)local_5a0._4_4_ * fVar328;
            fStack_658 = fStack_298 * (float)uStack_718 +
                         fVar227 * fStack_498 + fStack_b8 * fVar216 + fStack_598 * fVar199;
            fStack_654 = fStack_294 * uStack_718._4_4_ +
                         fVar322 * fStack_494 + fStack_b4 * fVar221 + fStack_594 * fVar219;
            fStack_650 = fStack_290 * (float)uStack_710 +
                         fVar296 * fStack_490 + fStack_b0 * fVar240 + fStack_590 * fVar229;
            fStack_64c = fStack_28c * uStack_710._4_4_ +
                         fVar297 * fStack_48c + fStack_ac * fVar244 + fStack_58c * fVar242;
            fStack_648 = fStack_288 * (float)uStack_708 +
                         fVar228 * fStack_488 + fStack_a8 * fVar257 + fStack_588 * fVar248;
            fStack_644 = local_4c0._28_4_ + auVar170._28_4_ + auVar27._28_4_ + 0.0;
            local_800._0_4_ = auVar117._0_4_;
            local_800._4_4_ = auVar117._4_4_;
            uStack_7f8._0_4_ = auVar117._8_4_;
            uStack_7f8._4_4_ = auVar117._12_4_;
            fStack_7f0 = auVar117._16_4_;
            fStack_7ec = auVar117._20_4_;
            fStack_7e8 = auVar117._24_4_;
            local_6e0._0_4_ = auVar116._0_4_;
            local_6e0._4_4_ = auVar116._4_4_;
            uStack_6d8._0_4_ = auVar116._8_4_;
            uStack_6d8._4_4_ = auVar116._12_4_;
            uStack_6d0._0_4_ = auVar116._16_4_;
            uStack_6d0._4_4_ = auVar116._20_4_;
            uStack_6c8._0_4_ = auVar116._24_4_;
            local_820._0_4_ = auVar115._0_4_;
            local_820._4_4_ = auVar115._4_4_;
            fStack_818 = auVar115._8_4_;
            fStack_814 = auVar115._12_4_;
            fStack_810 = auVar115._16_4_;
            fStack_80c = auVar115._20_4_;
            fStack_808 = auVar115._24_4_;
            pfVar1 = (float *)(lVar20 + 0x21b4e84 + lVar129 * 4);
            fVar324 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar328 = pfVar1[2];
            fVar223 = pfVar1[3];
            fVar199 = pfVar1[4];
            fVar216 = pfVar1[5];
            fVar219 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21b5308 + lVar129 * 4);
            fVar221 = *pfVar2;
            fVar229 = pfVar2[1];
            fVar240 = pfVar2[2];
            fVar242 = pfVar2[3];
            fVar244 = pfVar2[4];
            fVar248 = pfVar2[5];
            fVar257 = pfVar2[6];
            fVar277 = *(float *)pauVar9[1] + 0.0;
            pfVar3 = (float *)(lVar20 + 0x21b4a00 + lVar129 * 4);
            fVar259 = *pfVar3;
            fVar261 = pfVar3[1];
            fVar320 = pfVar3[2];
            fVar292 = pfVar3[3];
            fVar293 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar321 = pfVar3[6];
            fVar247 = pfVar1[7] + pfVar2[7];
            fVar246 = pfVar2[7] + fVar277;
            fVar277 = *(float *)pauVar9[1] + fStack_224 + fVar277;
            pfVar1 = (float *)(lVar20 + 0x21b457c + lVar129 * 4);
            fVar294 = *pfVar1;
            fVar295 = pfVar1[1];
            fVar227 = pfVar1[2];
            fVar322 = pfVar1[3];
            fVar296 = pfVar1[4];
            fVar297 = pfVar1[5];
            fVar228 = pfVar1[6];
            local_560 = fVar294 * (float)local_480._0_4_ +
                        fVar200 * fVar259 +
                        (float)local_6c0._0_4_ * fVar324 + (float)local_5c0._0_4_ * fVar221;
            fStack_55c = fVar295 * (float)local_480._4_4_ +
                         fVar217 * fVar261 +
                         (float)local_6c0._4_4_ * fVar218 + (float)local_5c0._4_4_ * fVar229;
            fStack_558 = fVar227 * fStack_478 +
                         fVar220 * fVar320 + fStack_6b8 * fVar328 + fStack_5b8 * fVar240;
            fStack_554 = fVar322 * fStack_474 +
                         fVar222 * fVar292 + fStack_6b4 * fVar223 + fStack_5b4 * fVar242;
            fStack_550 = fVar296 * fStack_470 +
                         fVar224 * fVar293 + fStack_6b0 * fVar199 + fStack_5b0 * fVar244;
            fStack_54c = fVar297 * fStack_46c +
                         fVar226 * fVar225 + fStack_6ac * fVar216 + fStack_5ac * fVar248;
            fStack_548 = fVar228 * fStack_468 +
                         fVar130 * fVar321 + fStack_6a8 * fVar219 + fStack_5a8 * fVar257;
            fStack_544 = fVar247 + fVar246;
            auVar167._0_4_ =
                 fVar294 * (float)local_240._0_4_ +
                 (float)local_460._0_4_ * fVar324 + fVar323 * fVar221 + fVar354 * fVar259;
            auVar167._4_4_ =
                 fVar295 * (float)local_240._4_4_ +
                 (float)local_460._4_4_ * fVar218 + fVar327 * fVar229 + fVar357 * fVar261;
            auVar167._8_4_ =
                 fVar227 * fStack_238 + fStack_458 * fVar328 + fVar329 * fVar240 + fVar358 * fVar320
            ;
            auVar167._12_4_ =
                 fVar322 * fStack_234 + fStack_454 * fVar223 + fVar330 * fVar242 + fVar359 * fVar292
            ;
            auVar167._16_4_ =
                 fVar296 * fStack_230 + fStack_450 * fVar199 + fVar323 * fVar244 + fVar354 * fVar293
            ;
            auVar167._20_4_ =
                 fVar297 * fStack_22c + fStack_44c * fVar216 + fVar327 * fVar248 + fVar357 * fVar225
            ;
            auVar167._24_4_ =
                 fVar228 * fStack_228 + fStack_448 * fVar219 + fVar329 * fVar257 + fVar358 * fVar321
            ;
            auVar167._28_4_ = fVar246 + fVar277;
            auVar340._0_4_ =
                 fVar259 * (float)local_4a0._0_4_ +
                 (float)local_c0._0_4_ * fVar324 + (float)local_5a0._0_4_ * fVar221 +
                 fVar294 * (float)local_2a0._0_4_;
            auVar340._4_4_ =
                 fVar261 * (float)local_4a0._4_4_ +
                 (float)local_c0._4_4_ * fVar218 + (float)local_5a0._4_4_ * fVar229 +
                 fVar295 * (float)local_2a0._4_4_;
            auVar340._8_4_ =
                 fVar320 * fStack_498 + fStack_b8 * fVar328 + fStack_598 * fVar240 +
                 fVar227 * fStack_298;
            auVar340._12_4_ =
                 fVar292 * fStack_494 + fStack_b4 * fVar223 + fStack_594 * fVar242 +
                 fVar322 * fStack_294;
            auVar340._16_4_ =
                 fVar293 * fStack_490 + fStack_b0 * fVar199 + fStack_590 * fVar244 +
                 fVar296 * fStack_290;
            auVar340._20_4_ =
                 fVar225 * fStack_48c + fStack_ac * fVar216 + fStack_58c * fVar248 +
                 fVar297 * fStack_28c;
            auVar340._24_4_ =
                 fVar321 * fStack_488 + fStack_a8 * fVar219 + fStack_588 * fVar257 +
                 fVar228 * fStack_288;
            auVar340._28_4_ = pfVar3[7] + fVar247 + fVar277;
            pfVar1 = (float *)(lVar20 + 0x21b72a4 + lVar129 * 4);
            fVar324 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar328 = pfVar1[2];
            fVar223 = pfVar1[3];
            fVar199 = pfVar1[4];
            fVar216 = pfVar1[5];
            fVar219 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21b7728 + lVar129 * 4);
            fVar221 = *pfVar2;
            fVar229 = pfVar2[1];
            fVar240 = pfVar2[2];
            fVar242 = pfVar2[3];
            fVar244 = pfVar2[4];
            fVar248 = pfVar2[5];
            fVar257 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x21b6e20 + lVar129 * 4);
            fVar259 = *pfVar3;
            fVar261 = pfVar3[1];
            fVar320 = pfVar3[2];
            fVar292 = pfVar3[3];
            fVar293 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar321 = pfVar3[6];
            pfVar4 = (float *)(lVar20 + 0x21b699c + lVar129 * 4);
            fVar294 = *pfVar4;
            fVar295 = pfVar4[1];
            fVar227 = pfVar4[2];
            fVar322 = pfVar4[3];
            fVar296 = pfVar4[4];
            fVar297 = pfVar4[5];
            fVar228 = pfVar4[6];
            auVar303._0_4_ =
                 fVar294 * (float)local_480._0_4_ +
                 fVar259 * fVar230 +
                 (float)local_6c0._0_4_ * fVar324 + (float)local_5c0._0_4_ * fVar221;
            auVar303._4_4_ =
                 fVar295 * (float)local_480._4_4_ +
                 fVar261 * fVar241 +
                 (float)local_6c0._4_4_ * fVar218 + (float)local_5c0._4_4_ * fVar229;
            auVar303._8_4_ =
                 fVar227 * fStack_478 +
                 fVar320 * fVar243 + fStack_6b8 * fVar328 + fStack_5b8 * fVar240;
            auVar303._12_4_ =
                 fVar322 * fStack_474 +
                 fVar292 * fVar245 + fStack_6b4 * fVar223 + fStack_5b4 * fVar242;
            auVar303._16_4_ =
                 fVar296 * fStack_470 +
                 fVar293 * fVar230 + fStack_6b0 * fVar199 + fStack_5b0 * fVar244;
            auVar303._20_4_ =
                 fVar297 * fStack_46c +
                 fVar225 * fVar241 + fStack_6ac * fVar216 + fStack_5ac * fVar248;
            auVar303._24_4_ =
                 fVar228 * fStack_468 +
                 fVar321 * fVar243 + fStack_6a8 * fVar219 + fStack_5a8 * fVar257;
            auVar303._28_4_ = fStack_5a4 + fStack_5a4 + fStack_6a4 + fStack_5a4;
            auVar335._0_4_ =
                 fVar294 * (float)local_240._0_4_ +
                 fVar354 * fVar259 + (float)local_460._0_4_ * fVar324 + fVar221 * fVar323;
            auVar335._4_4_ =
                 fVar295 * (float)local_240._4_4_ +
                 fVar357 * fVar261 + (float)local_460._4_4_ * fVar218 + fVar229 * fVar327;
            auVar335._8_4_ =
                 fVar227 * fStack_238 + fVar358 * fVar320 + fStack_458 * fVar328 + fVar240 * fVar329
            ;
            auVar335._12_4_ =
                 fVar322 * fStack_234 + fVar359 * fVar292 + fStack_454 * fVar223 + fVar242 * fVar330
            ;
            auVar335._16_4_ =
                 fVar296 * fStack_230 + fVar354 * fVar293 + fStack_450 * fVar199 + fVar244 * fVar323
            ;
            auVar335._20_4_ =
                 fVar297 * fStack_22c + fVar357 * fVar225 + fStack_44c * fVar216 + fVar248 * fVar327
            ;
            auVar335._24_4_ =
                 fVar228 * fStack_228 + fVar358 * fVar321 + fStack_448 * fVar219 + fVar257 * fVar329
            ;
            auVar335._28_4_ = fStack_5a4 + fStack_5a4 + fStack_444 + fStack_5a4;
            auVar256._8_4_ = 0x7fffffff;
            auVar256._0_8_ = 0x7fffffff7fffffff;
            auVar256._12_4_ = 0x7fffffff;
            auVar256._16_4_ = 0x7fffffff;
            auVar256._20_4_ = 0x7fffffff;
            auVar256._24_4_ = 0x7fffffff;
            auVar256._28_4_ = 0x7fffffff;
            auVar114._4_4_ = fStack_55c;
            auVar114._0_4_ = local_560;
            auVar114._8_4_ = fStack_558;
            auVar114._12_4_ = fStack_554;
            auVar114._16_4_ = fStack_550;
            auVar114._20_4_ = fStack_54c;
            auVar114._24_4_ = fStack_548;
            auVar114._28_4_ = fStack_544;
            auVar170 = vandps_avx(auVar114,auVar256);
            auVar302 = vandps_avx(auVar167,auVar256);
            auVar302 = vmaxps_avx(auVar170,auVar302);
            auVar170 = vandps_avx(auVar340,auVar256);
            auVar302 = vmaxps_avx(auVar302,auVar170);
            auVar302 = vcmpps_avx(auVar302,_local_4e0,1);
            auVar210 = vblendvps_avx(auVar114,auVar33,auVar302);
            auVar143._0_4_ =
                 fVar294 * (float)local_2a0._0_4_ +
                 fVar259 * (float)local_4a0._0_4_ +
                 (float)local_5a0._0_4_ * fVar221 + (float)local_c0._0_4_ * fVar324;
            auVar143._4_4_ =
                 fVar295 * (float)local_2a0._4_4_ +
                 fVar261 * (float)local_4a0._4_4_ +
                 (float)local_5a0._4_4_ * fVar229 + (float)local_c0._4_4_ * fVar218;
            auVar143._8_4_ =
                 fVar227 * fStack_298 +
                 fVar320 * fStack_498 + fStack_598 * fVar240 + fStack_b8 * fVar328;
            auVar143._12_4_ =
                 fVar322 * fStack_294 +
                 fVar292 * fStack_494 + fStack_594 * fVar242 + fStack_b4 * fVar223;
            auVar143._16_4_ =
                 fVar296 * fStack_290 +
                 fVar293 * fStack_490 + fStack_590 * fVar244 + fStack_b0 * fVar199;
            auVar143._20_4_ =
                 fVar297 * fStack_28c +
                 fVar225 * fStack_48c + fStack_58c * fVar248 + fStack_ac * fVar216;
            auVar143._24_4_ =
                 fVar228 * fStack_288 +
                 fVar321 * fStack_488 + fStack_588 * fVar257 + fStack_a8 * fVar219;
            auVar143._28_4_ = auVar170._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar138 = vblendvps_avx(auVar167,_local_4c0,auVar302);
            auVar170 = vandps_avx(auVar303,auVar256);
            auVar302 = vandps_avx(auVar335,auVar256);
            auVar209 = vmaxps_avx(auVar170,auVar302);
            auVar170 = vandps_avx(auVar143,auVar256);
            auVar170 = vmaxps_avx(auVar209,auVar170);
            local_7e0._0_4_ = auVar118._0_4_;
            local_7e0._4_4_ = auVar118._4_4_;
            uStack_7d8._0_4_ = auVar118._8_4_;
            uStack_7d8._4_4_ = auVar118._12_4_;
            fStack_7d0 = auVar118._16_4_;
            fStack_7cc = auVar118._20_4_;
            fStack_7c8 = auVar118._24_4_;
            auVar302 = vcmpps_avx(auVar170,_local_4e0,1);
            auVar170 = vblendvps_avx(auVar303,auVar33,auVar302);
            auVar144._0_4_ =
                 (float)local_2a0._0_4_ * (float)local_7e0._0_4_ +
                 (float)local_4a0._0_4_ * (float)local_800._0_4_ +
                 (float)local_c0._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_5a0._0_4_ * (float)local_820._0_4_;
            auVar144._4_4_ =
                 (float)local_2a0._4_4_ * (float)local_7e0._4_4_ +
                 (float)local_4a0._4_4_ * (float)local_800._4_4_ +
                 (float)local_c0._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_5a0._4_4_ * (float)local_820._4_4_;
            auVar144._8_4_ =
                 fStack_298 * (float)uStack_7d8 +
                 fStack_498 * (float)uStack_7f8 +
                 fStack_b8 * (float)uStack_6d8 + fStack_598 * fStack_818;
            auVar144._12_4_ =
                 fStack_294 * uStack_7d8._4_4_ +
                 fStack_494 * uStack_7f8._4_4_ +
                 fStack_b4 * uStack_6d8._4_4_ + fStack_594 * fStack_814;
            auVar144._16_4_ =
                 fStack_290 * fStack_7d0 +
                 fStack_490 * fStack_7f0 + fStack_b0 * (float)uStack_6d0 + fStack_590 * fStack_810;
            auVar144._20_4_ =
                 fStack_28c * fStack_7cc +
                 fStack_48c * fStack_7ec + fStack_ac * uStack_6d0._4_4_ + fStack_58c * fStack_80c;
            auVar144._24_4_ =
                 fStack_288 * fStack_7c8 +
                 fStack_488 * fStack_7e8 + fStack_a8 * (float)uStack_6c8 + fStack_588 * fStack_808;
            auVar144._28_4_ = auVar209._28_4_ + fStack_644 + auVar27._28_4_ + 0.0;
            auVar27 = vblendvps_avx(auVar335,_local_4c0,auVar302);
            fVar153 = auVar210._0_4_;
            fVar200 = auVar210._4_4_;
            fVar217 = auVar210._8_4_;
            fVar220 = auVar210._12_4_;
            fVar222 = auVar210._16_4_;
            fVar224 = auVar210._20_4_;
            fVar226 = auVar210._24_4_;
            fVar130 = auVar210._28_4_;
            fVar259 = auVar170._0_4_;
            fVar320 = auVar170._4_4_;
            fVar293 = auVar170._8_4_;
            fVar321 = auVar170._12_4_;
            fVar295 = auVar170._16_4_;
            fVar322 = auVar170._20_4_;
            fVar297 = auVar170._24_4_;
            fVar324 = auVar138._0_4_;
            fVar328 = auVar138._4_4_;
            fVar199 = auVar138._8_4_;
            fVar219 = auVar138._12_4_;
            fVar229 = auVar138._16_4_;
            fVar242 = auVar138._20_4_;
            fVar248 = auVar138._24_4_;
            auVar312._0_4_ = fVar324 * fVar324 + fVar153 * fVar153;
            auVar312._4_4_ = fVar328 * fVar328 + fVar200 * fVar200;
            auVar312._8_4_ = fVar199 * fVar199 + fVar217 * fVar217;
            auVar312._12_4_ = fVar219 * fVar219 + fVar220 * fVar220;
            auVar312._16_4_ = fVar229 * fVar229 + fVar222 * fVar222;
            auVar312._20_4_ = fVar242 * fVar242 + fVar224 * fVar224;
            auVar312._24_4_ = fVar248 * fVar248 + fVar226 * fVar226;
            auVar312._28_4_ = auVar33._28_4_ + fStack_584;
            auVar33 = vrsqrtps_avx(auVar312);
            fVar218 = auVar33._0_4_;
            fVar223 = auVar33._4_4_;
            auVar68._4_4_ = fVar223 * 1.5;
            auVar68._0_4_ = fVar218 * 1.5;
            fVar216 = auVar33._8_4_;
            auVar68._8_4_ = fVar216 * 1.5;
            fVar221 = auVar33._12_4_;
            auVar68._12_4_ = fVar221 * 1.5;
            fVar240 = auVar33._16_4_;
            auVar68._16_4_ = fVar240 * 1.5;
            fVar244 = auVar33._20_4_;
            auVar68._20_4_ = fVar244 * 1.5;
            fVar257 = auVar33._24_4_;
            auVar68._24_4_ = fVar257 * 1.5;
            auVar68._28_4_ = auVar335._28_4_;
            auVar69._4_4_ = fVar223 * fVar223 * fVar223 * auVar312._4_4_ * 0.5;
            auVar69._0_4_ = fVar218 * fVar218 * fVar218 * auVar312._0_4_ * 0.5;
            auVar69._8_4_ = fVar216 * fVar216 * fVar216 * auVar312._8_4_ * 0.5;
            auVar69._12_4_ = fVar221 * fVar221 * fVar221 * auVar312._12_4_ * 0.5;
            auVar69._16_4_ = fVar240 * fVar240 * fVar240 * auVar312._16_4_ * 0.5;
            auVar69._20_4_ = fVar244 * fVar244 * fVar244 * auVar312._20_4_ * 0.5;
            auVar69._24_4_ = fVar257 * fVar257 * fVar257 * auVar312._24_4_ * 0.5;
            auVar69._28_4_ = auVar312._28_4_;
            auVar302 = vsubps_avx(auVar68,auVar69);
            fVar247 = auVar302._0_4_;
            fVar246 = auVar302._4_4_;
            fVar277 = auVar302._8_4_;
            fVar149 = auVar302._12_4_;
            fVar176 = auVar302._16_4_;
            fVar151 = auVar302._20_4_;
            fVar152 = auVar302._24_4_;
            fVar218 = auVar27._0_4_;
            fVar223 = auVar27._4_4_;
            fVar216 = auVar27._8_4_;
            fVar221 = auVar27._12_4_;
            fVar240 = auVar27._16_4_;
            fVar244 = auVar27._20_4_;
            fVar257 = auVar27._24_4_;
            auVar291._0_4_ = fVar218 * fVar218 + fVar259 * fVar259;
            auVar291._4_4_ = fVar223 * fVar223 + fVar320 * fVar320;
            auVar291._8_4_ = fVar216 * fVar216 + fVar293 * fVar293;
            auVar291._12_4_ = fVar221 * fVar221 + fVar321 * fVar321;
            auVar291._16_4_ = fVar240 * fVar240 + fVar295 * fVar295;
            auVar291._20_4_ = fVar244 * fVar244 + fVar322 * fVar322;
            auVar291._24_4_ = fVar257 * fVar257 + fVar297 * fVar297;
            auVar291._28_4_ = auVar33._28_4_ + auVar170._28_4_;
            auVar170 = vrsqrtps_avx(auVar291);
            fVar261 = auVar170._0_4_;
            fVar292 = auVar170._4_4_;
            auVar70._4_4_ = fVar292 * 1.5;
            auVar70._0_4_ = fVar261 * 1.5;
            fVar225 = auVar170._8_4_;
            auVar70._8_4_ = fVar225 * 1.5;
            fVar294 = auVar170._12_4_;
            auVar70._12_4_ = fVar294 * 1.5;
            fVar227 = auVar170._16_4_;
            auVar70._16_4_ = fVar227 * 1.5;
            fVar296 = auVar170._20_4_;
            auVar70._20_4_ = fVar296 * 1.5;
            fVar228 = auVar170._24_4_;
            auVar70._24_4_ = fVar228 * 1.5;
            auVar70._28_4_ = auVar335._28_4_;
            auVar71._4_4_ = fVar292 * fVar292 * fVar292 * auVar291._4_4_ * 0.5;
            auVar71._0_4_ = fVar261 * fVar261 * fVar261 * auVar291._0_4_ * 0.5;
            auVar71._8_4_ = fVar225 * fVar225 * fVar225 * auVar291._8_4_ * 0.5;
            auVar71._12_4_ = fVar294 * fVar294 * fVar294 * auVar291._12_4_ * 0.5;
            auVar71._16_4_ = fVar227 * fVar227 * fVar227 * auVar291._16_4_ * 0.5;
            auVar71._20_4_ = fVar296 * fVar296 * fVar296 * auVar291._20_4_ * 0.5;
            auVar71._24_4_ = fVar228 * fVar228 * fVar228 * auVar291._24_4_ * 0.5;
            auVar71._28_4_ = auVar291._28_4_;
            auVar27 = vsubps_avx(auVar70,auVar71);
            fVar261 = auVar27._0_4_;
            fVar292 = auVar27._4_4_;
            fVar225 = auVar27._8_4_;
            fVar294 = auVar27._12_4_;
            fVar227 = auVar27._16_4_;
            fVar296 = auVar27._20_4_;
            fVar228 = auVar27._24_4_;
            fVar324 = (float)local_920._0_4_ * fVar247 * fVar324;
            fVar328 = (float)local_920._4_4_ * fVar246 * fVar328;
            auVar72._4_4_ = fVar328;
            auVar72._0_4_ = fVar324;
            fVar199 = fStack_918 * fVar277 * fVar199;
            auVar72._8_4_ = fVar199;
            fVar219 = fStack_914 * fVar149 * fVar219;
            auVar72._12_4_ = fVar219;
            fVar229 = fStack_910 * fVar176 * fVar229;
            auVar72._16_4_ = fVar229;
            fVar242 = fStack_90c * fVar151 * fVar242;
            auVar72._20_4_ = fVar242;
            fVar248 = fStack_908 * fVar152 * fVar248;
            auVar72._24_4_ = fVar248;
            auVar72._28_4_ = auVar170._28_4_;
            local_7e0._4_4_ = fVar328 + (float)local_860._4_4_;
            local_7e0._0_4_ = fVar324 + (float)local_860._0_4_;
            uStack_7d8._0_4_ = fVar199 + fStack_858;
            uStack_7d8._4_4_ = fVar219 + fStack_854;
            fStack_7d0 = fVar229 + fStack_850;
            fStack_7cc = fVar242 + fStack_84c;
            fStack_7c8 = fVar248 + fStack_848;
            fStack_7c4 = auVar170._28_4_ + fStack_844;
            fVar324 = (float)local_920._0_4_ * fVar247 * -fVar153;
            fVar328 = (float)local_920._4_4_ * fVar246 * -fVar200;
            auVar73._4_4_ = fVar328;
            auVar73._0_4_ = fVar324;
            fVar199 = fStack_918 * fVar277 * -fVar217;
            auVar73._8_4_ = fVar199;
            fVar219 = fStack_914 * fVar149 * -fVar220;
            auVar73._12_4_ = fVar219;
            fVar229 = fStack_910 * fVar176 * -fVar222;
            auVar73._16_4_ = fVar229;
            fVar242 = fStack_90c * fVar151 * -fVar224;
            auVar73._20_4_ = fVar242;
            fVar248 = fStack_908 * fVar152 * -fVar226;
            auVar73._24_4_ = fVar248;
            auVar73._28_4_ = -fVar130;
            local_820._4_4_ = auVar214._4_4_ + fVar328;
            local_820._0_4_ = auVar214._0_4_ + fVar324;
            fStack_818 = auVar214._8_4_ + fVar199;
            fStack_814 = auVar214._12_4_ + fVar219;
            fStack_810 = auVar214._16_4_ + fVar229;
            fStack_80c = auVar214._20_4_ + fVar242;
            fStack_808 = auVar214._24_4_ + fVar248;
            fStack_804 = auVar214._28_4_ + -fVar130;
            fVar324 = fVar247 * 0.0 * (float)local_920._0_4_;
            fVar328 = fVar246 * 0.0 * (float)local_920._4_4_;
            auVar74._4_4_ = fVar328;
            auVar74._0_4_ = fVar324;
            fVar199 = fVar277 * 0.0 * fStack_918;
            auVar74._8_4_ = fVar199;
            fVar219 = fVar149 * 0.0 * fStack_914;
            auVar74._12_4_ = fVar219;
            fVar229 = fVar176 * 0.0 * fStack_910;
            auVar74._16_4_ = fVar229;
            fVar242 = fVar151 * 0.0 * fStack_90c;
            auVar74._20_4_ = fVar242;
            fVar248 = fVar152 * 0.0 * fStack_908;
            auVar74._24_4_ = fVar248;
            auVar74._28_4_ = fVar130;
            auVar170 = vsubps_avx(_local_860,auVar72);
            auVar356._0_4_ = fVar324 + auVar144._0_4_;
            auVar356._4_4_ = fVar328 + auVar144._4_4_;
            auVar356._8_4_ = fVar199 + auVar144._8_4_;
            auVar356._12_4_ = fVar219 + auVar144._12_4_;
            auVar356._16_4_ = fVar229 + auVar144._16_4_;
            auVar356._20_4_ = fVar242 + auVar144._20_4_;
            auVar356._24_4_ = fVar248 + auVar144._24_4_;
            auVar356._28_4_ = fVar130 + auVar144._28_4_;
            fVar324 = auVar286._0_4_ * fVar261 * fVar218;
            fVar218 = auVar286._4_4_ * fVar292 * fVar223;
            auVar75._4_4_ = fVar218;
            auVar75._0_4_ = fVar324;
            fVar328 = auVar286._8_4_ * fVar225 * fVar216;
            auVar75._8_4_ = fVar328;
            fVar223 = auVar286._12_4_ * fVar294 * fVar221;
            auVar75._12_4_ = fVar223;
            fVar199 = auVar286._16_4_ * fVar227 * fVar240;
            auVar75._16_4_ = fVar199;
            fVar216 = auVar286._20_4_ * fVar296 * fVar244;
            auVar75._20_4_ = fVar216;
            fVar219 = auVar286._24_4_ * fVar228 * fVar257;
            auVar75._24_4_ = fVar219;
            auVar75._28_4_ = fStack_844;
            auVar28 = vsubps_avx(auVar214,auVar73);
            auVar341._0_4_ = auVar272._0_4_ + fVar324;
            auVar341._4_4_ = auVar272._4_4_ + fVar218;
            auVar341._8_4_ = auVar272._8_4_ + fVar328;
            auVar341._12_4_ = auVar272._12_4_ + fVar223;
            auVar341._16_4_ = auVar272._16_4_ + fVar199;
            auVar341._20_4_ = auVar272._20_4_ + fVar216;
            auVar341._24_4_ = auVar272._24_4_ + fVar219;
            auVar341._28_4_ = auVar272._28_4_ + fStack_844;
            fVar324 = fVar261 * -fVar259 * auVar286._0_4_;
            fVar218 = fVar292 * -fVar320 * auVar286._4_4_;
            auVar76._4_4_ = fVar218;
            auVar76._0_4_ = fVar324;
            fVar328 = fVar225 * -fVar293 * auVar286._8_4_;
            auVar76._8_4_ = fVar328;
            fVar223 = fVar294 * -fVar321 * auVar286._12_4_;
            auVar76._12_4_ = fVar223;
            fVar199 = fVar227 * -fVar295 * auVar286._16_4_;
            auVar76._16_4_ = fVar199;
            fVar216 = fVar296 * -fVar322 * auVar286._20_4_;
            auVar76._20_4_ = fVar216;
            fVar219 = fVar228 * -fVar297 * auVar286._24_4_;
            auVar76._24_4_ = fVar219;
            auVar76._28_4_ = fStack_904;
            auVar29 = vsubps_avx(auVar144,auVar74);
            auVar238._0_4_ = auVar255._0_4_ + fVar324;
            auVar238._4_4_ = auVar255._4_4_ + fVar218;
            auVar238._8_4_ = auVar255._8_4_ + fVar328;
            auVar238._12_4_ = auVar255._12_4_ + fVar223;
            auVar238._16_4_ = auVar255._16_4_ + fVar199;
            auVar238._20_4_ = auVar255._20_4_ + fVar216;
            auVar238._24_4_ = auVar255._24_4_ + fVar219;
            auVar238._28_4_ = auVar255._28_4_ + fStack_904;
            fVar324 = fVar261 * 0.0 * auVar286._0_4_;
            fVar218 = fVar292 * 0.0 * auVar286._4_4_;
            auVar77._4_4_ = fVar218;
            auVar77._0_4_ = fVar324;
            fVar328 = fVar225 * 0.0 * auVar286._8_4_;
            auVar77._8_4_ = fVar328;
            fVar223 = fVar294 * 0.0 * auVar286._12_4_;
            auVar77._12_4_ = fVar223;
            fVar199 = fVar227 * 0.0 * auVar286._16_4_;
            auVar77._16_4_ = fVar199;
            fVar216 = fVar296 * 0.0 * auVar286._20_4_;
            auVar77._20_4_ = fVar216;
            fVar219 = fVar228 * 0.0 * auVar286._24_4_;
            auVar77._24_4_ = fVar219;
            auVar77._28_4_ = auVar144._28_4_;
            auVar33 = vsubps_avx(auVar272,auVar75);
            auVar113._4_4_ = fStack_65c;
            auVar113._0_4_ = local_660;
            auVar113._8_4_ = fStack_658;
            auVar113._12_4_ = fStack_654;
            auVar113._16_4_ = fStack_650;
            auVar113._20_4_ = fStack_64c;
            auVar113._24_4_ = fStack_648;
            auVar113._28_4_ = fStack_644;
            auVar304._0_4_ = local_660 + fVar324;
            auVar304._4_4_ = fStack_65c + fVar218;
            auVar304._8_4_ = fStack_658 + fVar328;
            auVar304._12_4_ = fStack_654 + fVar223;
            auVar304._16_4_ = fStack_650 + fVar199;
            auVar304._20_4_ = fStack_64c + fVar216;
            auVar304._24_4_ = fStack_648 + fVar219;
            auVar304._28_4_ = fStack_644 + auVar144._28_4_;
            auVar302 = vsubps_avx(auVar255,auVar76);
            auVar210 = vsubps_avx(auVar113,auVar77);
            auVar138 = vsubps_avx(auVar238,auVar28);
            auVar209 = vsubps_avx(auVar304,auVar29);
            auVar78._4_4_ = auVar29._4_4_ * auVar138._4_4_;
            auVar78._0_4_ = auVar29._0_4_ * auVar138._0_4_;
            auVar78._8_4_ = auVar29._8_4_ * auVar138._8_4_;
            auVar78._12_4_ = auVar29._12_4_ * auVar138._12_4_;
            auVar78._16_4_ = auVar29._16_4_ * auVar138._16_4_;
            auVar78._20_4_ = auVar29._20_4_ * auVar138._20_4_;
            auVar78._24_4_ = auVar29._24_4_ * auVar138._24_4_;
            auVar78._28_4_ = auVar335._28_4_;
            auVar79._4_4_ = auVar28._4_4_ * auVar209._4_4_;
            auVar79._0_4_ = auVar28._0_4_ * auVar209._0_4_;
            auVar79._8_4_ = auVar28._8_4_ * auVar209._8_4_;
            auVar79._12_4_ = auVar28._12_4_ * auVar209._12_4_;
            auVar79._16_4_ = auVar28._16_4_ * auVar209._16_4_;
            auVar79._20_4_ = auVar28._20_4_ * auVar209._20_4_;
            auVar79._24_4_ = auVar28._24_4_ * auVar209._24_4_;
            auVar79._28_4_ = fStack_644;
            auVar235 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = auVar170._4_4_ * auVar209._4_4_;
            auVar80._0_4_ = auVar170._0_4_ * auVar209._0_4_;
            auVar80._8_4_ = auVar170._8_4_ * auVar209._8_4_;
            auVar80._12_4_ = auVar170._12_4_ * auVar209._12_4_;
            auVar80._16_4_ = auVar170._16_4_ * auVar209._16_4_;
            auVar80._20_4_ = auVar170._20_4_ * auVar209._20_4_;
            auVar80._24_4_ = auVar170._24_4_ * auVar209._24_4_;
            auVar80._28_4_ = auVar209._28_4_;
            auVar209 = vsubps_avx(auVar341,auVar170);
            auVar81._4_4_ = auVar29._4_4_ * auVar209._4_4_;
            auVar81._0_4_ = auVar29._0_4_ * auVar209._0_4_;
            auVar81._8_4_ = auVar29._8_4_ * auVar209._8_4_;
            auVar81._12_4_ = auVar29._12_4_ * auVar209._12_4_;
            auVar81._16_4_ = auVar29._16_4_ * auVar209._16_4_;
            auVar81._20_4_ = auVar29._20_4_ * auVar209._20_4_;
            auVar81._24_4_ = auVar29._24_4_ * auVar209._24_4_;
            auVar81._28_4_ = auVar27._28_4_;
            auVar284 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar28._4_4_ * auVar209._4_4_;
            auVar82._0_4_ = auVar28._0_4_ * auVar209._0_4_;
            auVar82._8_4_ = auVar28._8_4_ * auVar209._8_4_;
            auVar82._12_4_ = auVar28._12_4_ * auVar209._12_4_;
            auVar82._16_4_ = auVar28._16_4_ * auVar209._16_4_;
            auVar82._20_4_ = auVar28._20_4_ * auVar209._20_4_;
            auVar82._24_4_ = auVar28._24_4_ * auVar209._24_4_;
            auVar82._28_4_ = auVar27._28_4_;
            auVar83._4_4_ = auVar170._4_4_ * auVar138._4_4_;
            auVar83._0_4_ = auVar170._0_4_ * auVar138._0_4_;
            auVar83._8_4_ = auVar170._8_4_ * auVar138._8_4_;
            auVar83._12_4_ = auVar170._12_4_ * auVar138._12_4_;
            auVar83._16_4_ = auVar170._16_4_ * auVar138._16_4_;
            auVar83._20_4_ = auVar170._20_4_ * auVar138._20_4_;
            auVar83._24_4_ = auVar170._24_4_ * auVar138._24_4_;
            auVar83._28_4_ = auVar138._28_4_;
            auVar27 = vsubps_avx(auVar83,auVar82);
            auVar168._0_4_ = auVar235._0_4_ * 0.0 + auVar27._0_4_ + auVar284._0_4_ * 0.0;
            auVar168._4_4_ = auVar235._4_4_ * 0.0 + auVar27._4_4_ + auVar284._4_4_ * 0.0;
            auVar168._8_4_ = auVar235._8_4_ * 0.0 + auVar27._8_4_ + auVar284._8_4_ * 0.0;
            auVar168._12_4_ = auVar235._12_4_ * 0.0 + auVar27._12_4_ + auVar284._12_4_ * 0.0;
            auVar168._16_4_ = auVar235._16_4_ * 0.0 + auVar27._16_4_ + auVar284._16_4_ * 0.0;
            auVar168._20_4_ = auVar235._20_4_ * 0.0 + auVar27._20_4_ + auVar284._20_4_ * 0.0;
            auVar168._24_4_ = auVar235._24_4_ * 0.0 + auVar27._24_4_ + auVar284._24_4_ * 0.0;
            auVar168._28_4_ = auVar235._28_4_ + auVar27._28_4_ + auVar284._28_4_;
            auVar332 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,2);
            auVar27 = vblendvps_avx(auVar33,_local_7e0,auVar332);
            auVar215 = ZEXT3264(auVar27);
            auVar33 = vblendvps_avx(auVar302,_local_820,auVar332);
            auVar302 = vblendvps_avx(auVar210,auVar356,auVar332);
            auVar210 = vblendvps_avx(auVar170,auVar341,auVar332);
            auVar138 = vblendvps_avx(auVar28,auVar238,auVar332);
            auVar209 = vblendvps_avx(auVar29,auVar304,auVar332);
            auVar235 = vblendvps_avx(auVar341,auVar170,auVar332);
            auVar284 = vblendvps_avx(auVar238,auVar28,auVar332);
            auVar300 = vblendvps_avx(auVar304,auVar29,auVar332);
            auVar170 = vandps_avx(auVar190,auVar26);
            auVar235 = vsubps_avx(auVar235,auVar27);
            auVar30 = vsubps_avx(auVar284,auVar33);
            auVar300 = vsubps_avx(auVar300,auVar302);
            auVar31 = vsubps_avx(auVar33,auVar138);
            fVar324 = auVar30._0_4_;
            fVar175 = auVar302._0_4_;
            fVar221 = auVar30._4_4_;
            fVar177 = auVar302._4_4_;
            auVar84._4_4_ = fVar177 * fVar221;
            auVar84._0_4_ = fVar175 * fVar324;
            fVar259 = auVar30._8_4_;
            fVar178 = auVar302._8_4_;
            auVar84._8_4_ = fVar178 * fVar259;
            fVar294 = auVar30._12_4_;
            fVar193 = auVar302._12_4_;
            auVar84._12_4_ = fVar193 * fVar294;
            fVar247 = auVar30._16_4_;
            fVar194 = auVar302._16_4_;
            auVar84._16_4_ = fVar194 * fVar247;
            fVar153 = auVar30._20_4_;
            fVar195 = auVar302._20_4_;
            auVar84._20_4_ = fVar195 * fVar153;
            fVar130 = auVar30._24_4_;
            fVar196 = auVar302._24_4_;
            auVar84._24_4_ = fVar196 * fVar130;
            auVar84._28_4_ = auVar284._28_4_;
            fVar218 = auVar33._0_4_;
            fVar197 = auVar300._0_4_;
            fVar229 = auVar33._4_4_;
            fVar198 = auVar300._4_4_;
            auVar85._4_4_ = fVar198 * fVar229;
            auVar85._0_4_ = fVar197 * fVar218;
            fVar261 = auVar33._8_4_;
            fVar249 = auVar300._8_4_;
            auVar85._8_4_ = fVar249 * fVar261;
            fVar295 = auVar33._12_4_;
            fVar258 = auVar300._12_4_;
            auVar85._12_4_ = fVar258 * fVar295;
            fVar246 = auVar33._16_4_;
            fVar260 = auVar300._16_4_;
            auVar85._16_4_ = fVar260 * fVar246;
            fVar200 = auVar33._20_4_;
            fVar262 = auVar300._20_4_;
            auVar85._20_4_ = fVar262 * fVar200;
            fVar264 = auVar33._24_4_;
            fVar265 = auVar300._24_4_;
            uVar11 = auVar28._28_4_;
            auVar85._24_4_ = fVar265 * fVar264;
            auVar85._28_4_ = uVar11;
            auVar284 = vsubps_avx(auVar85,auVar84);
            fVar328 = auVar27._0_4_;
            fVar240 = auVar27._4_4_;
            auVar86._4_4_ = fVar198 * fVar240;
            auVar86._0_4_ = fVar197 * fVar328;
            fVar320 = auVar27._8_4_;
            auVar86._8_4_ = fVar249 * fVar320;
            fVar227 = auVar27._12_4_;
            auVar86._12_4_ = fVar258 * fVar227;
            fVar277 = auVar27._16_4_;
            auVar86._16_4_ = fVar260 * fVar277;
            fVar217 = auVar27._20_4_;
            auVar86._20_4_ = fVar262 * fVar217;
            fVar148 = auVar27._24_4_;
            auVar86._24_4_ = fVar265 * fVar148;
            auVar86._28_4_ = uVar11;
            fVar223 = auVar235._0_4_;
            fVar242 = auVar235._4_4_;
            auVar87._4_4_ = fVar177 * fVar242;
            auVar87._0_4_ = fVar175 * fVar223;
            fVar292 = auVar235._8_4_;
            auVar87._8_4_ = fVar178 * fVar292;
            fVar322 = auVar235._12_4_;
            auVar87._12_4_ = fVar193 * fVar322;
            fVar149 = auVar235._16_4_;
            auVar87._16_4_ = fVar194 * fVar149;
            fVar220 = auVar235._20_4_;
            auVar87._20_4_ = fVar195 * fVar220;
            fVar150 = auVar235._24_4_;
            auVar87._24_4_ = fVar196 * fVar150;
            auVar87._28_4_ = auVar341._28_4_;
            auVar28 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = fVar229 * fVar242;
            auVar88._0_4_ = fVar218 * fVar223;
            auVar88._8_4_ = fVar261 * fVar292;
            auVar88._12_4_ = fVar295 * fVar322;
            auVar88._16_4_ = fVar246 * fVar149;
            auVar88._20_4_ = fVar200 * fVar220;
            auVar88._24_4_ = fVar264 * fVar150;
            auVar88._28_4_ = uVar11;
            auVar89._4_4_ = fVar240 * fVar221;
            auVar89._0_4_ = fVar328 * fVar324;
            auVar89._8_4_ = fVar320 * fVar259;
            auVar89._12_4_ = fVar227 * fVar294;
            auVar89._16_4_ = fVar277 * fVar247;
            auVar89._20_4_ = fVar217 * fVar153;
            auVar89._24_4_ = fVar148 * fVar130;
            auVar89._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar89,auVar88);
            auVar32 = vsubps_avx(auVar302,auVar209);
            fVar216 = auVar29._28_4_ + auVar28._28_4_;
            auVar313._0_4_ = auVar29._0_4_ + auVar28._0_4_ * 0.0 + auVar284._0_4_ * 0.0;
            auVar313._4_4_ = auVar29._4_4_ + auVar28._4_4_ * 0.0 + auVar284._4_4_ * 0.0;
            auVar313._8_4_ = auVar29._8_4_ + auVar28._8_4_ * 0.0 + auVar284._8_4_ * 0.0;
            auVar313._12_4_ = auVar29._12_4_ + auVar28._12_4_ * 0.0 + auVar284._12_4_ * 0.0;
            auVar313._16_4_ = auVar29._16_4_ + auVar28._16_4_ * 0.0 + auVar284._16_4_ * 0.0;
            auVar313._20_4_ = auVar29._20_4_ + auVar28._20_4_ * 0.0 + auVar284._20_4_ * 0.0;
            auVar313._24_4_ = auVar29._24_4_ + auVar28._24_4_ * 0.0 + auVar284._24_4_ * 0.0;
            auVar313._28_4_ = fVar216 + auVar284._28_4_;
            fVar199 = auVar31._0_4_;
            fVar244 = auVar31._4_4_;
            auVar90._4_4_ = auVar209._4_4_ * fVar244;
            auVar90._0_4_ = auVar209._0_4_ * fVar199;
            fVar293 = auVar31._8_4_;
            auVar90._8_4_ = auVar209._8_4_ * fVar293;
            fVar296 = auVar31._12_4_;
            auVar90._12_4_ = auVar209._12_4_ * fVar296;
            fVar176 = auVar31._16_4_;
            auVar90._16_4_ = auVar209._16_4_ * fVar176;
            fVar222 = auVar31._20_4_;
            auVar90._20_4_ = auVar209._20_4_ * fVar222;
            fVar154 = auVar31._24_4_;
            auVar90._24_4_ = auVar209._24_4_ * fVar154;
            auVar90._28_4_ = fVar216;
            fVar216 = auVar32._0_4_;
            fVar248 = auVar32._4_4_;
            auVar91._4_4_ = auVar138._4_4_ * fVar248;
            auVar91._0_4_ = auVar138._0_4_ * fVar216;
            fVar225 = auVar32._8_4_;
            auVar91._8_4_ = auVar138._8_4_ * fVar225;
            fVar297 = auVar32._12_4_;
            auVar91._12_4_ = auVar138._12_4_ * fVar297;
            fVar151 = auVar32._16_4_;
            auVar91._16_4_ = auVar138._16_4_ * fVar151;
            fVar224 = auVar32._20_4_;
            auVar91._20_4_ = auVar138._20_4_ * fVar224;
            fVar173 = auVar32._24_4_;
            auVar91._24_4_ = auVar138._24_4_ * fVar173;
            auVar91._28_4_ = auVar29._28_4_;
            auVar28 = vsubps_avx(auVar91,auVar90);
            auVar29 = vsubps_avx(auVar27,auVar210);
            fVar219 = auVar29._0_4_;
            fVar257 = auVar29._4_4_;
            auVar92._4_4_ = auVar209._4_4_ * fVar257;
            auVar92._0_4_ = auVar209._0_4_ * fVar219;
            fVar321 = auVar29._8_4_;
            auVar92._8_4_ = auVar209._8_4_ * fVar321;
            fVar228 = auVar29._12_4_;
            auVar92._12_4_ = auVar209._12_4_ * fVar228;
            fVar152 = auVar29._16_4_;
            auVar92._16_4_ = auVar209._16_4_ * fVar152;
            fVar226 = auVar29._20_4_;
            auVar92._20_4_ = auVar209._20_4_ * fVar226;
            fVar174 = auVar29._24_4_;
            auVar92._24_4_ = auVar209._24_4_ * fVar174;
            auVar92._28_4_ = auVar209._28_4_;
            auVar93._4_4_ = fVar248 * auVar210._4_4_;
            auVar93._0_4_ = fVar216 * auVar210._0_4_;
            auVar93._8_4_ = fVar225 * auVar210._8_4_;
            auVar93._12_4_ = fVar297 * auVar210._12_4_;
            auVar93._16_4_ = fVar151 * auVar210._16_4_;
            auVar93._20_4_ = fVar224 * auVar210._20_4_;
            auVar93._24_4_ = fVar173 * auVar210._24_4_;
            auVar93._28_4_ = auVar284._28_4_;
            auVar209 = vsubps_avx(auVar92,auVar93);
            auVar94._4_4_ = auVar138._4_4_ * fVar257;
            auVar94._0_4_ = auVar138._0_4_ * fVar219;
            auVar94._8_4_ = auVar138._8_4_ * fVar321;
            auVar94._12_4_ = auVar138._12_4_ * fVar228;
            auVar94._16_4_ = auVar138._16_4_ * fVar152;
            auVar94._20_4_ = auVar138._20_4_ * fVar226;
            auVar94._24_4_ = auVar138._24_4_ * fVar174;
            auVar94._28_4_ = auVar138._28_4_;
            auVar95._4_4_ = fVar244 * auVar210._4_4_;
            auVar95._0_4_ = fVar199 * auVar210._0_4_;
            auVar95._8_4_ = fVar293 * auVar210._8_4_;
            auVar95._12_4_ = fVar296 * auVar210._12_4_;
            auVar95._16_4_ = fVar176 * auVar210._16_4_;
            auVar95._20_4_ = fVar222 * auVar210._20_4_;
            auVar95._24_4_ = fVar154 * auVar210._24_4_;
            auVar95._28_4_ = auVar210._28_4_;
            auVar210 = vsubps_avx(auVar95,auVar94);
            auVar145._0_4_ = auVar28._0_4_ * 0.0 + auVar210._0_4_ + auVar209._0_4_ * 0.0;
            auVar145._4_4_ = auVar28._4_4_ * 0.0 + auVar210._4_4_ + auVar209._4_4_ * 0.0;
            auVar145._8_4_ = auVar28._8_4_ * 0.0 + auVar210._8_4_ + auVar209._8_4_ * 0.0;
            auVar145._12_4_ = auVar28._12_4_ * 0.0 + auVar210._12_4_ + auVar209._12_4_ * 0.0;
            auVar145._16_4_ = auVar28._16_4_ * 0.0 + auVar210._16_4_ + auVar209._16_4_ * 0.0;
            auVar145._20_4_ = auVar28._20_4_ * 0.0 + auVar210._20_4_ + auVar209._20_4_ * 0.0;
            auVar145._24_4_ = auVar28._24_4_ * 0.0 + auVar210._24_4_ + auVar209._24_4_ * 0.0;
            auVar145._28_4_ = auVar209._28_4_ + auVar210._28_4_ + auVar209._28_4_;
            auVar147 = ZEXT3264(auVar145);
            auVar210 = vmaxps_avx(auVar313,auVar145);
            auVar210 = vcmpps_avx(auVar210,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar138 = auVar170 & auVar210;
            if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar138 >> 0x7f,0) == '\0') &&
                  (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar138 >> 0xbf,0) == '\0') &&
                (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar138[0x1f]) {
LAB_00fb1231:
              auVar172 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            }
            else {
              auVar138 = vandps_avx(auVar210,auVar170);
              auVar96._4_4_ = fVar248 * fVar221;
              auVar96._0_4_ = fVar216 * fVar324;
              auVar96._8_4_ = fVar225 * fVar259;
              auVar96._12_4_ = fVar297 * fVar294;
              auVar96._16_4_ = fVar151 * fVar247;
              auVar96._20_4_ = fVar224 * fVar153;
              auVar96._24_4_ = fVar173 * fVar130;
              auVar96._28_4_ = auVar170._28_4_;
              auVar97._4_4_ = fVar244 * fVar198;
              auVar97._0_4_ = fVar199 * fVar197;
              auVar97._8_4_ = fVar293 * fVar249;
              auVar97._12_4_ = fVar296 * fVar258;
              auVar97._16_4_ = fVar176 * fVar260;
              auVar97._20_4_ = fVar222 * fVar262;
              auVar97._24_4_ = fVar154 * fVar265;
              auVar97._28_4_ = auVar210._28_4_;
              auVar210 = vsubps_avx(auVar97,auVar96);
              auVar98._4_4_ = fVar257 * fVar198;
              auVar98._0_4_ = fVar219 * fVar197;
              auVar98._8_4_ = fVar321 * fVar249;
              auVar98._12_4_ = fVar228 * fVar258;
              auVar98._16_4_ = fVar152 * fVar260;
              auVar98._20_4_ = fVar226 * fVar262;
              auVar98._24_4_ = fVar174 * fVar265;
              auVar98._28_4_ = auVar300._28_4_;
              auVar99._4_4_ = fVar248 * fVar242;
              auVar99._0_4_ = fVar216 * fVar223;
              auVar99._8_4_ = fVar225 * fVar292;
              auVar99._12_4_ = fVar297 * fVar322;
              auVar99._16_4_ = fVar151 * fVar149;
              auVar99._20_4_ = fVar224 * fVar220;
              auVar99._24_4_ = fVar173 * fVar150;
              auVar99._28_4_ = auVar32._28_4_;
              auVar209 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar244 * fVar242;
              auVar100._0_4_ = fVar199 * fVar223;
              auVar100._8_4_ = fVar293 * fVar292;
              auVar100._12_4_ = fVar296 * fVar322;
              auVar100._16_4_ = fVar176 * fVar149;
              auVar100._20_4_ = fVar222 * fVar220;
              auVar100._24_4_ = fVar154 * fVar150;
              auVar100._28_4_ = auVar235._28_4_;
              auVar101._4_4_ = fVar257 * fVar221;
              auVar101._0_4_ = fVar219 * fVar324;
              auVar101._8_4_ = fVar321 * fVar259;
              auVar101._12_4_ = fVar228 * fVar294;
              auVar101._16_4_ = fVar152 * fVar247;
              auVar101._20_4_ = fVar226 * fVar153;
              auVar101._24_4_ = fVar174 * fVar130;
              auVar101._28_4_ = auVar30._28_4_;
              auVar284 = vsubps_avx(auVar101,auVar100);
              auVar169._0_4_ = auVar210._0_4_ * 0.0 + auVar284._0_4_ + auVar209._0_4_ * 0.0;
              auVar169._4_4_ = auVar210._4_4_ * 0.0 + auVar284._4_4_ + auVar209._4_4_ * 0.0;
              auVar169._8_4_ = auVar210._8_4_ * 0.0 + auVar284._8_4_ + auVar209._8_4_ * 0.0;
              auVar169._12_4_ = auVar210._12_4_ * 0.0 + auVar284._12_4_ + auVar209._12_4_ * 0.0;
              auVar169._16_4_ = auVar210._16_4_ * 0.0 + auVar284._16_4_ + auVar209._16_4_ * 0.0;
              auVar169._20_4_ = auVar210._20_4_ * 0.0 + auVar284._20_4_ + auVar209._20_4_ * 0.0;
              auVar169._24_4_ = auVar210._24_4_ * 0.0 + auVar284._24_4_ + auVar209._24_4_ * 0.0;
              auVar169._28_4_ = auVar30._28_4_ + auVar284._28_4_ + auVar235._28_4_;
              auVar170 = vrcpps_avx(auVar169);
              fVar324 = auVar170._0_4_;
              fVar223 = auVar170._4_4_;
              auVar102._4_4_ = auVar169._4_4_ * fVar223;
              auVar102._0_4_ = auVar169._0_4_ * fVar324;
              fVar199 = auVar170._8_4_;
              auVar102._8_4_ = auVar169._8_4_ * fVar199;
              fVar216 = auVar170._12_4_;
              auVar102._12_4_ = auVar169._12_4_ * fVar216;
              fVar219 = auVar170._16_4_;
              auVar102._16_4_ = auVar169._16_4_ * fVar219;
              fVar221 = auVar170._20_4_;
              auVar102._20_4_ = auVar169._20_4_ * fVar221;
              fVar242 = auVar170._24_4_;
              auVar102._24_4_ = auVar169._24_4_ * fVar242;
              auVar102._28_4_ = auVar32._28_4_;
              auVar336._8_4_ = 0x3f800000;
              auVar336._0_8_ = 0x3f8000003f800000;
              auVar336._12_4_ = 0x3f800000;
              auVar336._16_4_ = 0x3f800000;
              auVar336._20_4_ = 0x3f800000;
              auVar336._24_4_ = 0x3f800000;
              auVar336._28_4_ = 0x3f800000;
              auVar170 = vsubps_avx(auVar336,auVar102);
              fVar324 = auVar170._0_4_ * fVar324 + fVar324;
              fVar223 = auVar170._4_4_ * fVar223 + fVar223;
              fVar199 = auVar170._8_4_ * fVar199 + fVar199;
              fVar216 = auVar170._12_4_ * fVar216 + fVar216;
              fVar219 = auVar170._16_4_ * fVar219 + fVar219;
              fVar221 = auVar170._20_4_ * fVar221 + fVar221;
              fVar242 = auVar170._24_4_ * fVar242 + fVar242;
              auVar103._4_4_ =
                   (fVar240 * auVar210._4_4_ + auVar209._4_4_ * fVar229 + auVar284._4_4_ * fVar177)
                   * fVar223;
              auVar103._0_4_ =
                   (fVar328 * auVar210._0_4_ + auVar209._0_4_ * fVar218 + auVar284._0_4_ * fVar175)
                   * fVar324;
              auVar103._8_4_ =
                   (fVar320 * auVar210._8_4_ + auVar209._8_4_ * fVar261 + auVar284._8_4_ * fVar178)
                   * fVar199;
              auVar103._12_4_ =
                   (fVar227 * auVar210._12_4_ +
                   auVar209._12_4_ * fVar295 + auVar284._12_4_ * fVar193) * fVar216;
              auVar103._16_4_ =
                   (fVar277 * auVar210._16_4_ +
                   auVar209._16_4_ * fVar246 + auVar284._16_4_ * fVar194) * fVar219;
              auVar103._20_4_ =
                   (fVar217 * auVar210._20_4_ +
                   auVar209._20_4_ * fVar200 + auVar284._20_4_ * fVar195) * fVar221;
              auVar103._24_4_ =
                   (fVar148 * auVar210._24_4_ +
                   auVar209._24_4_ * fVar264 + auVar284._24_4_ * fVar196) * fVar242;
              auVar103._28_4_ = auVar27._28_4_ + auVar33._28_4_ + auVar302._28_4_;
              auVar215 = ZEXT3264(auVar103);
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar239._4_4_ = uVar11;
              auVar239._0_4_ = uVar11;
              auVar239._8_4_ = uVar11;
              auVar239._12_4_ = uVar11;
              auVar239._16_4_ = uVar11;
              auVar239._20_4_ = uVar11;
              auVar239._24_4_ = uVar11;
              auVar239._28_4_ = uVar11;
              auVar170 = vcmpps_avx(local_500,auVar103,2);
              auVar27 = vcmpps_avx(auVar103,auVar239,2);
              auVar170 = vandps_avx(auVar170,auVar27);
              auVar33 = auVar138 & auVar170;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar33 >> 0x7f,0) == '\0') &&
                    (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar33 >> 0xbf,0) == '\0') &&
                  (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar33[0x1f]) goto LAB_00fb1231;
              auVar170 = vandps_avx(auVar138,auVar170);
              auVar33 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar169,4);
              auVar302 = auVar170 & auVar33;
              auVar172 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              if ((((((((auVar302 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar302 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar302 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar302 >> 0x7f,0) != '\0') ||
                    (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar302 >> 0xbf,0) != '\0') ||
                  (auVar302 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar302[0x1f] < '\0') {
                auVar170 = vandps_avx(auVar33,auVar170);
                auVar172 = ZEXT3264(auVar170);
                auVar104._4_4_ = fVar223 * auVar313._4_4_;
                auVar104._0_4_ = fVar324 * auVar313._0_4_;
                auVar104._8_4_ = fVar199 * auVar313._8_4_;
                auVar104._12_4_ = fVar216 * auVar313._12_4_;
                auVar104._16_4_ = fVar219 * auVar313._16_4_;
                auVar104._20_4_ = fVar221 * auVar313._20_4_;
                auVar104._24_4_ = fVar242 * auVar313._24_4_;
                auVar104._28_4_ = auVar27._28_4_;
                auVar105._4_4_ = auVar145._4_4_ * fVar223;
                auVar105._0_4_ = auVar145._0_4_ * fVar324;
                auVar105._8_4_ = auVar145._8_4_ * fVar199;
                auVar105._12_4_ = auVar145._12_4_ * fVar216;
                auVar105._16_4_ = auVar145._16_4_ * fVar219;
                auVar105._20_4_ = auVar145._20_4_ * fVar221;
                auVar105._24_4_ = auVar145._24_4_ * fVar242;
                auVar105._28_4_ = auVar145._28_4_;
                auVar273._8_4_ = 0x3f800000;
                auVar273._0_8_ = 0x3f8000003f800000;
                auVar273._12_4_ = 0x3f800000;
                auVar273._16_4_ = 0x3f800000;
                auVar273._20_4_ = 0x3f800000;
                auVar273._24_4_ = 0x3f800000;
                auVar273._28_4_ = 0x3f800000;
                auVar170 = vsubps_avx(auVar273,auVar104);
                local_2c0 = vblendvps_avx(auVar170,auVar104,auVar332);
                auVar170 = vsubps_avx(auVar273,auVar105);
                _local_540 = vblendvps_avx(auVar170,auVar105,auVar332);
                auVar147 = ZEXT3264(_local_540);
                local_2e0 = auVar103;
              }
            }
            auVar170 = auVar172._0_32_;
            auVar337 = ZEXT3264(auVar234);
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar170 >> 0x7f,0) != '\0') ||
                  (auVar172 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar170 >> 0xbf,0) != '\0') ||
                (auVar172 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar172[0x1f] < '\0') {
              auVar27 = vsubps_avx(auVar286,_local_920);
              auVar215 = ZEXT3264(local_2c0);
              local_920._0_4_ = (float)local_920._0_4_ + auVar27._0_4_ * local_2c0._0_4_;
              local_920._4_4_ = (float)local_920._4_4_ + auVar27._4_4_ * local_2c0._4_4_;
              fStack_918 = fStack_918 + auVar27._8_4_ * local_2c0._8_4_;
              fStack_914 = fStack_914 + auVar27._12_4_ * local_2c0._12_4_;
              fStack_910 = fStack_910 + auVar27._16_4_ * local_2c0._16_4_;
              fStack_90c = fStack_90c + auVar27._20_4_ * local_2c0._20_4_;
              fStack_908 = fStack_908 + auVar27._24_4_ * local_2c0._24_4_;
              fStack_904 = fStack_904 + auVar27._28_4_;
              fVar324 = *(float *)((long)local_758->ray_space + k * 4 + -0x20);
              auVar106._4_4_ = ((float)local_920._4_4_ + (float)local_920._4_4_) * fVar324;
              auVar106._0_4_ = ((float)local_920._0_4_ + (float)local_920._0_4_) * fVar324;
              auVar106._8_4_ = (fStack_918 + fStack_918) * fVar324;
              auVar106._12_4_ = (fStack_914 + fStack_914) * fVar324;
              auVar106._16_4_ = (fStack_910 + fStack_910) * fVar324;
              auVar106._20_4_ = (fStack_90c + fStack_90c) * fVar324;
              auVar106._24_4_ = (fStack_908 + fStack_908) * fVar324;
              auVar106._28_4_ = fStack_904 + fStack_904;
              auVar27 = vcmpps_avx(local_2e0,auVar106,6);
              auVar147 = ZEXT3264(auVar27);
              auVar33 = auVar170 & auVar27;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                local_360 = vandps_avx(auVar27,auVar170);
                auVar147 = ZEXT3264(local_360);
                auVar160._0_8_ =
                     CONCAT44((float)local_540._4_4_ + (float)local_540._4_4_ + -1.0,
                              (float)local_540._0_4_ + (float)local_540._0_4_ + -1.0);
                auVar160._8_4_ = (float)uStack_538 + (float)uStack_538 + -1.0;
                auVar160._12_4_ = uStack_538._4_4_ + uStack_538._4_4_ + -1.0;
                auVar163._16_4_ = (float)uStack_530 + (float)uStack_530 + -1.0;
                auVar163._0_16_ = auVar160;
                auVar163._20_4_ = uStack_530._4_4_ + uStack_530._4_4_ + -1.0;
                fStack_3e8 = (float)uStack_528 + (float)uStack_528 + -1.0;
                _local_400 = auVar163;
                fStack_3e4 = uStack_528._4_4_ + uStack_528._4_4_ + -1.0;
                auVar172 = ZEXT3264(_local_400);
                local_420 = local_2c0;
                local_3e0 = local_2e0;
                local_3b0 = local_780;
                uStack_3a8 = uStack_778;
                local_3a0 = local_670;
                uStack_398 = uStack_668;
                local_390 = local_680;
                uStack_388 = uStack_678;
                local_380 = local_690;
                uStack_378 = uStack_688;
                pGVar16 = (context->scene->geometries).items[uVar13].ptr;
                _local_540 = _local_400;
                if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  pRVar123 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar123 = context->args;
                  if ((pRVar123->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar123 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar123 >> 8),1),
                     pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar161._0_4_ = (float)(int)local_3c0;
                    auVar161._4_8_ = SUB128(ZEXT812(0),4);
                    auVar161._12_4_ = 0;
                    auVar267 = vshufps_avx(auVar161,auVar161,0);
                    local_340[0] = (auVar267._0_4_ + local_2c0._0_4_ + 0.0) * (float)local_100._0_4_
                    ;
                    local_340[1] = (auVar267._4_4_ + local_2c0._4_4_ + 1.0) * (float)local_100._4_4_
                    ;
                    local_340[2] = (auVar267._8_4_ + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (auVar267._12_4_ + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (auVar267._0_4_ + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (auVar267._4_4_ + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (auVar267._8_4_ + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = auVar267._12_4_ + (float)local_2c0._28_4_ + 7.0;
                    uStack_538 = auVar160._8_8_;
                    uStack_530 = auVar163._16_8_;
                    uStack_528 = local_400._24_8_;
                    local_320 = auVar160._0_8_;
                    uStack_318 = uStack_538;
                    uStack_310 = uStack_530;
                    uStack_308 = uStack_528;
                    auVar172 = ZEXT3264(local_2e0);
                    local_300 = local_2e0;
                    iVar121 = vmovmskps_avx(local_360);
                    local_7c0 = CONCAT44((int)((ulong)pRVar123 >> 0x20),iVar121);
                    local_920 = (undefined1  [8])0x0;
                    if (local_7c0 != 0) {
                      for (; (local_7c0 >> (long)local_920 & 1) == 0;
                          local_920 = (undefined1  [8])((long)local_920 + 1)) {
                      }
                    }
                    if (iVar121 == 0) {
                      pRVar123 = (RTCIntersectArguments *)0x0;
                    }
                    else {
                      auVar267 = *local_768;
                      _local_800 = auVar26._0_16_;
                      uStack_6d0 = *(undefined8 *)(local_770 + 0x10);
                      _local_6e0 = *local_768;
                      uStack_6c8 = *(undefined8 *)(local_770 + 0x18);
                      uVar124 = *(uint *)(ray + k * 4 + 0x100);
                      _local_720 = auVar286;
                      local_3bc = uVar15;
                      do {
                        local_1c0 = local_340[(long)local_920];
                        local_1a0 = *(undefined4 *)((long)&local_320 + (long)local_920 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_300 + (long)local_920 * 4);
                        fVar218 = 1.0 - local_1c0;
                        fVar324 = local_1c0 * 3.0;
                        auVar185 = ZEXT416((uint)((fVar218 * -2.0 * local_1c0 +
                                                  local_1c0 * local_1c0) * 0.5));
                        auVar185 = vshufps_avx(auVar185,auVar185,0);
                        auVar207 = ZEXT416((uint)(((fVar218 + fVar218) * (fVar324 + 2.0) +
                                                  fVar218 * fVar218 * -3.0) * 0.5));
                        auVar207 = vshufps_avx(auVar207,auVar207,0);
                        auVar183 = ZEXT416((uint)(((local_1c0 + local_1c0) * (fVar324 + -5.0) +
                                                  local_1c0 * fVar324) * 0.5));
                        auVar183 = vshufps_avx(auVar183,auVar183,0);
                        local_750.context = context->user;
                        auVar208 = ZEXT416((uint)((local_1c0 * (fVar218 + fVar218) -
                                                  fVar218 * fVar218) * 0.5));
                        auVar208 = vshufps_avx(auVar208,auVar208,0);
                        auVar186._0_4_ =
                             auVar208._0_4_ * (float)local_780._0_4_ +
                             auVar183._0_4_ * (float)local_670._0_4_ +
                             auVar185._0_4_ * (float)local_690._0_4_ +
                             auVar207._0_4_ * (float)local_680._0_4_;
                        auVar186._4_4_ =
                             auVar208._4_4_ * (float)local_780._4_4_ +
                             auVar183._4_4_ * (float)local_670._4_4_ +
                             auVar185._4_4_ * (float)local_690._4_4_ +
                             auVar207._4_4_ * (float)local_680._4_4_;
                        auVar186._8_4_ =
                             auVar208._8_4_ * (float)uStack_778 +
                             auVar183._8_4_ * (float)uStack_668 +
                             auVar185._8_4_ * (float)uStack_688 + auVar207._8_4_ * (float)uStack_678
                        ;
                        auVar186._12_4_ =
                             auVar208._12_4_ * uStack_778._4_4_ +
                             auVar183._12_4_ * uStack_668._4_4_ +
                             auVar185._12_4_ * uStack_688._4_4_ + auVar207._12_4_ * uStack_678._4_4_
                        ;
                        local_210 = vshufps_avx(auVar186,auVar186,0);
                        local_220[0] = (RTCHitN)local_210[0];
                        local_220[1] = (RTCHitN)local_210[1];
                        local_220[2] = (RTCHitN)local_210[2];
                        local_220[3] = (RTCHitN)local_210[3];
                        local_220[4] = (RTCHitN)local_210[4];
                        local_220[5] = (RTCHitN)local_210[5];
                        local_220[6] = (RTCHitN)local_210[6];
                        local_220[7] = (RTCHitN)local_210[7];
                        local_220[8] = (RTCHitN)local_210[8];
                        local_220[9] = (RTCHitN)local_210[9];
                        local_220[10] = (RTCHitN)local_210[10];
                        local_220[0xb] = (RTCHitN)local_210[0xb];
                        local_220[0xc] = (RTCHitN)local_210[0xc];
                        local_220[0xd] = (RTCHitN)local_210[0xd];
                        local_220[0xe] = (RTCHitN)local_210[0xe];
                        local_220[0xf] = (RTCHitN)local_210[0xf];
                        local_1f0 = vshufps_avx(auVar186,auVar186,0x55);
                        local_200 = local_1f0;
                        local_1d0 = vshufps_avx(auVar186,auVar186,0xaa);
                        local_1e0 = local_1d0;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_580._0_8_;
                        uStack_178 = local_580._8_8_;
                        uStack_170 = local_580._16_8_;
                        uStack_168 = local_580._24_8_;
                        local_160 = local_e0._0_8_;
                        uStack_158 = local_e0._8_8_;
                        uStack_150 = local_e0._16_8_;
                        uStack_148 = local_e0._24_8_;
                        auVar170 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x40),
                                              ZEXT1632(ZEXT816(0) << 0x40),0xf);
                        local_760[1] = auVar170;
                        *local_760 = auVar170;
                        local_140 = (local_750.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_750.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_7a0 = local_6e0;
                        uStack_798 = uStack_6d8;
                        uStack_790 = uStack_6d0;
                        uStack_788 = uStack_6c8;
                        local_750.valid = (int *)&local_7a0;
                        local_750.geometryUserPtr = pGVar16->userPtr;
                        local_750.hit = local_220;
                        local_750.N = 8;
                        auVar137 = _local_800;
                        local_750.ray = (RTCRayN *)ray;
                        auVar162 = auVar267;
                        if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar16->occlusionFilterN)(&local_750);
                          auVar162._8_8_ = uStack_798;
                          auVar162._0_8_ = local_7a0;
                          auVar137._8_8_ = uStack_788;
                          auVar137._0_8_ = uStack_790;
                        }
                        auVar172 = ZEXT1664(auVar162);
                        auVar185 = vpcmpeqd_avx(auVar162,ZEXT816(0) << 0x40);
                        auVar207 = vpcmpeqd_avx(auVar137,ZEXT816(0) << 0x40);
                        auVar215 = ZEXT1664(auVar207);
                        auVar191._16_16_ = auVar207;
                        auVar191._0_16_ = auVar185;
                        auVar27 = auVar170 & ~auVar191;
                        local_860._0_4_ = auVar170._0_4_;
                        local_860._4_4_ = auVar170._4_4_;
                        fStack_858 = auVar170._8_4_;
                        fStack_854 = auVar170._12_4_;
                        fStack_850 = auVar170._16_4_;
                        fStack_84c = auVar170._20_4_;
                        fStack_848 = auVar170._24_4_;
                        fStack_844 = auVar170._28_4_;
                        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar27 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar27 >> 0x7f,0) == '\0') &&
                              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar27 >> 0xbf,0) == '\0') &&
                            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar27[0x1f]) {
                          auVar146._0_4_ = auVar185._0_4_ ^ local_860._0_4_;
                          auVar146._4_4_ = auVar185._4_4_ ^ local_860._4_4_;
                          auVar146._8_4_ = auVar185._8_4_ ^ (uint)fStack_858;
                          auVar146._12_4_ = auVar185._12_4_ ^ (uint)fStack_854;
                          auVar146._16_4_ = auVar207._0_4_ ^ (uint)fStack_850;
                          auVar146._20_4_ = auVar207._4_4_ ^ (uint)fStack_84c;
                          auVar146._24_4_ = auVar207._8_4_ ^ (uint)fStack_848;
                          auVar146._28_4_ = auVar207._12_4_ ^ (uint)fStack_844;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar215 = ZEXT1664(auVar207);
                            (*p_Var19)(&local_750);
                            auVar162._8_8_ = uStack_798;
                            auVar162._0_8_ = local_7a0;
                            auVar137._8_8_ = uStack_788;
                            auVar137._0_8_ = uStack_790;
                          }
                          auVar185 = vpcmpeqd_avx(auVar162,ZEXT816(0) << 0x40);
                          auVar207 = vpcmpeqd_avx(auVar137,ZEXT816(0) << 0x40);
                          auVar171._16_16_ = auVar207;
                          auVar171._0_16_ = auVar185;
                          auVar146._0_4_ = auVar185._0_4_ ^ local_860._0_4_;
                          auVar146._4_4_ = auVar185._4_4_ ^ local_860._4_4_;
                          auVar146._8_4_ = auVar185._8_4_ ^ (uint)fStack_858;
                          auVar146._12_4_ = auVar185._12_4_ ^ (uint)fStack_854;
                          auVar146._16_4_ = auVar207._0_4_ ^ (uint)fStack_850;
                          auVar146._20_4_ = auVar207._4_4_ ^ (uint)fStack_84c;
                          auVar146._24_4_ = auVar207._8_4_ ^ (uint)fStack_848;
                          auVar146._28_4_ = auVar207._12_4_ ^ (uint)fStack_844;
                          auVar192._8_4_ = 0xff800000;
                          auVar192._0_8_ = 0xff800000ff800000;
                          auVar192._12_4_ = 0xff800000;
                          auVar192._16_4_ = 0xff800000;
                          auVar192._20_4_ = 0xff800000;
                          auVar192._24_4_ = 0xff800000;
                          auVar192._28_4_ = 0xff800000;
                          auVar170 = vblendvps_avx(auVar192,*(undefined1 (*) [32])
                                                             (local_750.ray + 0x100),auVar171);
                          auVar172 = ZEXT3264(auVar170);
                          *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar170;
                        }
                        auVar147 = ZEXT3264(auVar146);
                        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar146 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar146 >> 0x7f,0) != '\0')
                              || (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar146 >> 0xbf,0) != '\0') ||
                            (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar146[0x1f] < '\0') {
                          pRVar123 = (RTCIntersectArguments *)0x1;
                          break;
                        }
                        auVar147 = ZEXT464(uVar124);
                        *(uint *)(ray + k * 4 + 0x100) = uVar124;
                        local_7c0 = local_7c0 ^ 1L << ((ulong)local_920 & 0x3f);
                        local_920 = (undefined1  [8])0x0;
                        if (local_7c0 != 0) {
                          for (; (local_7c0 >> (long)local_920 & 1) == 0;
                              local_920 = (undefined1  [8])((long)local_920 + 1)) {
                          }
                        }
                        pRVar123 = (RTCIntersectArguments *)0x0;
                      } while (local_7c0 != 0);
                    }
                  }
                }
                auVar337 = ZEXT3264(auVar234);
                bVar126 = (bool)(bVar126 | (byte)pRVar123);
              }
            }
          }
          lVar129 = lVar129 + 8;
        } while ((int)lVar129 < (int)uVar15);
      }
      if (bVar126 != false) {
        return bVar126;
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar134._4_4_ = uVar11;
      auVar134._0_4_ = uVar11;
      auVar134._8_4_ = uVar11;
      auVar134._12_4_ = uVar11;
      auVar267 = vcmpps_avx(local_430,auVar134,2);
      uVar124 = vmovmskps_avx(auVar267);
      uVar120 = uVar120 & uVar120 + 0xf & uVar124;
    } while (uVar120 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }